

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_avx512::forward_fp16s
          (InnerProduct_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 uVar5;
  _func_int *p_Var6;
  int *piVar7;
  long lVar8;
  void *pvVar9;
  size_t sVar10;
  bool bVar11;
  byte bVar12;
  ulong uVar13;
  ulong uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined4 uVar117;
  undefined4 uVar118;
  undefined4 uVar119;
  undefined4 uVar120;
  float afVar121 [16];
  float afVar122 [16];
  float afVar123 [16];
  float afVar124 [16];
  float afVar125 [16];
  float afVar126 [16];
  float afVar127 [16];
  float afVar128 [16];
  float afVar129 [16];
  float afVar130 [16];
  float afVar131 [16];
  float afVar132 [16];
  float afVar133 [16];
  float afVar134 [16];
  long lVar135;
  long lVar136;
  int iVar137;
  long lVar138;
  undefined1 (*pauVar139) [32];
  ulong uVar140;
  int iVar141;
  uint uVar142;
  int iVar143;
  long lVar144;
  undefined1 (*pauVar145) [16];
  uint uVar146;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  long lVar147;
  long lVar148;
  long lVar149;
  undefined1 (*pauVar150) [32];
  long lVar151;
  long lVar152;
  undefined1 (*pauVar153) [16];
  long lVar154;
  undefined1 (*pauVar155) [16];
  uint uVar156;
  long lVar157;
  long lVar158;
  long lVar159;
  long lVar160;
  uint uVar161;
  long lVar162;
  undefined1 (*pauVar163) [16];
  undefined1 auVar164 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  undefined1 auVar226 [64];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  float fVar229;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar230 [16];
  undefined4 extraout_XMM0_Db_04;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined1 auVar235 [32];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd_03;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  v4sf one_4;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar263;
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  float fVar264;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  v4sf one;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [16];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 in_ZMM16 [64];
  undefined1 auVar335 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar336 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar337 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar338 [64];
  Option opt_flatten;
  undefined1 (*local_3d8) [32];
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 local_3c8;
  undefined4 uStack_3c4;
  int local_3c0;
  Allocator *local_3b8;
  int local_3b0;
  int iStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined4 uStack_3a0;
  size_t local_398;
  undefined1 local_388 [16];
  ulong local_370;
  ulong local_368;
  long local_360;
  long local_358;
  uint local_34c;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  float local_318;
  undefined1 local_308 [16];
  ulong local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  undefined1 local_2a8 [32];
  undefined1 local_288 [16];
  float local_278;
  undefined4 uStack_274;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined8 local_268;
  undefined1 local_258 [16];
  float local_248;
  undefined1 local_238 [16];
  ulong local_220;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [48];
  undefined1 auVar204 [32];
  
  auVar164 = in_ZMM29._0_16_;
  local_3b0 = bottom_blob->dims;
  if ((local_3b0 == 2) &&
     (bottom_blob->w ==
      *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86_avx512[-3]) /
      *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3]))) {
    if (1 < bottom_blob->elempack * bottom_blob->h) {
      Mat::create(top_blob,*(int *)(&this->field_0xd0 +
                                   (long)this->_vptr_InnerProduct_x86_avx512[-3]),bottom_blob->h,
                  bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      p_Var6 = this->_vptr_InnerProduct_x86_avx512[-3];
      innerproduct_gemm_fp16s_sse
                (bottom_blob,top_blob,&this->weight_data_tm,
                 (Mat *)(&this->field_0x178 + (long)p_Var6),
                 *(int *)(&this->field_0xe0 + (long)p_Var6),
                 (Mat *)(&this->field_0xe8 + (long)p_Var6),opt);
      return 0;
    }
  }
  piVar7 = bottom_blob->refcount;
  local_3d8 = (undefined1 (*) [32])bottom_blob->data;
  uStack_3d0 = SUB84(bottom_blob->refcount,0);
  uStack_3cc = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_3c8 = (undefined4)bottom_blob->elemsize;
  uStack_3c4 = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_3c0 = bottom_blob->elempack;
  local_3b8 = bottom_blob->allocator;
  uVar117 = bottom_blob->w;
  uVar118 = bottom_blob->h;
  uVar119 = bottom_blob->d;
  uVar120 = bottom_blob->c;
  local_398 = bottom_blob->cstep;
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + 1;
    UNLOCK();
  }
  iStack_3ac = uVar117;
  uStack_3a8 = uVar118;
  uStack_3a4 = uVar119;
  uStack_3a0 = uVar120;
  if (bottom_blob->dims != 1) {
    auStack_68 = SUB6448(*opt,0x10);
    local_78 = SUB648(*opt,0);
    pAStack_70 = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_3d8);
  }
  uVar161 = 1;
  if (opt->use_packing_layout == true) {
    uVar161 = *(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3]);
    if ((uVar161 & 0xf) == 0) {
      uVar161 = 0x10;
    }
    else if ((uVar161 & 7) == 0) {
      uVar161 = 8;
    }
    else {
      uVar161 = (uint)((uVar161 & 3) == 0) * 3 + 1;
    }
  }
  Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86_avx512[-3]) /
                       (int)uVar161,
              (ulong)uVar161 * (CONCAT44(uStack_3c4,local_3c8) / (ulong)(long)local_3c0),uVar161,
              opt->blob_allocator);
  afVar134 = _ps512_cephes_log_q2;
  afVar133 = _ps512_cephes_log_q1;
  afVar132 = _ps512_cephes_log_p8;
  afVar131 = _ps512_cephes_log_p7;
  afVar130 = _ps512_cephes_exp_p5;
  afVar129 = _ps512_cephes_exp_p4;
  afVar128 = _ps512_cephes_exp_p3;
  afVar127 = _ps512_cephes_exp_p2;
  afVar126 = _ps512_cephes_exp_p1;
  afVar125 = _ps512_cephes_exp_p0;
  afVar124 = _ps512_cephes_LOG2EF;
  afVar123 = _ps512_exp_lo;
  afVar122 = _ps512_exp_hi;
  afVar121 = _ps512_1;
  iVar137 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    iVar137 = 0;
    if (7 < uVar161) {
      if (uVar161 != 8) {
        if (uVar161 == 0x10) {
          iVar137 = top_blob->w;
          if (0 < (long)iVar137) {
            p_Var6 = this->_vptr_InnerProduct_x86_avx512[-3];
            uVar5 = *(undefined4 *)(&this->field_0xe0 + (long)p_Var6);
            uVar161 = local_3c0 * iStack_3ac;
            lVar8 = *(long *)(&this->field_0x178 + (long)p_Var6);
            auVar216 = vbroadcastss_avx512f(ZEXT416(0x80000000));
            auVar217 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar216);
            auVar218 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar216);
            auVar219 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
            auVar220 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_exp_p5,auVar216);
            lVar147 = 0;
            auVar164 = vxorps_avx512vl(auVar164,auVar164);
            auVar338 = ZEXT1664(auVar164);
            auVar221 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar222 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
            do {
              auVar164 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
              auVar335 = ZEXT1664(auVar164);
              if (lVar8 != 0) {
                auVar335 = *(undefined1 (*) [64])(lVar8 + lVar147 * 0x40);
              }
              pauVar150 = (undefined1 (*) [32])
                          ((this->weight_data_tm).w * lVar147 * (this->weight_data_tm).elemsize +
                          (long)(this->weight_data_tm).data);
              auVar166 = in_ZMM18._0_16_;
              auVar170 = in_ZMM23._0_16_;
              auVar168 = in_ZMM21._0_16_;
              auVar169 = in_ZMM22._0_16_;
              auVar165 = in_ZMM19._0_16_;
              auVar167 = in_ZMM20._0_16_;
              auVar164 = in_ZMM17._0_16_;
              pauVar139 = local_3d8;
              if ((int)uVar161 < 8) {
                auVar166 = vxorps_avx512vl(auVar166,auVar166);
                auVar337 = ZEXT1664(auVar166);
                auVar166 = vxorps_avx512vl(auVar170,auVar170);
                in_ZMM23 = ZEXT1664(auVar166);
                auVar166 = vxorps_avx512vl(auVar168,auVar168);
                in_ZMM21 = ZEXT1664(auVar166);
                auVar166 = vxorps_avx512vl(auVar169,auVar169);
                in_ZMM22 = ZEXT1664(auVar166);
                auVar166 = vxorps_avx512vl(auVar165,auVar165);
                in_ZMM19 = ZEXT1664(auVar166);
                auVar166 = vxorps_avx512vl(auVar167,auVar167);
                in_ZMM20 = ZEXT1664(auVar166);
                auVar164 = vxorps_avx512vl(auVar164,auVar164);
                auVar336 = ZEXT1664(auVar164);
                uVar146 = 0;
              }
              else {
                auVar164 = vxorps_avx512vl(auVar164,auVar164);
                auVar336 = ZEXT1664(auVar164);
                iVar141 = 7;
                auVar164 = vxorps_avx512vl(auVar167,auVar167);
                in_ZMM20 = ZEXT1664(auVar164);
                auVar164 = vxorps_avx512vl(auVar165,auVar165);
                in_ZMM19 = ZEXT1664(auVar164);
                auVar164 = vxorps_avx512vl(auVar169,auVar169);
                in_ZMM22 = ZEXT1664(auVar164);
                auVar164 = vxorps_avx512vl(auVar168,auVar168);
                in_ZMM21 = ZEXT1664(auVar164);
                auVar164 = vxorps_avx512vl(auVar170,auVar170);
                in_ZMM23 = ZEXT1664(auVar164);
                auVar164 = vxorps_avx512vl(auVar166,auVar166);
                auVar337 = ZEXT1664(auVar164);
                do {
                  auVar223 = vcvtph2ps_avx512f(*pauVar150);
                  uVar1 = *(undefined4 *)*pauVar139;
                  auVar224._4_4_ = uVar1;
                  auVar224._0_4_ = uVar1;
                  auVar224._8_4_ = uVar1;
                  auVar224._12_4_ = uVar1;
                  auVar224._16_4_ = uVar1;
                  auVar224._20_4_ = uVar1;
                  auVar224._24_4_ = uVar1;
                  auVar224._28_4_ = uVar1;
                  auVar224._32_4_ = uVar1;
                  auVar224._36_4_ = uVar1;
                  auVar224._40_4_ = uVar1;
                  auVar224._44_4_ = uVar1;
                  auVar224._48_4_ = uVar1;
                  auVar224._52_4_ = uVar1;
                  auVar224._56_4_ = uVar1;
                  auVar224._60_4_ = uVar1;
                  auVar335 = vfmadd231ps_avx512f(auVar335,auVar223,auVar224);
                  auVar224 = vcvtph2ps_avx512f(pauVar150[1]);
                  uVar1 = *(undefined4 *)(*pauVar139 + 4);
                  auVar223._4_4_ = uVar1;
                  auVar223._0_4_ = uVar1;
                  auVar223._8_4_ = uVar1;
                  auVar223._12_4_ = uVar1;
                  auVar223._16_4_ = uVar1;
                  auVar223._20_4_ = uVar1;
                  auVar223._24_4_ = uVar1;
                  auVar223._28_4_ = uVar1;
                  auVar223._32_4_ = uVar1;
                  auVar223._36_4_ = uVar1;
                  auVar223._40_4_ = uVar1;
                  auVar223._44_4_ = uVar1;
                  auVar223._48_4_ = uVar1;
                  auVar223._52_4_ = uVar1;
                  auVar223._56_4_ = uVar1;
                  auVar223._60_4_ = uVar1;
                  auVar336 = vfmadd231ps_avx512f(auVar336,auVar224,auVar223);
                  auVar224 = vcvtph2ps_avx512f(pauVar150[2]);
                  uVar1 = *(undefined4 *)(*pauVar139 + 8);
                  auVar226._4_4_ = uVar1;
                  auVar226._0_4_ = uVar1;
                  auVar226._8_4_ = uVar1;
                  auVar226._12_4_ = uVar1;
                  auVar226._16_4_ = uVar1;
                  auVar226._20_4_ = uVar1;
                  auVar226._24_4_ = uVar1;
                  auVar226._28_4_ = uVar1;
                  auVar226._32_4_ = uVar1;
                  auVar226._36_4_ = uVar1;
                  auVar226._40_4_ = uVar1;
                  auVar226._44_4_ = uVar1;
                  auVar226._48_4_ = uVar1;
                  auVar226._52_4_ = uVar1;
                  auVar226._56_4_ = uVar1;
                  auVar226._60_4_ = uVar1;
                  in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar224,auVar226);
                  auVar224 = vcvtph2ps_avx512f(pauVar150[3]);
                  uVar1 = *(undefined4 *)(*pauVar139 + 0xc);
                  auVar102._4_4_ = uVar1;
                  auVar102._0_4_ = uVar1;
                  auVar102._8_4_ = uVar1;
                  auVar102._12_4_ = uVar1;
                  auVar102._16_4_ = uVar1;
                  auVar102._20_4_ = uVar1;
                  auVar102._24_4_ = uVar1;
                  auVar102._28_4_ = uVar1;
                  auVar102._32_4_ = uVar1;
                  auVar102._36_4_ = uVar1;
                  auVar102._40_4_ = uVar1;
                  auVar102._44_4_ = uVar1;
                  auVar102._48_4_ = uVar1;
                  auVar102._52_4_ = uVar1;
                  auVar102._56_4_ = uVar1;
                  auVar102._60_4_ = uVar1;
                  in_ZMM19 = vfmadd231ps_avx512f(in_ZMM19,auVar224,auVar102);
                  auVar224 = vcvtph2ps_avx512f(pauVar150[4]);
                  uVar1 = *(undefined4 *)(*pauVar139 + 0x10);
                  auVar103._4_4_ = uVar1;
                  auVar103._0_4_ = uVar1;
                  auVar103._8_4_ = uVar1;
                  auVar103._12_4_ = uVar1;
                  auVar103._16_4_ = uVar1;
                  auVar103._20_4_ = uVar1;
                  auVar103._24_4_ = uVar1;
                  auVar103._28_4_ = uVar1;
                  auVar103._32_4_ = uVar1;
                  auVar103._36_4_ = uVar1;
                  auVar103._40_4_ = uVar1;
                  auVar103._44_4_ = uVar1;
                  auVar103._48_4_ = uVar1;
                  auVar103._52_4_ = uVar1;
                  auVar103._56_4_ = uVar1;
                  auVar103._60_4_ = uVar1;
                  in_ZMM22 = vfmadd231ps_avx512f(in_ZMM22,auVar224,auVar103);
                  auVar224 = vcvtph2ps_avx512f(pauVar150[5]);
                  uVar1 = *(undefined4 *)(*pauVar139 + 0x14);
                  auVar104._4_4_ = uVar1;
                  auVar104._0_4_ = uVar1;
                  auVar104._8_4_ = uVar1;
                  auVar104._12_4_ = uVar1;
                  auVar104._16_4_ = uVar1;
                  auVar104._20_4_ = uVar1;
                  auVar104._24_4_ = uVar1;
                  auVar104._28_4_ = uVar1;
                  auVar104._32_4_ = uVar1;
                  auVar104._36_4_ = uVar1;
                  auVar104._40_4_ = uVar1;
                  auVar104._44_4_ = uVar1;
                  auVar104._48_4_ = uVar1;
                  auVar104._52_4_ = uVar1;
                  auVar104._56_4_ = uVar1;
                  auVar104._60_4_ = uVar1;
                  in_ZMM21 = vfmadd231ps_avx512f(in_ZMM21,auVar224,auVar104);
                  auVar224 = vcvtph2ps_avx512f(pauVar150[6]);
                  uVar1 = *(undefined4 *)(*pauVar139 + 0x18);
                  auVar105._4_4_ = uVar1;
                  auVar105._0_4_ = uVar1;
                  auVar105._8_4_ = uVar1;
                  auVar105._12_4_ = uVar1;
                  auVar105._16_4_ = uVar1;
                  auVar105._20_4_ = uVar1;
                  auVar105._24_4_ = uVar1;
                  auVar105._28_4_ = uVar1;
                  auVar105._32_4_ = uVar1;
                  auVar105._36_4_ = uVar1;
                  auVar105._40_4_ = uVar1;
                  auVar105._44_4_ = uVar1;
                  auVar105._48_4_ = uVar1;
                  auVar105._52_4_ = uVar1;
                  auVar105._56_4_ = uVar1;
                  auVar105._60_4_ = uVar1;
                  in_ZMM23 = vfmadd231ps_avx512f(in_ZMM23,auVar224,auVar105);
                  auVar224 = vcvtph2ps_avx512f(pauVar150[7]);
                  uVar1 = *(undefined4 *)(*pauVar139 + 0x1c);
                  auVar106._4_4_ = uVar1;
                  auVar106._0_4_ = uVar1;
                  auVar106._8_4_ = uVar1;
                  auVar106._12_4_ = uVar1;
                  auVar106._16_4_ = uVar1;
                  auVar106._20_4_ = uVar1;
                  auVar106._24_4_ = uVar1;
                  auVar106._28_4_ = uVar1;
                  auVar106._32_4_ = uVar1;
                  auVar106._36_4_ = uVar1;
                  auVar106._40_4_ = uVar1;
                  auVar106._44_4_ = uVar1;
                  auVar106._48_4_ = uVar1;
                  auVar106._52_4_ = uVar1;
                  auVar106._56_4_ = uVar1;
                  auVar106._60_4_ = uVar1;
                  auVar337 = vfmadd231ps_avx512f(auVar337,auVar224,auVar106);
                  pauVar139 = pauVar139 + 1;
                  pauVar150 = pauVar150 + 8;
                  iVar141 = iVar141 + 8;
                  uVar146 = uVar161 & 0xfffffff8;
                } while (iVar141 < (int)uVar161);
              }
              uVar142 = uVar146 | 3;
              while ((int)uVar142 < (int)uVar161) {
                auVar224 = vcvtph2ps_avx512f(*pauVar150);
                uVar1 = *(undefined4 *)*pauVar139;
                auVar107._4_4_ = uVar1;
                auVar107._0_4_ = uVar1;
                auVar107._8_4_ = uVar1;
                auVar107._12_4_ = uVar1;
                auVar107._16_4_ = uVar1;
                auVar107._20_4_ = uVar1;
                auVar107._24_4_ = uVar1;
                auVar107._28_4_ = uVar1;
                auVar107._32_4_ = uVar1;
                auVar107._36_4_ = uVar1;
                auVar107._40_4_ = uVar1;
                auVar107._44_4_ = uVar1;
                auVar107._48_4_ = uVar1;
                auVar107._52_4_ = uVar1;
                auVar107._56_4_ = uVar1;
                auVar107._60_4_ = uVar1;
                auVar335 = vfmadd231ps_avx512f(auVar335,auVar224,auVar107);
                auVar224 = vcvtph2ps_avx512f(pauVar150[1]);
                uVar1 = *(undefined4 *)(*pauVar139 + 4);
                auVar108._4_4_ = uVar1;
                auVar108._0_4_ = uVar1;
                auVar108._8_4_ = uVar1;
                auVar108._12_4_ = uVar1;
                auVar108._16_4_ = uVar1;
                auVar108._20_4_ = uVar1;
                auVar108._24_4_ = uVar1;
                auVar108._28_4_ = uVar1;
                auVar108._32_4_ = uVar1;
                auVar108._36_4_ = uVar1;
                auVar108._40_4_ = uVar1;
                auVar108._44_4_ = uVar1;
                auVar108._48_4_ = uVar1;
                auVar108._52_4_ = uVar1;
                auVar108._56_4_ = uVar1;
                auVar108._60_4_ = uVar1;
                auVar336 = vfmadd231ps_avx512f(auVar336,auVar224,auVar108);
                auVar224 = vcvtph2ps_avx512f(pauVar150[2]);
                uVar1 = *(undefined4 *)(*pauVar139 + 8);
                auVar109._4_4_ = uVar1;
                auVar109._0_4_ = uVar1;
                auVar109._8_4_ = uVar1;
                auVar109._12_4_ = uVar1;
                auVar109._16_4_ = uVar1;
                auVar109._20_4_ = uVar1;
                auVar109._24_4_ = uVar1;
                auVar109._28_4_ = uVar1;
                auVar109._32_4_ = uVar1;
                auVar109._36_4_ = uVar1;
                auVar109._40_4_ = uVar1;
                auVar109._44_4_ = uVar1;
                auVar109._48_4_ = uVar1;
                auVar109._52_4_ = uVar1;
                auVar109._56_4_ = uVar1;
                auVar109._60_4_ = uVar1;
                in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar224,auVar109);
                auVar224 = vcvtph2ps_avx512f(pauVar150[3]);
                uVar1 = *(undefined4 *)(*pauVar139 + 0xc);
                auVar110._4_4_ = uVar1;
                auVar110._0_4_ = uVar1;
                auVar110._8_4_ = uVar1;
                auVar110._12_4_ = uVar1;
                auVar110._16_4_ = uVar1;
                auVar110._20_4_ = uVar1;
                auVar110._24_4_ = uVar1;
                auVar110._28_4_ = uVar1;
                auVar110._32_4_ = uVar1;
                auVar110._36_4_ = uVar1;
                auVar110._40_4_ = uVar1;
                auVar110._44_4_ = uVar1;
                auVar110._48_4_ = uVar1;
                auVar110._52_4_ = uVar1;
                auVar110._56_4_ = uVar1;
                auVar110._60_4_ = uVar1;
                in_ZMM19 = vfmadd231ps_avx512f(in_ZMM19,auVar224,auVar110);
                pauVar139 = (undefined1 (*) [32])(*pauVar139 + 0x10);
                pauVar150 = pauVar150 + 4;
                uVar142 = uVar146 + 7;
                uVar146 = uVar146 + 4;
              }
              if (uVar161 - uVar146 != 0 && (int)uVar146 <= (int)uVar161) {
                lVar157 = 0;
                do {
                  auVar190 = vlddqu_avx(*pauVar150);
                  auVar224 = vcvtph2ps_avx512f(auVar190);
                  uVar1 = *(undefined4 *)(*pauVar139 + lVar157 * 4);
                  auVar111._4_4_ = uVar1;
                  auVar111._0_4_ = uVar1;
                  auVar111._8_4_ = uVar1;
                  auVar111._12_4_ = uVar1;
                  auVar111._16_4_ = uVar1;
                  auVar111._20_4_ = uVar1;
                  auVar111._24_4_ = uVar1;
                  auVar111._28_4_ = uVar1;
                  auVar111._32_4_ = uVar1;
                  auVar111._36_4_ = uVar1;
                  auVar111._40_4_ = uVar1;
                  auVar111._44_4_ = uVar1;
                  auVar111._48_4_ = uVar1;
                  auVar111._52_4_ = uVar1;
                  auVar111._56_4_ = uVar1;
                  auVar111._60_4_ = uVar1;
                  auVar335 = vfmadd231ps_avx512f(auVar335,auVar224,auVar111);
                  pauVar150 = pauVar150 + 1;
                  lVar157 = lVar157 + 1;
                } while (uVar161 - uVar146 != (int)lVar157);
              }
              auVar337 = vaddps_avx512f(in_ZMM23,auVar337);
              auVar224 = vaddps_avx512f(in_ZMM21,in_ZMM22);
              auVar337 = vaddps_avx512f(auVar337,auVar224);
              in_ZMM18 = vaddps_avx512f(in_ZMM19,in_ZMM20);
              in_ZMM17 = vaddps_avx512f(in_ZMM18,auVar336);
              auVar336 = vaddps_avx512f(auVar337,in_ZMM17);
              auVar335 = vaddps_avx512f(auVar336,auVar335);
              in_ZMM16 = auVar335;
              switch(uVar5) {
              case 1:
                in_ZMM16 = vmaxps_avx512f(auVar335,auVar338);
                break;
              case 2:
                uVar140 = vcmpps_avx512f(auVar335,auVar338,1);
                uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
                auVar113._4_4_ = uVar1;
                auVar113._0_4_ = uVar1;
                auVar113._8_4_ = uVar1;
                auVar113._12_4_ = uVar1;
                auVar113._16_4_ = uVar1;
                auVar113._20_4_ = uVar1;
                auVar113._24_4_ = uVar1;
                auVar113._28_4_ = uVar1;
                auVar113._32_4_ = uVar1;
                auVar113._36_4_ = uVar1;
                auVar113._40_4_ = uVar1;
                auVar113._44_4_ = uVar1;
                auVar113._48_4_ = uVar1;
                auVar113._52_4_ = uVar1;
                auVar113._56_4_ = uVar1;
                auVar113._60_4_ = uVar1;
                auVar336 = vmulps_avx512f(auVar335,auVar113);
                bVar11 = (bool)((byte)uVar140 & 1);
                in_ZMM16._0_4_ = (uint)bVar11 * auVar336._0_4_ | (uint)!bVar11 * auVar335._0_4_;
                bVar11 = (bool)((byte)(uVar140 >> 1) & 1);
                in_ZMM16._4_4_ = (uint)bVar11 * auVar336._4_4_ | (uint)!bVar11 * auVar335._4_4_;
                bVar11 = (bool)((byte)(uVar140 >> 2) & 1);
                in_ZMM16._8_4_ = (uint)bVar11 * auVar336._8_4_ | (uint)!bVar11 * auVar335._8_4_;
                bVar11 = (bool)((byte)(uVar140 >> 3) & 1);
                in_ZMM16._12_4_ = (uint)bVar11 * auVar336._12_4_ | (uint)!bVar11 * auVar335._12_4_;
                bVar11 = (bool)((byte)(uVar140 >> 4) & 1);
                in_ZMM16._16_4_ = (uint)bVar11 * auVar336._16_4_ | (uint)!bVar11 * auVar335._16_4_;
                bVar11 = (bool)((byte)(uVar140 >> 5) & 1);
                in_ZMM16._20_4_ = (uint)bVar11 * auVar336._20_4_ | (uint)!bVar11 * auVar335._20_4_;
                bVar11 = (bool)((byte)(uVar140 >> 6) & 1);
                in_ZMM16._24_4_ = (uint)bVar11 * auVar336._24_4_ | (uint)!bVar11 * auVar335._24_4_;
                bVar11 = (bool)((byte)(uVar140 >> 7) & 1);
                in_ZMM16._28_4_ = (uint)bVar11 * auVar336._28_4_ | (uint)!bVar11 * auVar335._28_4_;
                bVar11 = (bool)((byte)(uVar140 >> 8) & 1);
                in_ZMM16._32_4_ = (uint)bVar11 * auVar336._32_4_ | (uint)!bVar11 * auVar335._32_4_;
                bVar11 = (bool)((byte)(uVar140 >> 9) & 1);
                in_ZMM16._36_4_ = (uint)bVar11 * auVar336._36_4_ | (uint)!bVar11 * auVar335._36_4_;
                bVar11 = (bool)((byte)(uVar140 >> 10) & 1);
                in_ZMM16._40_4_ = (uint)bVar11 * auVar336._40_4_ | (uint)!bVar11 * auVar335._40_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xb) & 1);
                in_ZMM16._44_4_ = (uint)bVar11 * auVar336._44_4_ | (uint)!bVar11 * auVar335._44_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xc) & 1);
                in_ZMM16._48_4_ = (uint)bVar11 * auVar336._48_4_ | (uint)!bVar11 * auVar335._48_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xd) & 1);
                in_ZMM16._52_4_ = (uint)bVar11 * auVar336._52_4_ | (uint)!bVar11 * auVar335._52_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xe) & 1);
                in_ZMM16._56_4_ = (uint)bVar11 * auVar336._56_4_ | (uint)!bVar11 * auVar335._56_4_;
                bVar11 = SUB81(uVar140 >> 0xf,0);
                in_ZMM16._60_4_ = (uint)bVar11 * auVar336._60_4_ | (uint)!bVar11 * auVar335._60_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
                auVar112._4_4_ = uVar1;
                auVar112._0_4_ = uVar1;
                auVar112._8_4_ = uVar1;
                auVar112._12_4_ = uVar1;
                auVar112._16_4_ = uVar1;
                auVar112._20_4_ = uVar1;
                auVar112._24_4_ = uVar1;
                auVar112._28_4_ = uVar1;
                auVar112._32_4_ = uVar1;
                auVar112._36_4_ = uVar1;
                auVar112._40_4_ = uVar1;
                auVar112._44_4_ = uVar1;
                auVar112._48_4_ = uVar1;
                auVar112._52_4_ = uVar1;
                auVar112._56_4_ = uVar1;
                auVar112._60_4_ = uVar1;
                auVar336 = vmaxps_avx512f(auVar335,auVar112);
                uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
                auVar335._4_4_ = uVar1;
                auVar335._0_4_ = uVar1;
                auVar335._8_4_ = uVar1;
                auVar335._12_4_ = uVar1;
                auVar335._16_4_ = uVar1;
                auVar335._20_4_ = uVar1;
                auVar335._24_4_ = uVar1;
                auVar335._28_4_ = uVar1;
                auVar335._32_4_ = uVar1;
                auVar335._36_4_ = uVar1;
                auVar335._40_4_ = uVar1;
                auVar335._44_4_ = uVar1;
                auVar335._48_4_ = uVar1;
                auVar335._52_4_ = uVar1;
                auVar335._56_4_ = uVar1;
                auVar335._60_4_ = uVar1;
                in_ZMM16 = vminps_avx512f(auVar336,auVar335);
                break;
              case 4:
                auVar335 = vxorps_avx512dq(auVar335,auVar216);
                auVar335 = vminps_avx512f(auVar335,(undefined1  [64])afVar122);
                auVar335 = vmaxps_avx512f(auVar335,(undefined1  [64])afVar123);
                auVar336 = vfmadd213ps_avx512f((undefined1  [64])afVar124,auVar335,
                                               (undefined1  [64])afVar130);
                auVar337 = vrndscaleps_avx512f(auVar336,1);
                uVar140 = vcmpps_avx512f(auVar336,auVar337,1);
                auVar336 = vsubps_avx512f(auVar337,(undefined1  [64])afVar121);
                bVar11 = (bool)((byte)uVar140 & 1);
                in_ZMM17._0_4_ = (uint)bVar11 * auVar336._0_4_ | (uint)!bVar11 * auVar337._0_4_;
                bVar11 = (bool)((byte)(uVar140 >> 1) & 1);
                in_ZMM17._4_4_ = (uint)bVar11 * auVar336._4_4_ | (uint)!bVar11 * auVar337._4_4_;
                bVar11 = (bool)((byte)(uVar140 >> 2) & 1);
                in_ZMM17._8_4_ = (uint)bVar11 * auVar336._8_4_ | (uint)!bVar11 * auVar337._8_4_;
                bVar11 = (bool)((byte)(uVar140 >> 3) & 1);
                in_ZMM17._12_4_ = (uint)bVar11 * auVar336._12_4_ | (uint)!bVar11 * auVar337._12_4_;
                bVar11 = (bool)((byte)(uVar140 >> 4) & 1);
                in_ZMM17._16_4_ = (uint)bVar11 * auVar336._16_4_ | (uint)!bVar11 * auVar337._16_4_;
                bVar11 = (bool)((byte)(uVar140 >> 5) & 1);
                in_ZMM17._20_4_ = (uint)bVar11 * auVar336._20_4_ | (uint)!bVar11 * auVar337._20_4_;
                bVar11 = (bool)((byte)(uVar140 >> 6) & 1);
                in_ZMM17._24_4_ = (uint)bVar11 * auVar336._24_4_ | (uint)!bVar11 * auVar337._24_4_;
                bVar11 = (bool)((byte)(uVar140 >> 7) & 1);
                in_ZMM17._28_4_ = (uint)bVar11 * auVar336._28_4_ | (uint)!bVar11 * auVar337._28_4_;
                bVar11 = (bool)((byte)(uVar140 >> 8) & 1);
                in_ZMM17._32_4_ = (uint)bVar11 * auVar336._32_4_ | (uint)!bVar11 * auVar337._32_4_;
                bVar11 = (bool)((byte)(uVar140 >> 9) & 1);
                in_ZMM17._36_4_ = (uint)bVar11 * auVar336._36_4_ | (uint)!bVar11 * auVar337._36_4_;
                bVar11 = (bool)((byte)(uVar140 >> 10) & 1);
                in_ZMM17._40_4_ = (uint)bVar11 * auVar336._40_4_ | (uint)!bVar11 * auVar337._40_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xb) & 1);
                in_ZMM17._44_4_ = (uint)bVar11 * auVar336._44_4_ | (uint)!bVar11 * auVar337._44_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xc) & 1);
                in_ZMM17._48_4_ = (uint)bVar11 * auVar336._48_4_ | (uint)!bVar11 * auVar337._48_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xd) & 1);
                in_ZMM17._52_4_ = (uint)bVar11 * auVar336._52_4_ | (uint)!bVar11 * auVar337._52_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xe) & 1);
                in_ZMM17._56_4_ = (uint)bVar11 * auVar336._56_4_ | (uint)!bVar11 * auVar337._56_4_;
                bVar11 = SUB81(uVar140 >> 0xf,0);
                in_ZMM17._60_4_ = (uint)bVar11 * auVar336._60_4_ | (uint)!bVar11 * auVar337._60_4_;
                auVar335 = vfmadd231ps_avx512f(auVar335,in_ZMM17,auVar217);
                auVar335 = vfmadd231ps_avx512f(auVar335,in_ZMM17,auVar218);
                auVar336 = vmulps_avx512f(auVar335,auVar335);
                auVar337 = vfmadd213ps_avx512f(auVar335,(undefined1  [64])afVar125,
                                               (undefined1  [64])afVar126);
                auVar337 = vfmadd213ps_avx512f(auVar337,auVar335,(undefined1  [64])afVar127);
                auVar337 = vfmadd213ps_avx512f(auVar337,auVar335,(undefined1  [64])afVar128);
                auVar337 = vfmadd213ps_avx512f(auVar337,auVar335,(undefined1  [64])afVar129);
                auVar337 = vfmadd213ps_avx512f(auVar337,auVar335,(undefined1  [64])afVar130);
                in_ZMM18 = vfmadd213ps_avx512f(auVar337,auVar336,auVar335);
                auVar335 = vaddps_avx512f(in_ZMM18,(undefined1  [64])afVar121);
                auVar336 = vcvttps2dq_avx512f(in_ZMM17);
                auVar336 = vpaddd_avx512f(auVar336,auVar219);
                auVar336 = vpslld_avx512f(auVar336,0x17);
                auVar335 = vfmadd213ps_avx512f(auVar336,auVar335,auVar221);
                auVar336 = vrcp14ps_avx512f(auVar335);
                auVar335 = vfmsub213ps_avx512f(auVar335,auVar336,auVar221);
                in_ZMM16 = vfnmadd132ps_avx512vl(auVar335,auVar336,auVar336);
                break;
              case 5:
                auVar336 = vminps_avx512f(auVar335,(undefined1  [64])afVar122);
                auVar336 = vmaxps_avx512f(auVar336,(undefined1  [64])afVar123);
                auVar337 = vfmadd213ps_avx512f((undefined1  [64])afVar124,auVar336,
                                               (undefined1  [64])afVar130);
                auVar224 = vrndscaleps_avx512f(auVar337,1);
                uVar140 = vcmpps_avx512f(auVar337,auVar224,1);
                auVar337 = vsubps_avx512f(auVar224,(undefined1  [64])afVar121);
                bVar11 = (bool)((byte)uVar140 & 1);
                auVar225._0_4_ = (uint)bVar11 * auVar337._0_4_ | (uint)!bVar11 * auVar224._0_4_;
                bVar11 = (bool)((byte)(uVar140 >> 1) & 1);
                auVar225._4_4_ = (uint)bVar11 * auVar337._4_4_ | (uint)!bVar11 * auVar224._4_4_;
                bVar11 = (bool)((byte)(uVar140 >> 2) & 1);
                auVar225._8_4_ = (uint)bVar11 * auVar337._8_4_ | (uint)!bVar11 * auVar224._8_4_;
                bVar11 = (bool)((byte)(uVar140 >> 3) & 1);
                auVar225._12_4_ = (uint)bVar11 * auVar337._12_4_ | (uint)!bVar11 * auVar224._12_4_;
                bVar11 = (bool)((byte)(uVar140 >> 4) & 1);
                auVar225._16_4_ = (uint)bVar11 * auVar337._16_4_ | (uint)!bVar11 * auVar224._16_4_;
                bVar11 = (bool)((byte)(uVar140 >> 5) & 1);
                auVar225._20_4_ = (uint)bVar11 * auVar337._20_4_ | (uint)!bVar11 * auVar224._20_4_;
                bVar11 = (bool)((byte)(uVar140 >> 6) & 1);
                auVar225._24_4_ = (uint)bVar11 * auVar337._24_4_ | (uint)!bVar11 * auVar224._24_4_;
                bVar11 = (bool)((byte)(uVar140 >> 7) & 1);
                auVar225._28_4_ = (uint)bVar11 * auVar337._28_4_ | (uint)!bVar11 * auVar224._28_4_;
                bVar11 = (bool)((byte)(uVar140 >> 8) & 1);
                auVar225._32_4_ = (uint)bVar11 * auVar337._32_4_ | (uint)!bVar11 * auVar224._32_4_;
                bVar11 = (bool)((byte)(uVar140 >> 9) & 1);
                auVar225._36_4_ = (uint)bVar11 * auVar337._36_4_ | (uint)!bVar11 * auVar224._36_4_;
                bVar11 = (bool)((byte)(uVar140 >> 10) & 1);
                auVar225._40_4_ = (uint)bVar11 * auVar337._40_4_ | (uint)!bVar11 * auVar224._40_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xb) & 1);
                auVar225._44_4_ = (uint)bVar11 * auVar337._44_4_ | (uint)!bVar11 * auVar224._44_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xc) & 1);
                auVar225._48_4_ = (uint)bVar11 * auVar337._48_4_ | (uint)!bVar11 * auVar224._48_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xd) & 1);
                auVar225._52_4_ = (uint)bVar11 * auVar337._52_4_ | (uint)!bVar11 * auVar224._52_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xe) & 1);
                auVar225._56_4_ = (uint)bVar11 * auVar337._56_4_ | (uint)!bVar11 * auVar224._56_4_;
                bVar11 = SUB81(uVar140 >> 0xf,0);
                auVar225._60_4_ = (uint)bVar11 * auVar337._60_4_ | (uint)!bVar11 * auVar224._60_4_;
                auVar336 = vfmadd231ps_avx512f(auVar336,auVar225,auVar217);
                auVar336 = vfmadd231ps_avx512f(auVar336,auVar225,auVar218);
                auVar337 = vmulps_avx512f(auVar336,auVar336);
                auVar224 = vfmadd213ps_avx512f(auVar336,(undefined1  [64])afVar125,
                                               (undefined1  [64])afVar126);
                auVar224 = vfmadd213ps_avx512f(auVar224,auVar336,(undefined1  [64])afVar127);
                auVar224 = vfmadd213ps_avx512f(auVar224,auVar336,(undefined1  [64])afVar128);
                auVar224 = vfmadd213ps_avx512f(auVar224,auVar336,(undefined1  [64])afVar129);
                auVar224 = vfmadd213ps_avx512f(auVar224,auVar336,(undefined1  [64])afVar130);
                auVar336 = vfmadd213ps_avx512f(auVar224,auVar337,auVar336);
                auVar336 = vaddps_avx512f(auVar336,(undefined1  [64])afVar121);
                auVar337 = vcvttps2dq_avx512f(auVar225);
                auVar337 = vpaddd_avx512f(auVar337,auVar219);
                auVar337 = vpslld_avx512f(auVar337,0x17);
                auVar336 = vfmadd213ps_avx512f(auVar337,auVar336,auVar221);
                auVar337 = vmaxps_avx512f(auVar336,(undefined1  [64])_ps512_min_norm_pos);
                auVar224 = vpsrld_avx512f(auVar337,0x17);
                auVar337 = vpternlogd_avx512f(auVar337,(undefined1  [64])afVar130,
                                              (undefined1  [64])_ps512_inv_mant_mask,0xec);
                uVar140 = vcmpps_avx512f(auVar337,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                auVar223 = vsubps_avx512f(auVar337,(undefined1  [64])afVar121);
                auVar226 = vaddps_avx512f(auVar223,auVar337);
                bVar11 = (bool)((byte)uVar140 & 1);
                auVar337._0_4_ = (uint)bVar11 * auVar226._0_4_ | (uint)!bVar11 * auVar223._0_4_;
                bVar11 = (bool)((byte)(uVar140 >> 1) & 1);
                auVar337._4_4_ = (uint)bVar11 * auVar226._4_4_ | (uint)!bVar11 * auVar223._4_4_;
                bVar11 = (bool)((byte)(uVar140 >> 2) & 1);
                auVar337._8_4_ = (uint)bVar11 * auVar226._8_4_ | (uint)!bVar11 * auVar223._8_4_;
                bVar11 = (bool)((byte)(uVar140 >> 3) & 1);
                auVar337._12_4_ = (uint)bVar11 * auVar226._12_4_ | (uint)!bVar11 * auVar223._12_4_;
                bVar11 = (bool)((byte)(uVar140 >> 4) & 1);
                auVar337._16_4_ = (uint)bVar11 * auVar226._16_4_ | (uint)!bVar11 * auVar223._16_4_;
                bVar11 = (bool)((byte)(uVar140 >> 5) & 1);
                auVar337._20_4_ = (uint)bVar11 * auVar226._20_4_ | (uint)!bVar11 * auVar223._20_4_;
                bVar11 = (bool)((byte)(uVar140 >> 6) & 1);
                auVar337._24_4_ = (uint)bVar11 * auVar226._24_4_ | (uint)!bVar11 * auVar223._24_4_;
                bVar11 = (bool)((byte)(uVar140 >> 7) & 1);
                auVar337._28_4_ = (uint)bVar11 * auVar226._28_4_ | (uint)!bVar11 * auVar223._28_4_;
                bVar12 = (byte)(uVar140 >> 8);
                bVar11 = (bool)(bVar12 & 1);
                auVar337._32_4_ = (uint)bVar11 * auVar226._32_4_ | (uint)!bVar11 * auVar223._32_4_;
                bVar11 = (bool)((byte)(uVar140 >> 9) & 1);
                auVar337._36_4_ = (uint)bVar11 * auVar226._36_4_ | (uint)!bVar11 * auVar223._36_4_;
                bVar11 = (bool)((byte)(uVar140 >> 10) & 1);
                auVar337._40_4_ = (uint)bVar11 * auVar226._40_4_ | (uint)!bVar11 * auVar223._40_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xb) & 1);
                auVar337._44_4_ = (uint)bVar11 * auVar226._44_4_ | (uint)!bVar11 * auVar223._44_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xc) & 1);
                auVar337._48_4_ = (uint)bVar11 * auVar226._48_4_ | (uint)!bVar11 * auVar223._48_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xd) & 1);
                auVar337._52_4_ = (uint)bVar11 * auVar226._52_4_ | (uint)!bVar11 * auVar223._52_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xe) & 1);
                auVar337._56_4_ = (uint)bVar11 * auVar226._56_4_ | (uint)!bVar11 * auVar223._56_4_;
                bVar11 = SUB81(uVar140 >> 0xf,0);
                auVar337._60_4_ = (uint)bVar11 * auVar226._60_4_ | (uint)!bVar11 * auVar223._60_4_;
                auVar223 = vmulps_avx512f(auVar337,auVar337);
                auVar226 = vfmadd132ps_avx512f(auVar337,(undefined1  [64])_ps512_cephes_log_p1,
                                               (undefined1  [64])_ps512_cephes_log_p0);
                auVar226 = vfmadd213ps_avx512f(auVar226,auVar337,
                                               (undefined1  [64])_ps512_cephes_log_p2);
                auVar226 = vfmadd213ps_avx512f(auVar226,auVar337,
                                               (undefined1  [64])_ps512_cephes_log_p3);
                auVar226 = vfmadd213ps_avx512f(auVar226,auVar337,
                                               (undefined1  [64])_ps512_cephes_log_p4);
                auVar226 = vfmadd213ps_avx512f(auVar226,auVar337,
                                               (undefined1  [64])_ps512_cephes_log_p5);
                auVar226 = vfmadd213ps_avx512f(auVar226,auVar337,
                                               (undefined1  [64])_ps512_cephes_log_p6);
                auVar226 = vfmadd213ps_avx512f(auVar226,auVar337,(undefined1  [64])afVar131);
                in_ZMM20 = vfmadd213ps_avx512f(auVar226,auVar337,(undefined1  [64])afVar132);
                auVar226 = vmulps_avx512f(auVar223,auVar337);
                auVar337 = vfmadd213ps_avx512f(auVar226,in_ZMM20,auVar337);
                uVar14 = vcmpps_avx512f(auVar336,auVar338,2);
                auVar336 = vpsubd_avx512f(auVar224,auVar219);
                auVar336 = vcvtdq2ps_avx512f(auVar336);
                auVar224 = vaddps_avx512f(auVar336,(undefined1  [64])afVar121);
                bVar11 = (bool)((byte)uVar140 & 1);
                auVar227._0_4_ = (uint)bVar11 * auVar336._0_4_ | (uint)!bVar11 * auVar224._0_4_;
                bVar11 = (bool)((byte)(uVar140 >> 1) & 1);
                auVar227._4_4_ = (uint)bVar11 * auVar336._4_4_ | (uint)!bVar11 * auVar224._4_4_;
                bVar11 = (bool)((byte)(uVar140 >> 2) & 1);
                auVar227._8_4_ = (uint)bVar11 * auVar336._8_4_ | (uint)!bVar11 * auVar224._8_4_;
                bVar11 = (bool)((byte)(uVar140 >> 3) & 1);
                auVar227._12_4_ = (uint)bVar11 * auVar336._12_4_ | (uint)!bVar11 * auVar224._12_4_;
                bVar11 = (bool)((byte)(uVar140 >> 4) & 1);
                auVar227._16_4_ = (uint)bVar11 * auVar336._16_4_ | (uint)!bVar11 * auVar224._16_4_;
                bVar11 = (bool)((byte)(uVar140 >> 5) & 1);
                auVar227._20_4_ = (uint)bVar11 * auVar336._20_4_ | (uint)!bVar11 * auVar224._20_4_;
                bVar11 = (bool)((byte)(uVar140 >> 6) & 1);
                auVar227._24_4_ = (uint)bVar11 * auVar336._24_4_ | (uint)!bVar11 * auVar224._24_4_;
                bVar11 = (bool)((byte)(uVar140 >> 7) & 1);
                auVar227._28_4_ = (uint)bVar11 * auVar336._28_4_ | (uint)!bVar11 * auVar224._28_4_;
                bVar11 = (bool)(bVar12 & 1);
                auVar227._32_4_ = (uint)bVar11 * auVar336._32_4_ | (uint)!bVar11 * auVar224._32_4_;
                bVar11 = (bool)((byte)(uVar140 >> 9) & 1);
                auVar227._36_4_ = (uint)bVar11 * auVar336._36_4_ | (uint)!bVar11 * auVar224._36_4_;
                bVar11 = (bool)((byte)(uVar140 >> 10) & 1);
                auVar227._40_4_ = (uint)bVar11 * auVar336._40_4_ | (uint)!bVar11 * auVar224._40_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xb) & 1);
                auVar227._44_4_ = (uint)bVar11 * auVar336._44_4_ | (uint)!bVar11 * auVar224._44_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xc) & 1);
                auVar227._48_4_ = (uint)bVar11 * auVar336._48_4_ | (uint)!bVar11 * auVar224._48_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xd) & 1);
                auVar227._52_4_ = (uint)bVar11 * auVar336._52_4_ | (uint)!bVar11 * auVar224._52_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xe) & 1);
                auVar227._56_4_ = (uint)bVar11 * auVar336._56_4_ | (uint)!bVar11 * auVar224._56_4_;
                bVar11 = SUB81(uVar140 >> 0xf,0);
                auVar227._60_4_ = (uint)bVar11 * auVar336._60_4_ | (uint)!bVar11 * auVar224._60_4_;
                auVar336 = vfmadd231ps_avx512f(auVar337,auVar227,(undefined1  [64])afVar133);
                auVar336 = vfmadd231ps_avx512f(auVar336,auVar220,auVar223);
                in_ZMM21 = vfmadd231ps_avx512f(auVar336,(undefined1  [64])afVar134,auVar227);
                auVar336 = vmulps_avx512f(in_ZMM21,auVar222);
                auVar337 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                bVar11 = (bool)((byte)uVar14 & 1);
                auVar228._0_4_ = (uint)bVar11 * auVar337._0_4_ | (uint)!bVar11 * auVar336._0_4_;
                bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
                auVar228._4_4_ = (uint)bVar11 * auVar337._4_4_ | (uint)!bVar11 * auVar336._4_4_;
                bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
                auVar228._8_4_ = (uint)bVar11 * auVar337._8_4_ | (uint)!bVar11 * auVar336._8_4_;
                bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
                auVar228._12_4_ = (uint)bVar11 * auVar337._12_4_ | (uint)!bVar11 * auVar336._12_4_;
                bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
                auVar228._16_4_ = (uint)bVar11 * auVar337._16_4_ | (uint)!bVar11 * auVar336._16_4_;
                bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
                auVar228._20_4_ = (uint)bVar11 * auVar337._20_4_ | (uint)!bVar11 * auVar336._20_4_;
                bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
                auVar228._24_4_ = (uint)bVar11 * auVar337._24_4_ | (uint)!bVar11 * auVar336._24_4_;
                bVar11 = (bool)((byte)(uVar14 >> 7) & 1);
                auVar228._28_4_ = (uint)bVar11 * auVar337._28_4_ | (uint)!bVar11 * auVar336._28_4_;
                bVar11 = (bool)((byte)(uVar14 >> 8) & 1);
                auVar228._32_4_ = (uint)bVar11 * auVar337._32_4_ | (uint)!bVar11 * auVar336._32_4_;
                bVar11 = (bool)((byte)(uVar14 >> 9) & 1);
                auVar228._36_4_ = (uint)bVar11 * auVar337._36_4_ | (uint)!bVar11 * auVar336._36_4_;
                bVar11 = (bool)((byte)(uVar14 >> 10) & 1);
                auVar228._40_4_ = (uint)bVar11 * auVar337._40_4_ | (uint)!bVar11 * auVar336._40_4_;
                bVar11 = (bool)((byte)(uVar14 >> 0xb) & 1);
                auVar228._44_4_ = (uint)bVar11 * auVar337._44_4_ | (uint)!bVar11 * auVar336._44_4_;
                bVar11 = (bool)((byte)(uVar14 >> 0xc) & 1);
                auVar228._48_4_ = (uint)bVar11 * auVar337._48_4_ | (uint)!bVar11 * auVar336._48_4_;
                bVar11 = (bool)((byte)(uVar14 >> 0xd) & 1);
                auVar228._52_4_ = (uint)bVar11 * auVar337._52_4_ | (uint)!bVar11 * auVar336._52_4_;
                bVar11 = (bool)((byte)(uVar14 >> 0xe) & 1);
                auVar228._56_4_ = (uint)bVar11 * auVar337._56_4_ | (uint)!bVar11 * auVar336._56_4_;
                bVar11 = SUB81(uVar14 >> 0xf,0);
                auVar228._60_4_ = (uint)bVar11 * auVar337._60_4_ | (uint)!bVar11 * auVar336._60_4_;
                auVar336 = vminps_avx512f(auVar228,(undefined1  [64])afVar122);
                auVar336 = vmaxps_avx512f(auVar336,(undefined1  [64])afVar123);
                auVar337 = vfmadd213ps_avx512f((undefined1  [64])afVar124,auVar336,
                                               (undefined1  [64])afVar130);
                auVar224 = vrndscaleps_avx512f(auVar337,1);
                uVar140 = vcmpps_avx512f(auVar337,auVar224,1);
                auVar337 = vsubps_avx512f(auVar224,(undefined1  [64])afVar121);
                bVar11 = (bool)((byte)uVar140 & 1);
                in_ZMM18._0_4_ = (uint)bVar11 * auVar337._0_4_ | (uint)!bVar11 * auVar224._0_4_;
                bVar11 = (bool)((byte)(uVar140 >> 1) & 1);
                in_ZMM18._4_4_ = (uint)bVar11 * auVar337._4_4_ | (uint)!bVar11 * auVar224._4_4_;
                bVar11 = (bool)((byte)(uVar140 >> 2) & 1);
                in_ZMM18._8_4_ = (uint)bVar11 * auVar337._8_4_ | (uint)!bVar11 * auVar224._8_4_;
                bVar11 = (bool)((byte)(uVar140 >> 3) & 1);
                in_ZMM18._12_4_ = (uint)bVar11 * auVar337._12_4_ | (uint)!bVar11 * auVar224._12_4_;
                bVar11 = (bool)((byte)(uVar140 >> 4) & 1);
                in_ZMM18._16_4_ = (uint)bVar11 * auVar337._16_4_ | (uint)!bVar11 * auVar224._16_4_;
                bVar11 = (bool)((byte)(uVar140 >> 5) & 1);
                in_ZMM18._20_4_ = (uint)bVar11 * auVar337._20_4_ | (uint)!bVar11 * auVar224._20_4_;
                bVar11 = (bool)((byte)(uVar140 >> 6) & 1);
                in_ZMM18._24_4_ = (uint)bVar11 * auVar337._24_4_ | (uint)!bVar11 * auVar224._24_4_;
                bVar11 = (bool)((byte)(uVar140 >> 7) & 1);
                in_ZMM18._28_4_ = (uint)bVar11 * auVar337._28_4_ | (uint)!bVar11 * auVar224._28_4_;
                bVar11 = (bool)((byte)(uVar140 >> 8) & 1);
                in_ZMM18._32_4_ = (uint)bVar11 * auVar337._32_4_ | (uint)!bVar11 * auVar224._32_4_;
                bVar11 = (bool)((byte)(uVar140 >> 9) & 1);
                in_ZMM18._36_4_ = (uint)bVar11 * auVar337._36_4_ | (uint)!bVar11 * auVar224._36_4_;
                bVar11 = (bool)((byte)(uVar140 >> 10) & 1);
                in_ZMM18._40_4_ = (uint)bVar11 * auVar337._40_4_ | (uint)!bVar11 * auVar224._40_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xb) & 1);
                in_ZMM18._44_4_ = (uint)bVar11 * auVar337._44_4_ | (uint)!bVar11 * auVar224._44_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xc) & 1);
                in_ZMM18._48_4_ = (uint)bVar11 * auVar337._48_4_ | (uint)!bVar11 * auVar224._48_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xd) & 1);
                in_ZMM18._52_4_ = (uint)bVar11 * auVar337._52_4_ | (uint)!bVar11 * auVar224._52_4_;
                bVar11 = (bool)((byte)(uVar140 >> 0xe) & 1);
                in_ZMM18._56_4_ = (uint)bVar11 * auVar337._56_4_ | (uint)!bVar11 * auVar224._56_4_;
                bVar11 = SUB81(uVar140 >> 0xf,0);
                in_ZMM18._60_4_ = (uint)bVar11 * auVar337._60_4_ | (uint)!bVar11 * auVar224._60_4_;
                auVar336 = vfmadd231ps_avx512f(auVar336,in_ZMM18,auVar217);
                auVar336 = vfmadd231ps_avx512f(auVar336,in_ZMM18,auVar218);
                auVar337 = vmulps_avx512f(auVar336,auVar336);
                auVar224 = vfmadd213ps_avx512f(auVar336,(undefined1  [64])afVar125,
                                               (undefined1  [64])afVar126);
                auVar224 = vfmadd213ps_avx512f(auVar224,auVar336,(undefined1  [64])afVar127);
                auVar224 = vfmadd213ps_avx512f(auVar224,auVar336,(undefined1  [64])afVar128);
                auVar224 = vfmadd213ps_avx512f(auVar224,auVar336,(undefined1  [64])afVar129);
                auVar224 = vfmadd213ps_avx512f(auVar224,auVar336,(undefined1  [64])afVar130);
                in_ZMM19 = vfmadd213ps_avx512f(auVar224,auVar337,auVar336);
                auVar336 = vaddps_avx512f(in_ZMM19,(undefined1  [64])afVar121);
                auVar337 = vcvttps2dq_avx512f(in_ZMM18);
                auVar337 = vpaddd_avx512f(auVar337,auVar219);
                auVar337 = vpslld_avx512f(auVar337,0x17);
                auVar336 = vfmadd213ps_avx512f(auVar337,auVar336,auVar221);
                auVar337 = vrcp14ps_avx512f(auVar336);
                auVar336 = vfmsub213ps_avx512f(auVar336,auVar337,auVar221);
                auVar336 = vfnmadd132ps_avx512vl(auVar336,auVar337,auVar337);
                in_ZMM17 = vfnmsub213ps_avx512f(auVar336,auVar222,auVar221);
                in_ZMM16 = vmulps_avx512f(in_ZMM17,auVar335);
                break;
              case 6:
                auVar337 = vbroadcastss_avx512f
                                     (ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var6)));
                uVar146 = (*(uint **)(&this->field_0xe8 + (long)p_Var6))[1];
                auVar336._4_4_ = uVar146;
                auVar336._0_4_ = uVar146;
                auVar336._8_4_ = uVar146;
                auVar336._12_4_ = uVar146;
                auVar336._16_4_ = uVar146;
                auVar336._20_4_ = uVar146;
                auVar336._24_4_ = uVar146;
                auVar336._28_4_ = uVar146;
                auVar336._32_4_ = uVar146;
                auVar336._36_4_ = uVar146;
                auVar336._40_4_ = uVar146;
                auVar336._44_4_ = uVar146;
                auVar336._48_4_ = uVar146;
                auVar336._52_4_ = uVar146;
                auVar336._56_4_ = uVar146;
                auVar336._60_4_ = uVar146;
                auVar336 = vfmadd213ps_avx512f(auVar337,auVar335,auVar336);
                auVar336 = vmaxps_avx512f(auVar336,auVar338);
                auVar336 = vminps_avx512f(auVar336,auVar221);
                in_ZMM16 = vmulps_avx512f(auVar336,auVar335);
              }
              *(undefined1 (*) [64])((long)top_blob->data + lVar147 * 0x40) = in_ZMM16;
              lVar147 = lVar147 + 1;
            } while (lVar147 != iVar137);
          }
          iVar137 = 0;
        }
        goto LAB_00312889;
      }
      iVar137 = top_blob->w;
      if (0 < (long)iVar137) {
        p_Var6 = this->_vptr_InnerProduct_x86_avx512[-3];
        iVar141 = *(int *)(&this->field_0xe0 + (long)p_Var6);
        uVar146 = local_3c0 * iStack_3ac;
        lVar8 = *(long *)(&this->field_0x178 + (long)p_Var6);
        lVar147 = 0;
        auVar190 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar260._8_4_ = 0xc2b0c0a5;
        auVar260._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar260._12_4_ = 0xc2b0c0a5;
        auVar260._16_4_ = 0xc2b0c0a5;
        auVar260._20_4_ = 0xc2b0c0a5;
        auVar260._24_4_ = 0xc2b0c0a5;
        auVar260._28_4_ = 0xc2b0c0a5;
        auVar281._8_4_ = 0x3f000000;
        auVar281._0_8_ = 0x3f0000003f000000;
        auVar281._12_4_ = 0x3f000000;
        auVar281._16_4_ = 0x3f000000;
        auVar281._20_4_ = 0x3f000000;
        auVar281._24_4_ = 0x3f000000;
        auVar281._28_4_ = 0x3f000000;
        auVar290._8_4_ = 0x3fb8aa3b;
        auVar290._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar290._12_4_ = 0x3fb8aa3b;
        auVar290._16_4_ = 0x3fb8aa3b;
        auVar290._20_4_ = 0x3fb8aa3b;
        auVar290._24_4_ = 0x3fb8aa3b;
        auVar290._28_4_ = 0x3fb8aa3b;
        auVar295._8_4_ = 0x3f800000;
        auVar295._0_8_ = 0x3f8000003f800000;
        auVar295._12_4_ = 0x3f800000;
        auVar295._16_4_ = 0x3f800000;
        auVar295._20_4_ = 0x3f800000;
        auVar295._24_4_ = 0x3f800000;
        auVar295._28_4_ = 0x3f800000;
        auVar300._8_4_ = 0x3f318000;
        auVar300._0_8_ = 0x3f3180003f318000;
        auVar300._12_4_ = 0x3f318000;
        auVar300._16_4_ = 0x3f318000;
        auVar300._20_4_ = 0x3f318000;
        auVar300._24_4_ = 0x3f318000;
        auVar300._28_4_ = 0x3f318000;
        auVar309._8_4_ = 0x39506967;
        auVar309._0_8_ = 0x3950696739506967;
        auVar309._12_4_ = 0x39506967;
        auVar309._16_4_ = 0x39506967;
        auVar309._20_4_ = 0x39506967;
        auVar309._24_4_ = 0x39506967;
        auVar309._28_4_ = 0x39506967;
        auVar313._8_4_ = 0x3ab743ce;
        auVar313._0_8_ = 0x3ab743ce3ab743ce;
        auVar313._12_4_ = 0x3ab743ce;
        auVar313._16_4_ = 0x3ab743ce;
        auVar313._20_4_ = 0x3ab743ce;
        auVar313._24_4_ = 0x3ab743ce;
        auVar313._28_4_ = 0x3ab743ce;
        auVar317._8_4_ = 0x3c088908;
        auVar317._0_8_ = 0x3c0889083c088908;
        auVar317._12_4_ = 0x3c088908;
        auVar317._16_4_ = 0x3c088908;
        auVar317._20_4_ = 0x3c088908;
        auVar317._24_4_ = 0x3c088908;
        auVar317._28_4_ = 0x3c088908;
        auVar321._8_4_ = 0x3d2aa9c1;
        auVar321._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar321._12_4_ = 0x3d2aa9c1;
        auVar321._16_4_ = 0x3d2aa9c1;
        auVar321._20_4_ = 0x3d2aa9c1;
        auVar321._24_4_ = 0x3d2aa9c1;
        auVar321._28_4_ = 0x3d2aa9c1;
        auVar326._8_4_ = 0x3e2aaaaa;
        auVar326._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar326._12_4_ = 0x3e2aaaaa;
        auVar326._16_4_ = 0x3e2aaaaa;
        auVar326._20_4_ = 0x3e2aaaaa;
        auVar326._24_4_ = 0x3e2aaaaa;
        auVar326._28_4_ = 0x3e2aaaaa;
        auVar329._8_4_ = 0x3f800000;
        auVar329._0_8_ = 0x3f8000003f800000;
        auVar329._12_4_ = 0x3f800000;
        auVar329._16_4_ = 0x3f800000;
        auVar329._20_4_ = 0x3f800000;
        auVar329._24_4_ = 0x3f800000;
        auVar329._28_4_ = 0x3f800000;
        auVar333._8_4_ = 0xb95e8083;
        auVar333._0_8_ = 0xb95e8083b95e8083;
        auVar333._12_4_ = 0xb95e8083;
        auVar333._16_4_ = 0xb95e8083;
        auVar333._20_4_ = 0xb95e8083;
        auVar333._24_4_ = 0xb95e8083;
        auVar333._28_4_ = 0xb95e8083;
        auVar191 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar192 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar193 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar194 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar195 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar196 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar197 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar198 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        do {
          auVar216 = ZEXT1664(ZEXT816(0) << 0x40);
          if (lVar8 != 0) {
            auVar216 = ZEXT3264(*(undefined1 (*) [32])(lVar8 + lVar147 * 0x20));
          }
          pauVar150 = (undefined1 (*) [32])
                      ((this->weight_data_tm).w * lVar147 * (this->weight_data_tm).elemsize +
                      (long)(this->weight_data_tm).data);
          auVar165 = in_ZMM18._0_16_;
          auVar166 = in_ZMM17._0_16_;
          auVar168 = in_ZMM20._0_16_;
          auVar167 = in_ZMM19._0_16_;
          auVar169 = in_ZMM23._0_16_;
          auVar164 = in_ZMM16._0_16_;
          pauVar139 = local_3d8;
          if ((int)uVar146 < 8) {
            auVar164 = vxorps_avx512vl(auVar164,auVar164);
            auVar201 = ZEXT1632(auVar164);
            auVar164 = vxorps_avx512vl(auVar169,auVar169);
            in_ZMM23 = ZEXT1664(auVar164);
            auVar164 = vxorps_avx512vl(auVar167,auVar167);
            in_ZMM19 = ZEXT1664(auVar164);
            auVar164 = vxorps_avx512vl(auVar168,auVar168);
            in_ZMM20 = ZEXT1664(auVar164);
            auVar164 = vxorps_avx512vl(auVar166,auVar166);
            in_ZMM17 = ZEXT1664(auVar164);
            auVar164 = vxorps_avx512vl(auVar165,auVar165);
            in_ZMM18 = ZEXT1664(auVar164);
            auVar217 = ZEXT864(0);
            uVar142 = 0;
          }
          else {
            auVar217 = ZEXT864(0);
            iVar143 = 7;
            auVar165 = vxorps_avx512vl(auVar165,auVar165);
            in_ZMM18 = ZEXT1664(auVar165);
            auVar166 = vxorps_avx512vl(auVar166,auVar166);
            in_ZMM17 = ZEXT1664(auVar166);
            auVar166 = vxorps_avx512vl(auVar168,auVar168);
            in_ZMM20 = ZEXT1664(auVar166);
            auVar166 = vxorps_avx512vl(auVar167,auVar167);
            in_ZMM19 = ZEXT1664(auVar166);
            auVar166 = vxorps_avx512vl(auVar169,auVar169);
            in_ZMM23 = ZEXT1664(auVar166);
            auVar164 = vxorps_avx512vl(auVar164,auVar164);
            auVar218 = ZEXT1664(auVar164);
            do {
              auVar201 = vlddqu_avx(*pauVar150);
              auVar199 = vcvtph2ps_avx512vl(auVar201._0_16_);
              uVar5 = *(undefined4 *)*pauVar139;
              auVar200._4_4_ = uVar5;
              auVar200._0_4_ = uVar5;
              auVar200._8_4_ = uVar5;
              auVar200._12_4_ = uVar5;
              auVar200._16_4_ = uVar5;
              auVar200._20_4_ = uVar5;
              auVar200._24_4_ = uVar5;
              auVar200._28_4_ = uVar5;
              auVar200 = vfmadd231ps_avx512vl(auVar216._0_32_,auVar199,auVar200);
              auVar216 = ZEXT3264(auVar200);
              auVar201 = vcvtph2ps_f16c(auVar201._16_16_);
              uVar5 = *(undefined4 *)(*pauVar139 + 4);
              auVar199._4_4_ = uVar5;
              auVar199._0_4_ = uVar5;
              auVar199._8_4_ = uVar5;
              auVar199._12_4_ = uVar5;
              auVar199._16_4_ = uVar5;
              auVar199._20_4_ = uVar5;
              auVar199._24_4_ = uVar5;
              auVar199._28_4_ = uVar5;
              auVar201 = vfmadd231ps_avx512vl(auVar217._0_32_,auVar201,auVar199);
              auVar217 = ZEXT3264(auVar201);
              auVar201 = vlddqu_avx(pauVar150[1]);
              auVar200 = vcvtph2ps_avx512vl(auVar201._0_16_);
              uVar5 = *(undefined4 *)(*pauVar139 + 8);
              auVar202._4_4_ = uVar5;
              auVar202._0_4_ = uVar5;
              auVar202._8_4_ = uVar5;
              auVar202._12_4_ = uVar5;
              auVar202._16_4_ = uVar5;
              auVar202._20_4_ = uVar5;
              auVar202._24_4_ = uVar5;
              auVar202._28_4_ = uVar5;
              auVar200 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar200,auVar202);
              in_ZMM18 = ZEXT3264(auVar200);
              auVar201 = vcvtph2ps_f16c(auVar201._16_16_);
              uVar5 = *(undefined4 *)(*pauVar139 + 0xc);
              auVar203._4_4_ = uVar5;
              auVar203._0_4_ = uVar5;
              auVar203._8_4_ = uVar5;
              auVar203._12_4_ = uVar5;
              auVar203._16_4_ = uVar5;
              auVar203._20_4_ = uVar5;
              auVar203._24_4_ = uVar5;
              auVar203._28_4_ = uVar5;
              auVar201 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar201,auVar203);
              in_ZMM17 = ZEXT3264(auVar201);
              auVar201 = vlddqu_avx(pauVar150[2]);
              auVar200 = vcvtph2ps_avx512vl(auVar201._0_16_);
              uVar5 = *(undefined4 *)(*pauVar139 + 0x10);
              auVar57._4_4_ = uVar5;
              auVar57._0_4_ = uVar5;
              auVar57._8_4_ = uVar5;
              auVar57._12_4_ = uVar5;
              auVar57._16_4_ = uVar5;
              auVar57._20_4_ = uVar5;
              auVar57._24_4_ = uVar5;
              auVar57._28_4_ = uVar5;
              auVar200 = vfmadd231ps_avx512vl(in_ZMM20._0_32_,auVar200,auVar57);
              in_ZMM20 = ZEXT3264(auVar200);
              auVar201 = vcvtph2ps_f16c(auVar201._16_16_);
              uVar5 = *(undefined4 *)(*pauVar139 + 0x14);
              auVar58._4_4_ = uVar5;
              auVar58._0_4_ = uVar5;
              auVar58._8_4_ = uVar5;
              auVar58._12_4_ = uVar5;
              auVar58._16_4_ = uVar5;
              auVar58._20_4_ = uVar5;
              auVar58._24_4_ = uVar5;
              auVar58._28_4_ = uVar5;
              auVar201 = vfmadd231ps_avx512vl(in_ZMM19._0_32_,auVar201,auVar58);
              in_ZMM19 = ZEXT3264(auVar201);
              auVar201 = vlddqu_avx(pauVar150[3]);
              auVar200 = vcvtph2ps_avx512vl(auVar201._0_16_);
              uVar5 = *(undefined4 *)(*pauVar139 + 0x18);
              auVar59._4_4_ = uVar5;
              auVar59._0_4_ = uVar5;
              auVar59._8_4_ = uVar5;
              auVar59._12_4_ = uVar5;
              auVar59._16_4_ = uVar5;
              auVar59._20_4_ = uVar5;
              auVar59._24_4_ = uVar5;
              auVar59._28_4_ = uVar5;
              auVar200 = vfmadd231ps_avx512vl(in_ZMM23._0_32_,auVar200,auVar59);
              in_ZMM23 = ZEXT3264(auVar200);
              auVar201 = vcvtph2ps_f16c(auVar201._16_16_);
              uVar5 = *(undefined4 *)(*pauVar139 + 0x1c);
              auVar60._4_4_ = uVar5;
              auVar60._0_4_ = uVar5;
              auVar60._8_4_ = uVar5;
              auVar60._12_4_ = uVar5;
              auVar60._16_4_ = uVar5;
              auVar60._20_4_ = uVar5;
              auVar60._24_4_ = uVar5;
              auVar60._28_4_ = uVar5;
              auVar201 = vfmadd231ps_avx512vl(auVar218._0_32_,auVar201,auVar60);
              auVar218 = ZEXT3264(auVar201);
              pauVar139 = pauVar139 + 1;
              pauVar150 = pauVar150 + 4;
              iVar143 = iVar143 + 8;
              uVar142 = uVar146 & 0xfffffff8;
            } while (iVar143 < (int)uVar146);
          }
          auVar200 = auVar217._0_32_;
          uVar156 = uVar142 | 3;
          while( true ) {
            auVar199 = auVar216._0_32_;
            if ((int)uVar146 <= (int)uVar156) break;
            auVar200 = vlddqu_avx(*pauVar150);
            auVar202 = vcvtph2ps_avx512vl(auVar200._0_16_);
            uVar5 = *(undefined4 *)*pauVar139;
            auVar61._4_4_ = uVar5;
            auVar61._0_4_ = uVar5;
            auVar61._8_4_ = uVar5;
            auVar61._12_4_ = uVar5;
            auVar61._16_4_ = uVar5;
            auVar61._20_4_ = uVar5;
            auVar61._24_4_ = uVar5;
            auVar61._28_4_ = uVar5;
            auVar199 = vfmadd231ps_avx512vl(auVar199,auVar202,auVar61);
            auVar216 = ZEXT3264(auVar199);
            auVar200 = vcvtph2ps_f16c(auVar200._16_16_);
            uVar5 = *(undefined4 *)(*pauVar139 + 4);
            auVar62._4_4_ = uVar5;
            auVar62._0_4_ = uVar5;
            auVar62._8_4_ = uVar5;
            auVar62._12_4_ = uVar5;
            auVar62._16_4_ = uVar5;
            auVar62._20_4_ = uVar5;
            auVar62._24_4_ = uVar5;
            auVar62._28_4_ = uVar5;
            auVar200 = vfmadd231ps_avx512vl(auVar217._0_32_,auVar200,auVar62);
            auVar217 = ZEXT3264(auVar200);
            auVar199 = vlddqu_avx(pauVar150[1]);
            auVar202 = vcvtph2ps_avx512vl(auVar199._0_16_);
            uVar5 = *(undefined4 *)(*pauVar139 + 8);
            auVar63._4_4_ = uVar5;
            auVar63._0_4_ = uVar5;
            auVar63._8_4_ = uVar5;
            auVar63._12_4_ = uVar5;
            auVar63._16_4_ = uVar5;
            auVar63._20_4_ = uVar5;
            auVar63._24_4_ = uVar5;
            auVar63._28_4_ = uVar5;
            auVar202 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar202,auVar63);
            in_ZMM18 = ZEXT3264(auVar202);
            auVar199 = vcvtph2ps_f16c(auVar199._16_16_);
            uVar5 = *(undefined4 *)(*pauVar139 + 0xc);
            auVar64._4_4_ = uVar5;
            auVar64._0_4_ = uVar5;
            auVar64._8_4_ = uVar5;
            auVar64._12_4_ = uVar5;
            auVar64._16_4_ = uVar5;
            auVar64._20_4_ = uVar5;
            auVar64._24_4_ = uVar5;
            auVar64._28_4_ = uVar5;
            auVar199 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar199,auVar64);
            in_ZMM17 = ZEXT3264(auVar199);
            pauVar139 = (undefined1 (*) [32])(*pauVar139 + 0x10);
            pauVar150 = pauVar150 + 2;
            uVar156 = uVar142 + 7;
            uVar142 = uVar142 + 4;
          }
          if (uVar146 - uVar142 != 0 && (int)uVar142 <= (int)uVar146) {
            lVar157 = 0;
            do {
              auVar164 = vlddqu_avx(*(undefined1 (*) [16])*pauVar150);
              auVar199 = vcvtph2ps_f16c(auVar164);
              uVar5 = *(undefined4 *)(*pauVar139 + lVar157 * 4);
              auVar65._4_4_ = uVar5;
              auVar65._0_4_ = uVar5;
              auVar65._8_4_ = uVar5;
              auVar65._12_4_ = uVar5;
              auVar65._16_4_ = uVar5;
              auVar65._20_4_ = uVar5;
              auVar65._24_4_ = uVar5;
              auVar65._28_4_ = uVar5;
              auVar199 = vfmadd231ps_avx512vl(auVar216._0_32_,auVar199,auVar65);
              auVar216 = ZEXT3264(auVar199);
              pauVar150 = (undefined1 (*) [32])(*pauVar150 + 0x10);
              lVar157 = lVar157 + 1;
            } while (uVar146 - uVar142 != (int)lVar157);
          }
          auVar201 = vaddps_avx512vl(in_ZMM23._0_32_,auVar201);
          auVar202 = vaddps_avx512vl(in_ZMM19._0_32_,in_ZMM20._0_32_);
          auVar202 = vaddps_avx512vl(auVar201,auVar202);
          auVar201 = vaddps_avx512vl(in_ZMM17._0_32_,in_ZMM18._0_32_);
          in_ZMM16 = ZEXT3264(auVar201);
          auVar200 = vaddps_avx512vl(auVar201,auVar200);
          auVar201._0_4_ = auVar200._0_4_ + auVar202._0_4_ + auVar199._0_4_;
          auVar201._4_4_ = auVar200._4_4_ + auVar202._4_4_ + auVar199._4_4_;
          auVar201._8_4_ = auVar200._8_4_ + auVar202._8_4_ + auVar199._8_4_;
          auVar201._12_4_ = auVar200._12_4_ + auVar202._12_4_ + auVar199._12_4_;
          auVar201._16_4_ = auVar200._16_4_ + auVar202._16_4_ + auVar199._16_4_;
          auVar201._20_4_ = auVar200._20_4_ + auVar202._20_4_ + auVar199._20_4_;
          auVar201._24_4_ = auVar200._24_4_ + auVar202._24_4_ + auVar199._24_4_;
          auVar201._28_4_ = auVar200._28_4_ + auVar202._28_4_ + auVar199._28_4_;
          if (iVar141 - 1U < 6) {
            auVar200 = ZEXT1632(ZEXT816(0) << 0x40);
            switch(iVar141) {
            case 1:
              auVar201 = vmaxps_avx(auVar201,ZEXT1632(ZEXT816(0) << 0x40));
              break;
            case 2:
              auVar199 = vmaxps_avx(auVar201,auVar200);
              auVar201 = vminps_avx(auVar201,auVar200);
              uVar5 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
              auVar78._4_4_ = uVar5;
              auVar78._0_4_ = uVar5;
              auVar78._8_4_ = uVar5;
              auVar78._12_4_ = uVar5;
              auVar78._16_4_ = uVar5;
              auVar78._20_4_ = uVar5;
              auVar78._24_4_ = uVar5;
              auVar78._28_4_ = uVar5;
              auVar201 = vfmadd132ps_avx512vl(auVar201,auVar199,auVar78);
              break;
            case 3:
              uVar5 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
              auVar76._4_4_ = uVar5;
              auVar76._0_4_ = uVar5;
              auVar76._8_4_ = uVar5;
              auVar76._12_4_ = uVar5;
              auVar76._16_4_ = uVar5;
              auVar76._20_4_ = uVar5;
              auVar76._24_4_ = uVar5;
              auVar76._28_4_ = uVar5;
              auVar201 = vmaxps_avx512vl(auVar201,auVar76);
              uVar5 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
              auVar77._4_4_ = uVar5;
              auVar77._0_4_ = uVar5;
              auVar77._8_4_ = uVar5;
              auVar77._12_4_ = uVar5;
              auVar77._16_4_ = uVar5;
              auVar77._20_4_ = uVar5;
              auVar77._24_4_ = uVar5;
              auVar77._28_4_ = uVar5;
              auVar201 = vminps_avx512vl(auVar201,auVar77);
              break;
            case 4:
              auVar74._8_4_ = 0x80000000;
              auVar74._0_8_ = 0x8000000080000000;
              auVar74._12_4_ = 0x80000000;
              auVar74._16_4_ = 0x80000000;
              auVar74._20_4_ = 0x80000000;
              auVar74._24_4_ = 0x80000000;
              auVar74._28_4_ = 0x80000000;
              auVar201 = vxorps_avx512vl(auVar201,auVar74);
              auVar201 = vminps_avx512vl(auVar201,auVar190);
              auVar201 = vmaxps_avx(auVar201,auVar260);
              auVar164 = vfmadd231ps_fma(auVar281,auVar201,auVar290);
              auVar200 = vroundps_avx(ZEXT1632(auVar164),1);
              uVar140 = vcmpps_avx512vl(ZEXT1632(auVar164),auVar200,1);
              auVar199 = vsubps_avx512vl(auVar200,auVar295);
              bVar11 = (bool)((byte)uVar140 & 1);
              auVar209._0_4_ =
                   (float)((uint)bVar11 * auVar199._0_4_ | (uint)!bVar11 * auVar200._0_4_);
              bVar11 = (bool)((byte)(uVar140 >> 1) & 1);
              auVar209._4_4_ =
                   (float)((uint)bVar11 * auVar199._4_4_ | (uint)!bVar11 * auVar200._4_4_);
              bVar11 = (bool)((byte)(uVar140 >> 2) & 1);
              auVar209._8_4_ =
                   (float)((uint)bVar11 * auVar199._8_4_ | (uint)!bVar11 * auVar200._8_4_);
              bVar11 = (bool)((byte)(uVar140 >> 3) & 1);
              auVar209._12_4_ =
                   (float)((uint)bVar11 * auVar199._12_4_ | (uint)!bVar11 * auVar200._12_4_);
              bVar11 = (bool)((byte)(uVar140 >> 4) & 1);
              auVar209._16_4_ =
                   (float)((uint)bVar11 * auVar199._16_4_ | (uint)!bVar11 * auVar200._16_4_);
              bVar11 = (bool)((byte)(uVar140 >> 5) & 1);
              auVar209._20_4_ =
                   (float)((uint)bVar11 * auVar199._20_4_ | (uint)!bVar11 * auVar200._20_4_);
              bVar11 = (bool)((byte)(uVar140 >> 6) & 1);
              auVar209._24_4_ =
                   (float)((uint)bVar11 * auVar199._24_4_ | (uint)!bVar11 * auVar200._24_4_);
              bVar11 = SUB81(uVar140 >> 7,0);
              auVar209._28_4_ =
                   (float)((uint)bVar11 * auVar199._28_4_ | (uint)!bVar11 * auVar200._28_4_);
              auVar164 = vfmsub231ps_fma(auVar201,auVar209,auVar300);
              auVar75._8_4_ = 0x395e8083;
              auVar75._0_8_ = 0x395e8083395e8083;
              auVar75._12_4_ = 0x395e8083;
              auVar75._16_4_ = 0x395e8083;
              auVar75._20_4_ = 0x395e8083;
              auVar75._24_4_ = 0x395e8083;
              auVar75._28_4_ = 0x395e8083;
              auVar201 = vfmsub231ps_avx512vl(ZEXT1632(auVar164),auVar209,auVar75);
              auVar255._0_4_ = auVar201._0_4_ * auVar201._0_4_;
              auVar255._4_4_ = auVar201._4_4_ * auVar201._4_4_;
              auVar255._8_4_ = auVar201._8_4_ * auVar201._8_4_;
              auVar255._12_4_ = auVar201._12_4_ * auVar201._12_4_;
              auVar255._16_4_ = auVar201._16_4_ * auVar201._16_4_;
              auVar255._20_4_ = auVar201._20_4_ * auVar201._20_4_;
              auVar255._24_4_ = auVar201._24_4_ * auVar201._24_4_;
              auVar255._28_4_ = 0;
              auVar200 = vfmadd213ps_avx512vl(auVar309,auVar201,auVar313);
              auVar200 = vfmadd213ps_avx512vl(auVar200,auVar201,auVar317);
              auVar200 = vfmadd213ps_avx512vl(auVar200,auVar201,auVar321);
              auVar200 = vfmadd213ps_avx512vl(auVar200,auVar201,auVar326);
              auVar200 = vfmadd213ps_avx512vl(auVar200,auVar201,auVar281);
              auVar201 = vfmadd213ps_avx512vl(auVar200,auVar255,auVar201);
              in_ZMM16 = ZEXT3264(auVar201);
              auVar200 = vaddps_avx512vl(auVar201,auVar295);
              auVar240._0_4_ = (int)auVar209._0_4_;
              auVar240._4_4_ = (int)auVar209._4_4_;
              auVar240._8_4_ = (int)auVar209._8_4_;
              auVar240._12_4_ = (int)auVar209._12_4_;
              auVar240._16_4_ = (int)auVar209._16_4_;
              auVar240._20_4_ = (int)auVar209._20_4_;
              auVar240._24_4_ = (int)auVar209._24_4_;
              auVar240._28_4_ = (int)auVar209._28_4_;
              auVar201 = vpslld_avx2(auVar240,0x17);
              auVar201 = vpaddd_avx2(auVar329,auVar201);
              auVar164 = vfmadd213ps_fma(auVar201,auVar200,auVar295);
              auVar201 = vrcpps_avx(ZEXT1632(auVar164));
              auVar164 = vfmsub213ps_fma(ZEXT1632(auVar164),auVar201,auVar295);
              auVar164 = vfnmadd132ps_fma(ZEXT1632(auVar164),auVar201,auVar201);
              auVar201 = ZEXT1632(auVar164);
              break;
            case 5:
              auVar199 = vminps_avx512vl(auVar201,auVar190);
              auVar199 = vmaxps_avx(auVar199,auVar260);
              auVar164 = vfmadd213ps_fma(auVar290,auVar199,auVar281);
              auVar202 = vrndscaleps_avx512vl(ZEXT1632(auVar164),1);
              uVar140 = vcmpps_avx512vl(ZEXT1632(auVar164),auVar202,1);
              auVar203 = vsubps_avx512vl(auVar202,auVar295);
              bVar11 = (bool)((byte)uVar140 & 1);
              auVar204._0_4_ = (uint)bVar11 * auVar203._0_4_ | (uint)!bVar11 * auVar202._0_4_;
              bVar11 = (bool)((byte)(uVar140 >> 1) & 1);
              auVar204._4_4_ = (uint)bVar11 * auVar203._4_4_ | (uint)!bVar11 * auVar202._4_4_;
              bVar11 = (bool)((byte)(uVar140 >> 2) & 1);
              auVar204._8_4_ = (uint)bVar11 * auVar203._8_4_ | (uint)!bVar11 * auVar202._8_4_;
              bVar11 = (bool)((byte)(uVar140 >> 3) & 1);
              auVar204._12_4_ = (uint)bVar11 * auVar203._12_4_ | (uint)!bVar11 * auVar202._12_4_;
              bVar11 = (bool)((byte)(uVar140 >> 4) & 1);
              auVar204._16_4_ = (uint)bVar11 * auVar203._16_4_ | (uint)!bVar11 * auVar202._16_4_;
              bVar11 = (bool)((byte)(uVar140 >> 5) & 1);
              auVar204._20_4_ = (uint)bVar11 * auVar203._20_4_ | (uint)!bVar11 * auVar202._20_4_;
              bVar11 = (bool)((byte)(uVar140 >> 6) & 1);
              auVar204._24_4_ = (uint)bVar11 * auVar203._24_4_ | (uint)!bVar11 * auVar202._24_4_;
              bVar11 = SUB81(uVar140 >> 7,0);
              auVar204._28_4_ = (uint)bVar11 * auVar203._28_4_ | (uint)!bVar11 * auVar202._28_4_;
              auVar199 = vfmsub231ps_avx512vl(auVar199,auVar204,auVar300);
              auVar199 = vfnmsub231ps_avx512vl(auVar199,auVar204,auVar333);
              auVar304._0_4_ = auVar199._0_4_ * auVar199._0_4_;
              auVar304._4_4_ = auVar199._4_4_ * auVar199._4_4_;
              auVar304._8_4_ = auVar199._8_4_ * auVar199._8_4_;
              auVar304._12_4_ = auVar199._12_4_ * auVar199._12_4_;
              auVar304._16_4_ = auVar199._16_4_ * auVar199._16_4_;
              auVar304._20_4_ = auVar199._20_4_ * auVar199._20_4_;
              auVar304._24_4_ = auVar199._24_4_ * auVar199._24_4_;
              auVar304._28_4_ = 0;
              auVar202 = vfmadd213ps_avx512vl(auVar309,auVar199,auVar313);
              auVar202 = vfmadd213ps_avx512vl(auVar202,auVar199,auVar317);
              auVar202 = vfmadd213ps_avx512vl(auVar202,auVar199,auVar321);
              auVar202 = vfmadd213ps_avx512vl(auVar202,auVar199,auVar326);
              auVar202 = vfmadd213ps_avx512vl(auVar202,auVar199,auVar281);
              auVar199 = vfmadd213ps_avx512vl(auVar202,auVar304,auVar199);
              auVar202 = vaddps_avx512vl(auVar199,auVar295);
              auVar199 = vcvttps2dq_avx512vl(auVar204);
              auVar199 = vpslld_avx2(auVar199,0x17);
              auVar199 = vpaddd_avx2(auVar199,auVar329);
              auVar164 = vfmadd213ps_fma(auVar199,auVar202,auVar295);
              uVar140 = vcmpps_avx512vl(ZEXT1632(auVar164),auVar200,2);
              auVar67._8_4_ = 0x800000;
              auVar67._0_8_ = 0x80000000800000;
              auVar67._12_4_ = 0x800000;
              auVar67._16_4_ = 0x800000;
              auVar67._20_4_ = 0x800000;
              auVar67._24_4_ = 0x800000;
              auVar67._28_4_ = 0x800000;
              auVar200 = vmaxps_avx512vl(ZEXT1632(auVar164),auVar67);
              auVar203 = vpsrld_avx2(auVar200,0x17);
              auVar199 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
              auVar68._8_4_ = 0x3f000000;
              auVar68._0_8_ = 0x3f0000003f000000;
              auVar68._12_4_ = 0x3f000000;
              auVar68._16_4_ = 0x3f000000;
              auVar68._20_4_ = 0x3f000000;
              auVar68._24_4_ = 0x3f000000;
              auVar68._28_4_ = 0x3f000000;
              auVar200 = vpternlogd_avx512vl(auVar200,auVar199,auVar68,0xea);
              auVar69._8_4_ = 0x3f3504f3;
              auVar69._0_8_ = 0x3f3504f33f3504f3;
              auVar69._12_4_ = 0x3f3504f3;
              auVar69._16_4_ = 0x3f3504f3;
              auVar69._20_4_ = 0x3f3504f3;
              auVar69._24_4_ = 0x3f3504f3;
              auVar69._28_4_ = 0x3f3504f3;
              uVar14 = vcmpps_avx512vl(auVar200,auVar69,1);
              auVar199 = vaddps_avx512vl(auVar200,auVar191);
              auVar200 = vaddps_avx512vl(auVar199,auVar200);
              bVar11 = (bool)((byte)uVar14 & 1);
              auVar205._0_4_ = (uint)bVar11 * auVar200._0_4_ | (uint)!bVar11 * auVar199._0_4_;
              bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
              auVar205._4_4_ = (uint)bVar11 * auVar200._4_4_ | (uint)!bVar11 * auVar199._4_4_;
              bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
              auVar205._8_4_ = (uint)bVar11 * auVar200._8_4_ | (uint)!bVar11 * auVar199._8_4_;
              bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
              auVar205._12_4_ = (uint)bVar11 * auVar200._12_4_ | (uint)!bVar11 * auVar199._12_4_;
              bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
              auVar205._16_4_ = (uint)bVar11 * auVar200._16_4_ | (uint)!bVar11 * auVar199._16_4_;
              bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
              auVar205._20_4_ = (uint)bVar11 * auVar200._20_4_ | (uint)!bVar11 * auVar199._20_4_;
              bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
              auVar205._24_4_ = (uint)bVar11 * auVar200._24_4_ | (uint)!bVar11 * auVar199._24_4_;
              bVar11 = SUB81(uVar14 >> 7,0);
              auVar205._28_4_ = (uint)bVar11 * auVar200._28_4_ | (uint)!bVar11 * auVar199._28_4_;
              auVar199 = vmulps_avx512vl(auVar205,auVar205);
              auVar70._8_4_ = 0xbdebd1b8;
              auVar70._0_8_ = 0xbdebd1b8bdebd1b8;
              auVar70._12_4_ = 0xbdebd1b8;
              auVar70._16_4_ = 0xbdebd1b8;
              auVar70._20_4_ = 0xbdebd1b8;
              auVar70._24_4_ = 0xbdebd1b8;
              auVar70._28_4_ = 0xbdebd1b8;
              auVar200 = vfmadd213ps_avx512vl(auVar192,auVar205,auVar70);
              auVar71._8_4_ = 0x3def251a;
              auVar71._0_8_ = 0x3def251a3def251a;
              auVar71._12_4_ = 0x3def251a;
              auVar71._16_4_ = 0x3def251a;
              auVar71._20_4_ = 0x3def251a;
              auVar71._24_4_ = 0x3def251a;
              auVar71._28_4_ = 0x3def251a;
              auVar200 = vfmadd213ps_avx512vl(auVar200,auVar205,auVar71);
              auVar72._8_4_ = 0xbdfe5d4f;
              auVar72._0_8_ = 0xbdfe5d4fbdfe5d4f;
              auVar72._12_4_ = 0xbdfe5d4f;
              auVar72._16_4_ = 0xbdfe5d4f;
              auVar72._20_4_ = 0xbdfe5d4f;
              auVar72._24_4_ = 0xbdfe5d4f;
              auVar72._28_4_ = 0xbdfe5d4f;
              auVar200 = vfmadd213ps_avx512vl(auVar200,auVar205,auVar72);
              auVar200 = vfmadd213ps_avx512vl(auVar200,auVar205,auVar193);
              auVar200 = vfmadd213ps_avx512vl(auVar200,auVar205,auVar194);
              auVar200 = vfmadd213ps_avx512vl(auVar200,auVar205,auVar195);
              auVar200 = vfmadd213ps_avx512vl(auVar200,auVar205,auVar196);
              auVar200 = vfmadd213ps_avx512vl(auVar200,auVar205,auVar197);
              auVar202 = vmulps_avx512vl(auVar199,auVar205);
              in_ZMM18 = ZEXT3264(auVar202);
              auVar202 = vmulps_avx512vl(auVar202,auVar200);
              auVar73._8_4_ = 0xffffff82;
              auVar73._0_8_ = 0xffffff82ffffff82;
              auVar73._12_4_ = 0xffffff82;
              auVar73._16_4_ = 0xffffff82;
              auVar73._20_4_ = 0xffffff82;
              auVar73._24_4_ = 0xffffff82;
              auVar73._28_4_ = 0xffffff82;
              auVar200 = vpaddd_avx512vl(auVar203,auVar73);
              auVar200 = vcvtdq2ps_avx(auVar200);
              auVar203 = vsubps_avx512vl(auVar200,auVar295);
              bVar11 = (bool)((byte)uVar14 & 1);
              auVar206._0_4_ = (uint)bVar11 * auVar203._0_4_ | (uint)!bVar11 * auVar200._0_4_;
              bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
              auVar206._4_4_ = (uint)bVar11 * auVar203._4_4_ | (uint)!bVar11 * auVar200._4_4_;
              bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
              auVar206._8_4_ = (uint)bVar11 * auVar203._8_4_ | (uint)!bVar11 * auVar200._8_4_;
              bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
              auVar206._12_4_ = (uint)bVar11 * auVar203._12_4_ | (uint)!bVar11 * auVar200._12_4_;
              bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
              auVar206._16_4_ = (uint)bVar11 * auVar203._16_4_ | (uint)!bVar11 * auVar200._16_4_;
              bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
              auVar206._20_4_ = (uint)bVar11 * auVar203._20_4_ | (uint)!bVar11 * auVar200._20_4_;
              bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
              auVar206._24_4_ = (uint)bVar11 * auVar203._24_4_ | (uint)!bVar11 * auVar200._24_4_;
              bVar11 = SUB81(uVar14 >> 7,0);
              auVar206._28_4_ = (uint)bVar11 * auVar203._28_4_ | (uint)!bVar11 * auVar200._28_4_;
              auVar200 = vfmadd231ps_avx512vl(auVar202,auVar206,auVar333);
              auVar200 = vfmsub231ps_avx512vl(auVar200,auVar281,auVar199);
              auVar200 = vsubps_avx512vl(auVar200,auVar205);
              auVar164 = vfmsub231ps_fma(auVar200,auVar300,auVar206);
              auVar200 = vmulps_avx512vl(ZEXT1632(auVar164),auVar198);
              auVar199 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              bVar11 = (bool)((byte)uVar140 & 1);
              auVar207._0_4_ = (uint)bVar11 * auVar199._0_4_ | (uint)!bVar11 * auVar200._0_4_;
              bVar11 = (bool)((byte)(uVar140 >> 1) & 1);
              auVar207._4_4_ = (uint)bVar11 * auVar199._4_4_ | (uint)!bVar11 * auVar200._4_4_;
              bVar11 = (bool)((byte)(uVar140 >> 2) & 1);
              auVar207._8_4_ = (uint)bVar11 * auVar199._8_4_ | (uint)!bVar11 * auVar200._8_4_;
              bVar11 = (bool)((byte)(uVar140 >> 3) & 1);
              auVar207._12_4_ = (uint)bVar11 * auVar199._12_4_ | (uint)!bVar11 * auVar200._12_4_;
              bVar11 = (bool)((byte)(uVar140 >> 4) & 1);
              auVar207._16_4_ = (uint)bVar11 * auVar199._16_4_ | (uint)!bVar11 * auVar200._16_4_;
              bVar11 = (bool)((byte)(uVar140 >> 5) & 1);
              auVar207._20_4_ = (uint)bVar11 * auVar199._20_4_ | (uint)!bVar11 * auVar200._20_4_;
              bVar11 = (bool)((byte)(uVar140 >> 6) & 1);
              auVar207._24_4_ = (uint)bVar11 * auVar199._24_4_ | (uint)!bVar11 * auVar200._24_4_;
              bVar11 = SUB81(uVar140 >> 7,0);
              auVar207._28_4_ = (uint)bVar11 * auVar199._28_4_ | (uint)!bVar11 * auVar200._28_4_;
              auVar200 = vminps_avx512vl(auVar207,auVar190);
              auVar200 = vmaxps_avx(auVar200,auVar260);
              auVar164 = vfmadd213ps_fma(auVar290,auVar200,auVar281);
              auVar199 = vrndscaleps_avx512vl(ZEXT1632(auVar164),1);
              uVar140 = vcmpps_avx512vl(ZEXT1632(auVar164),auVar199,1);
              auVar202 = vsubps_avx512vl(auVar199,auVar295);
              bVar11 = (bool)((byte)uVar140 & 1);
              auVar208._0_4_ = (uint)bVar11 * auVar202._0_4_ | (uint)!bVar11 * auVar199._0_4_;
              bVar11 = (bool)((byte)(uVar140 >> 1) & 1);
              auVar208._4_4_ = (uint)bVar11 * auVar202._4_4_ | (uint)!bVar11 * auVar199._4_4_;
              bVar11 = (bool)((byte)(uVar140 >> 2) & 1);
              auVar208._8_4_ = (uint)bVar11 * auVar202._8_4_ | (uint)!bVar11 * auVar199._8_4_;
              bVar11 = (bool)((byte)(uVar140 >> 3) & 1);
              auVar208._12_4_ = (uint)bVar11 * auVar202._12_4_ | (uint)!bVar11 * auVar199._12_4_;
              bVar11 = (bool)((byte)(uVar140 >> 4) & 1);
              auVar208._16_4_ = (uint)bVar11 * auVar202._16_4_ | (uint)!bVar11 * auVar199._16_4_;
              bVar11 = (bool)((byte)(uVar140 >> 5) & 1);
              auVar208._20_4_ = (uint)bVar11 * auVar202._20_4_ | (uint)!bVar11 * auVar199._20_4_;
              bVar11 = (bool)((byte)(uVar140 >> 6) & 1);
              auVar208._24_4_ = (uint)bVar11 * auVar202._24_4_ | (uint)!bVar11 * auVar199._24_4_;
              bVar11 = SUB81(uVar140 >> 7,0);
              auVar208._28_4_ = (uint)bVar11 * auVar202._28_4_ | (uint)!bVar11 * auVar199._28_4_;
              in_ZMM16 = ZEXT3264(auVar208);
              auVar200 = vfmsub231ps_avx512vl(auVar200,auVar208,auVar300);
              auVar200 = vfnmsub231ps_avx512vl(auVar200,auVar208,auVar333);
              auVar305._0_4_ = auVar200._0_4_ * auVar200._0_4_;
              auVar305._4_4_ = auVar200._4_4_ * auVar200._4_4_;
              auVar305._8_4_ = auVar200._8_4_ * auVar200._8_4_;
              auVar305._12_4_ = auVar200._12_4_ * auVar200._12_4_;
              auVar305._16_4_ = auVar200._16_4_ * auVar200._16_4_;
              auVar305._20_4_ = auVar200._20_4_ * auVar200._20_4_;
              auVar305._24_4_ = auVar200._24_4_ * auVar200._24_4_;
              auVar305._28_4_ = 0;
              auVar199 = vfmadd213ps_avx512vl(auVar309,auVar200,auVar313);
              auVar199 = vfmadd213ps_avx512vl(auVar199,auVar200,auVar317);
              auVar199 = vfmadd213ps_avx512vl(auVar199,auVar200,auVar321);
              auVar199 = vfmadd213ps_avx512vl(auVar199,auVar200,auVar326);
              auVar199 = vfmadd213ps_avx512vl(auVar199,auVar200,auVar281);
              auVar200 = vfmadd213ps_avx512vl(auVar199,auVar305,auVar200);
              in_ZMM17 = ZEXT3264(auVar200);
              auVar199 = vaddps_avx512vl(auVar200,auVar295);
              auVar200 = vcvttps2dq_avx512vl(auVar208);
              auVar200 = vpslld_avx2(auVar200,0x17);
              auVar200 = vpaddd_avx2(auVar200,auVar329);
              auVar164 = vfmadd213ps_fma(auVar200,auVar199,auVar295);
              auVar200 = vrcpps_avx(ZEXT1632(auVar164));
              auVar164 = vfmsub213ps_fma(ZEXT1632(auVar164),auVar200,auVar295);
              auVar164 = vfnmadd132ps_fma(ZEXT1632(auVar164),auVar200,auVar200);
              auVar200 = vfnmadd213ps_avx512vl(ZEXT1632(auVar164),auVar198,auVar191);
              auVar201._4_4_ = auVar200._4_4_ * auVar201._4_4_;
              auVar201._0_4_ = auVar200._0_4_ * auVar201._0_4_;
              auVar201._8_4_ = auVar200._8_4_ * auVar201._8_4_;
              auVar201._12_4_ = auVar200._12_4_ * auVar201._12_4_;
              auVar201._16_4_ = auVar200._16_4_ * auVar201._16_4_;
              auVar201._20_4_ = auVar200._20_4_ * auVar201._20_4_;
              auVar201._24_4_ = auVar200._24_4_ * auVar201._24_4_;
              break;
            case 6:
              uVar5 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
              auVar256._4_4_ = uVar5;
              auVar256._0_4_ = uVar5;
              auVar256._8_4_ = uVar5;
              auVar256._12_4_ = uVar5;
              auVar256._16_4_ = uVar5;
              auVar256._20_4_ = uVar5;
              auVar256._24_4_ = uVar5;
              auVar256._28_4_ = uVar5;
              uVar5 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
              auVar66._4_4_ = uVar5;
              auVar66._0_4_ = uVar5;
              auVar66._8_4_ = uVar5;
              auVar66._12_4_ = uVar5;
              auVar66._16_4_ = uVar5;
              auVar66._20_4_ = uVar5;
              auVar66._24_4_ = uVar5;
              auVar66._28_4_ = uVar5;
              auVar199 = vfmadd213ps_avx512vl(auVar256,auVar201,auVar66);
              auVar200 = vmaxps_avx(auVar199,auVar200);
              auVar200 = vminps_avx(auVar200,auVar295);
              auVar201._4_4_ = auVar200._4_4_ * auVar201._4_4_;
              auVar201._0_4_ = auVar200._0_4_ * auVar201._0_4_;
              auVar201._8_4_ = auVar200._8_4_ * auVar201._8_4_;
              auVar201._12_4_ = auVar200._12_4_ * auVar201._12_4_;
              auVar201._16_4_ = auVar200._16_4_ * auVar201._16_4_;
              auVar201._20_4_ = auVar200._20_4_ * auVar201._20_4_;
              auVar201._24_4_ = auVar200._24_4_ * auVar201._24_4_;
            }
          }
          *(undefined1 (*) [32])((long)top_blob->data + lVar147 * 0x20) = auVar201;
          lVar147 = lVar147 + 1;
        } while (lVar147 != iVar137);
      }
    }
    if (uVar161 == 1) {
      p_Var6 = this->_vptr_InnerProduct_x86_avx512[-3];
      local_368 = (ulong)*(uint *)(&this->field_0xe0 + (long)p_Var6);
      uVar146 = local_3c0 * iStack_3ac;
      local_370 = (ulong)top_blob->w;
      lVar8 = *(long *)(&this->field_0x178 + (long)p_Var6);
      uVar161 = top_blob->w >> 3;
      if (0 < (int)uVar161) {
        local_34c = uVar146 & 0xfffffff8;
        local_220 = (ulong)uVar161;
        lVar147 = 1;
        lVar157 = 2;
        lVar148 = 3;
        lVar149 = 4;
        lVar151 = 5;
        lVar162 = 6;
        lVar154 = 7;
        lVar160 = 0;
        uVar140 = 0;
        do {
          local_2f0 = uVar140 * 8;
          auVar216 = ZEXT1664(ZEXT816(0) << 0x40);
          if (lVar8 != 0) {
            auVar216 = ZEXT3264(*(undefined1 (*) [32])(lVar8 + uVar140 * 0x20));
          }
          auVar190 = auVar216._0_32_;
          lVar138 = (long)(this->weight_data_tm).w;
          pvVar9 = (this->weight_data_tm).data;
          sVar10 = (this->weight_data_tm).elemsize;
          pauVar139 = local_3d8;
          if ((int)uVar146 < 8) {
            lVar138 = sVar10 * lVar138;
            lVar135 = lVar138 * local_2f0;
            lVar136 = (local_2f0 | 1) * lVar138;
            lVar158 = (local_2f0 | 2) * lVar138;
            local_358 = (local_2f0 | 3) * lVar138;
            local_360 = (local_2f0 | 4) * lVar138;
            lVar152 = (local_2f0 | 5) * lVar138;
            lVar159 = (local_2f0 | 6) * lVar138;
            lVar138 = (local_2f0 | 7) * lVar138;
            uVar161 = 0;
            local_118 = SUB6432(ZEXT864(0),0);
            local_178 = SUB6432(ZEXT864(0),0);
            local_138 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            local_158 = SUB6432(ZEXT864(0),0);
            local_d8 = SUB6432(ZEXT864(0),0);
            local_f8 = SUB6432(ZEXT864(0),0);
            local_b8 = SUB6432(ZEXT864(0),0);
            local_98 = SUB6432(ZEXT864(0),0);
          }
          else {
            lVar135 = sVar10 * lVar160 * lVar138;
            lVar136 = sVar10 * lVar147 * lVar138;
            lVar158 = sVar10 * lVar157 * lVar138;
            local_358 = sVar10 * lVar148 * lVar138;
            local_360 = sVar10 * lVar149 * lVar138;
            lVar152 = sVar10 * lVar151 * lVar138;
            lVar159 = sVar10 * lVar162 * lVar138;
            lVar138 = sVar10 * lVar154 * lVar138;
            local_2a8._0_8_ = pvVar9;
            local_388._0_8_ = lVar138;
            auVar219 = ZEXT864(0);
            auVar220 = ZEXT864(0);
            auVar222 = ZEXT864(0);
            auVar221 = ZEXT864(0);
            auVar217 = ZEXT864(0);
            auVar335 = ZEXT1664((undefined1  [16])0x0);
            auVar218 = ZEXT864(0);
            auVar338 = ZEXT864(0);
            iVar137 = 7;
            lVar144 = 0;
            do {
              auVar191 = *(undefined1 (*) [32])(*local_3d8 + lVar144 * 2);
              auVar164 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar144 + lVar135));
              auVar192 = vcvtph2ps_f16c(auVar164);
              auVar164 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar144 + lVar136));
              auVar193 = vcvtph2ps_f16c(auVar164);
              auVar164 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar144 + lVar158));
              auVar194 = vcvtph2ps_f16c(auVar164);
              auVar164 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar144 + local_358));
              auVar195 = vcvtph2ps_f16c(auVar164);
              auVar164 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar144 + local_360));
              auVar196 = vcvtph2ps_f16c(auVar164);
              auVar164 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar144 + lVar152));
              auVar197 = vcvtph2ps_f16c(auVar164);
              auVar164 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar144 + lVar159));
              auVar198 = vcvtph2ps_f16c(auVar164);
              auVar164 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar9 + lVar144 + lVar138));
              auVar260 = vcvtph2ps_f16c(auVar164);
              auVar164 = vfmadd231ps_fma(auVar338._0_32_,auVar191,auVar192);
              auVar338 = ZEXT1664(auVar164);
              local_118 = ZEXT1632(auVar164);
              local_178 = vfmadd231ps_avx512vl(auVar218._0_32_,auVar191,auVar193);
              auVar218 = ZEXT3264(local_178);
              auVar164 = vfmadd231ps_fma(auVar335._0_32_,auVar191,auVar194);
              auVar335 = ZEXT1664(auVar164);
              local_138 = ZEXT1632(auVar164);
              auVar164 = vfmadd231ps_fma(auVar217._0_32_,auVar191,auVar195);
              auVar217 = ZEXT1664(auVar164);
              local_158 = ZEXT1632(auVar164);
              auVar164 = vfmadd231ps_fma(auVar221._0_32_,auVar191,auVar196);
              auVar221 = ZEXT1664(auVar164);
              local_d8 = ZEXT1632(auVar164);
              auVar164 = vfmadd231ps_fma(auVar222._0_32_,auVar191,auVar197);
              auVar222 = ZEXT1664(auVar164);
              local_f8 = ZEXT1632(auVar164);
              auVar164 = vfmadd231ps_fma(auVar220._0_32_,auVar191,auVar198);
              auVar220 = ZEXT1664(auVar164);
              local_b8 = ZEXT1632(auVar164);
              auVar164 = vfmadd231ps_fma(auVar219._0_32_,auVar191,auVar260);
              auVar219 = ZEXT1664(auVar164);
              local_98 = ZEXT1632(auVar164);
              pauVar139 = pauVar139 + 1;
              lVar144 = lVar144 + 0x10;
              iVar137 = iVar137 + 8;
            } while (iVar137 < (int)uVar146);
            lVar135 = lVar135 + lVar144;
            lVar136 = lVar136 + lVar144;
            lVar158 = lVar158 + lVar144;
            local_358 = local_358 + lVar144;
            local_360 = local_360 + lVar144;
            lVar152 = lVar152 + lVar144;
            lVar159 = lVar159 + lVar144;
            lVar138 = lVar138 + lVar144;
            uVar161 = local_34c;
          }
          local_358 = (long)pvVar9 + local_358;
          local_360 = (long)pvVar9 + local_360;
          local_328._0_8_ = (long)pvVar9 + lVar135;
          local_338._0_8_ = (long)pvVar9 + lVar136;
          local_348._0_8_ = (long)pvVar9 + lVar158;
          local_2e8 = lVar160;
          local_2e0 = lVar154;
          local_2d8 = lVar162;
          local_2d0 = lVar151;
          local_2c8 = lVar149;
          local_2c0 = lVar148;
          local_2b8 = lVar157;
          local_2b0 = lVar147;
          if ((int)uVar161 < (int)uVar146) {
            lVar147 = 0;
            do {
              local_2a8 = auVar216._0_32_;
              local_388 = ZEXT416(*(uint *)(*pauVar139 + lVar147 * 4));
              fVar263 = float16_to_float32(*(unsigned_short *)(local_328._0_8_ + lVar147 * 2));
              auVar190 = _local_218;
              local_218._4_4_ = extraout_XMM0_Db;
              local_218._0_4_ = fVar263;
              fStack_210 = (float)extraout_XMM0_Dc;
              _fStack_208 = auVar190._16_16_;
              fStack_20c = (float)extraout_XMM0_Dd;
              local_308 = ZEXT416(*(uint *)(*pauVar139 + lVar147 * 4));
              local_318 = float16_to_float32(*(unsigned_short *)(local_338._0_8_ + lVar147 * 2));
              local_238 = ZEXT416(*(uint *)(*pauVar139 + lVar147 * 4));
              local_248 = float16_to_float32(*(unsigned_short *)(local_348._0_8_ + lVar147 * 2));
              local_258 = ZEXT416(*(uint *)(*pauVar139 + lVar147 * 4));
              fVar263 = float16_to_float32(*(unsigned_short *)(local_358 + lVar147 * 2));
              local_268 = CONCAT44(extraout_XMM0_Db_00,fVar263);
              uVar142 = *(uint *)(*pauVar139 + lVar147 * 4);
              local_278 = float16_to_float32(*(unsigned_short *)(local_360 + lVar147 * 2));
              local_198._0_16_ = ZEXT416(*(uint *)(*pauVar139 + lVar147 * 4));
              uStack_274 = extraout_XMM0_Db_01;
              uStack_270 = extraout_XMM0_Dc_00;
              uStack_26c = extraout_XMM0_Dd_00;
              fVar263 = float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar147 * 2 + lVar152)
                                          );
              auVar190 = local_1b8;
              local_1b8._4_4_ = extraout_XMM0_Db_02;
              local_1b8._0_4_ = fVar263;
              local_1b8._8_4_ = extraout_XMM0_Dc_01;
              local_1b8._16_16_ = auVar190._16_16_;
              local_1b8._12_4_ = extraout_XMM0_Dd_01;
              local_1d8._0_16_ = ZEXT416(*(uint *)(*pauVar139 + lVar147 * 4));
              fVar263 = float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar147 * 2 + lVar159)
                                          );
              auVar190 = local_1f8;
              local_1f8._4_4_ = extraout_XMM0_Db_03;
              local_1f8._0_4_ = fVar263;
              local_1f8._8_4_ = extraout_XMM0_Dc_02;
              local_1f8._16_16_ = auVar190._16_16_;
              local_1f8._12_4_ = extraout_XMM0_Dd_02;
              local_288 = ZEXT416(*(uint *)(*pauVar139 + lVar147 * 4));
              auVar216._0_4_ =
                   float16_to_float32(*(unsigned_short *)((long)pvVar9 + lVar147 * 2 + lVar138));
              auVar216._4_60_ = extraout_var;
              auVar164._4_4_ = uStack_274;
              auVar164._0_4_ = local_278;
              auVar164._8_4_ = uStack_270;
              auVar164._12_4_ = uStack_26c;
              auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_1b8._0_4_),0x10);
              auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_1f8._0_4_),0x20);
              auVar164 = vinsertps_avx(auVar164,auVar216._0_16_,0x30);
              auVar166 = vinsertps_avx(_local_218,ZEXT416((uint)local_318),0x10);
              auVar166 = vinsertps_avx(auVar166,ZEXT416((uint)local_248),0x20);
              auVar166 = vinsertps_avx(auVar166,ZEXT416((uint)local_268),0x30);
              auVar190._16_16_ = auVar164;
              auVar190._0_16_ = auVar166;
              auVar164 = vinsertps_avx(ZEXT416(uVar142),ZEXT416((uint)local_198._0_4_),0x10);
              auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_1d8._0_4_),0x20);
              auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_288._0_4_),0x30);
              auVar166 = vinsertps_avx(local_388,ZEXT416((uint)local_308._0_4_),0x10);
              auVar166 = vinsertps_avx(auVar166,ZEXT416((uint)local_238._0_4_),0x20);
              auVar166 = vinsertps_avx(auVar166,ZEXT416((uint)local_258._0_4_),0x30);
              auVar191._16_16_ = auVar164;
              auVar191._0_16_ = auVar166;
              auVar164 = vfmadd231ps_fma(local_2a8,auVar190,auVar191);
              auVar216 = ZEXT1664(auVar164);
              auVar190 = ZEXT1632(auVar164);
              lVar147 = lVar147 + 1;
            } while (uVar146 - uVar161 != (int)lVar147);
          }
          auVar191 = vhaddps_avx(local_118,local_178);
          auVar192 = vhaddps_avx(local_138,local_158);
          auVar192 = vhaddps_avx(auVar191,auVar192);
          auVar191 = vhaddps_avx(local_d8,local_f8);
          auVar193 = vhaddps_avx(local_b8,local_98);
          auVar193 = vhaddps_avx(auVar191,auVar193);
          auVar191 = vblendps_avx(auVar192,auVar193,0xf0);
          auVar193 = vperm2f128_avx(auVar192,auVar193,0x21);
          auVar192._0_4_ = auVar190._0_4_ + auVar193._0_4_ + auVar191._0_4_;
          auVar192._4_4_ = auVar190._4_4_ + auVar193._4_4_ + auVar191._4_4_;
          auVar192._8_4_ = auVar190._8_4_ + auVar193._8_4_ + auVar191._8_4_;
          auVar192._12_4_ = auVar190._12_4_ + auVar193._12_4_ + auVar191._12_4_;
          auVar192._16_4_ = auVar190._16_4_ + auVar193._16_4_ + auVar191._16_4_;
          auVar192._20_4_ = auVar190._20_4_ + auVar193._20_4_ + auVar191._20_4_;
          auVar192._24_4_ = auVar190._24_4_ + auVar193._24_4_ + auVar191._24_4_;
          auVar192._28_4_ = auVar190._28_4_ + auVar193._28_4_ + auVar191._28_4_;
          switch((int)local_368) {
          case 1:
            auVar192 = vmaxps_avx(auVar192,_DAT_0056ae20);
            break;
          case 2:
            auVar190 = vmaxps_avx(auVar192,ZEXT832(0) << 0x20);
            auVar191 = vminps_avx(auVar192,ZEXT832(0) << 0x20);
            uVar5 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar101._4_4_ = uVar5;
            auVar101._0_4_ = uVar5;
            auVar101._8_4_ = uVar5;
            auVar101._12_4_ = uVar5;
            auVar101._16_4_ = uVar5;
            auVar101._20_4_ = uVar5;
            auVar101._24_4_ = uVar5;
            auVar101._28_4_ = uVar5;
            auVar192 = vfmadd132ps_avx512vl(auVar191,auVar190,auVar101);
            break;
          case 3:
            uVar5 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar99._4_4_ = uVar5;
            auVar99._0_4_ = uVar5;
            auVar99._8_4_ = uVar5;
            auVar99._12_4_ = uVar5;
            auVar99._16_4_ = uVar5;
            auVar99._20_4_ = uVar5;
            auVar99._24_4_ = uVar5;
            auVar99._28_4_ = uVar5;
            auVar190 = vmaxps_avx512vl(auVar192,auVar99);
            uVar5 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
            auVar100._4_4_ = uVar5;
            auVar100._0_4_ = uVar5;
            auVar100._8_4_ = uVar5;
            auVar100._12_4_ = uVar5;
            auVar100._16_4_ = uVar5;
            auVar100._20_4_ = uVar5;
            auVar100._24_4_ = uVar5;
            auVar100._28_4_ = uVar5;
            auVar192 = vminps_avx512vl(auVar190,auVar100);
            break;
          case 4:
            auVar88._8_4_ = 0x80000000;
            auVar88._0_8_ = 0x8000000080000000;
            auVar88._12_4_ = 0x80000000;
            auVar88._16_4_ = 0x80000000;
            auVar88._20_4_ = 0x80000000;
            auVar88._24_4_ = 0x80000000;
            auVar88._28_4_ = 0x80000000;
            auVar190 = vxorps_avx512vl(auVar192,auVar88);
            auVar89._8_4_ = 0x42b0c0a5;
            auVar89._0_8_ = 0x42b0c0a542b0c0a5;
            auVar89._12_4_ = 0x42b0c0a5;
            auVar89._16_4_ = 0x42b0c0a5;
            auVar89._20_4_ = 0x42b0c0a5;
            auVar89._24_4_ = 0x42b0c0a5;
            auVar89._28_4_ = 0x42b0c0a5;
            auVar190 = vminps_avx512vl(auVar190,auVar89);
            auVar90._8_4_ = 0xc2b0c0a5;
            auVar90._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar90._12_4_ = 0xc2b0c0a5;
            auVar90._16_4_ = 0xc2b0c0a5;
            auVar90._20_4_ = 0xc2b0c0a5;
            auVar90._24_4_ = 0xc2b0c0a5;
            auVar90._28_4_ = 0xc2b0c0a5;
            auVar191 = vmaxps_avx512vl(auVar190,auVar90);
            auVar283._8_4_ = 0x3f000000;
            auVar283._0_8_ = 0x3f0000003f000000;
            auVar283._12_4_ = 0x3f000000;
            auVar283._16_4_ = 0x3f000000;
            auVar283._20_4_ = 0x3f000000;
            auVar283._24_4_ = 0x3f000000;
            auVar283._28_4_ = 0x3f000000;
            auVar91._8_4_ = 0x3fb8aa3b;
            auVar91._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar91._12_4_ = 0x3fb8aa3b;
            auVar91._16_4_ = 0x3fb8aa3b;
            auVar91._20_4_ = 0x3fb8aa3b;
            auVar91._24_4_ = 0x3fb8aa3b;
            auVar91._28_4_ = 0x3fb8aa3b;
            auVar192 = vfmadd231ps_avx512vl(auVar283,auVar191,auVar91);
            auVar190 = vroundps_avx(auVar192,1);
            uVar14 = vcmpps_avx512vl(auVar192,auVar190,1);
            auVar292._8_4_ = 0x3f800000;
            auVar292._0_8_ = 0x3f8000003f800000;
            auVar292._12_4_ = 0x3f800000;
            auVar292._16_4_ = 0x3f800000;
            auVar292._20_4_ = 0x3f800000;
            auVar292._24_4_ = 0x3f800000;
            auVar292._28_4_ = 0x3f800000;
            auVar193 = vsubps_avx512vl(auVar190,auVar292);
            bVar11 = (bool)((byte)uVar14 & 1);
            auVar215._0_4_ = (float)((uint)bVar11 * auVar193._0_4_ | (uint)!bVar11 * auVar190._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar215._4_4_ = (float)((uint)bVar11 * auVar193._4_4_ | (uint)!bVar11 * auVar190._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar215._8_4_ = (float)((uint)bVar11 * auVar193._8_4_ | (uint)!bVar11 * auVar190._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar215._12_4_ =
                 (float)((uint)bVar11 * auVar193._12_4_ | (uint)!bVar11 * auVar190._12_4_);
            bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
            auVar215._16_4_ =
                 (float)((uint)bVar11 * auVar193._16_4_ | (uint)!bVar11 * auVar190._16_4_);
            bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
            auVar215._20_4_ =
                 (float)((uint)bVar11 * auVar193._20_4_ | (uint)!bVar11 * auVar190._20_4_);
            bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
            auVar215._24_4_ =
                 (float)((uint)bVar11 * auVar193._24_4_ | (uint)!bVar11 * auVar190._24_4_);
            bVar11 = SUB81(uVar14 >> 7,0);
            auVar215._28_4_ =
                 (float)((uint)bVar11 * auVar193._28_4_ | (uint)!bVar11 * auVar190._28_4_);
            auVar92._8_4_ = 0x3f318000;
            auVar92._0_8_ = 0x3f3180003f318000;
            auVar92._12_4_ = 0x3f318000;
            auVar92._16_4_ = 0x3f318000;
            auVar92._20_4_ = 0x3f318000;
            auVar92._24_4_ = 0x3f318000;
            auVar92._28_4_ = 0x3f318000;
            auVar190 = vfmsub231ps_avx512vl(auVar191,auVar215,auVar92);
            auVar93._8_4_ = 0x395e8083;
            auVar93._0_8_ = 0x395e8083395e8083;
            auVar93._12_4_ = 0x395e8083;
            auVar93._16_4_ = 0x395e8083;
            auVar93._20_4_ = 0x395e8083;
            auVar93._24_4_ = 0x395e8083;
            auVar93._28_4_ = 0x395e8083;
            auVar190 = vfmsub231ps_avx512vl(auVar190,auVar215,auVar93);
            auVar116._4_4_ = auVar190._4_4_ * auVar190._4_4_;
            auVar116._0_4_ = auVar190._0_4_ * auVar190._0_4_;
            auVar116._8_4_ = auVar190._8_4_ * auVar190._8_4_;
            auVar116._12_4_ = auVar190._12_4_ * auVar190._12_4_;
            auVar116._16_4_ = auVar190._16_4_ * auVar190._16_4_;
            auVar116._20_4_ = auVar190._20_4_ * auVar190._20_4_;
            auVar116._24_4_ = auVar190._24_4_ * auVar190._24_4_;
            auVar116._28_4_ = auVar192._28_4_;
            auVar276._8_4_ = 0x39506967;
            auVar276._0_8_ = 0x3950696739506967;
            auVar276._12_4_ = 0x39506967;
            auVar276._16_4_ = 0x39506967;
            auVar276._20_4_ = 0x39506967;
            auVar276._24_4_ = 0x39506967;
            auVar276._28_4_ = 0x39506967;
            auVar94._8_4_ = 0x3ab743ce;
            auVar94._0_8_ = 0x3ab743ce3ab743ce;
            auVar94._12_4_ = 0x3ab743ce;
            auVar94._16_4_ = 0x3ab743ce;
            auVar94._20_4_ = 0x3ab743ce;
            auVar94._24_4_ = 0x3ab743ce;
            auVar94._28_4_ = 0x3ab743ce;
            auVar191 = vfmadd213ps_avx512vl(auVar276,auVar190,auVar94);
            auVar95._8_4_ = 0x3c088908;
            auVar95._0_8_ = 0x3c0889083c088908;
            auVar95._12_4_ = 0x3c088908;
            auVar95._16_4_ = 0x3c088908;
            auVar95._20_4_ = 0x3c088908;
            auVar95._24_4_ = 0x3c088908;
            auVar95._28_4_ = 0x3c088908;
            auVar191 = vfmadd213ps_avx512vl(auVar191,auVar190,auVar95);
            auVar96._8_4_ = 0x3d2aa9c1;
            auVar96._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar96._12_4_ = 0x3d2aa9c1;
            auVar96._16_4_ = 0x3d2aa9c1;
            auVar96._20_4_ = 0x3d2aa9c1;
            auVar96._24_4_ = 0x3d2aa9c1;
            auVar96._28_4_ = 0x3d2aa9c1;
            auVar191 = vfmadd213ps_avx512vl(auVar191,auVar190,auVar96);
            auVar97._8_4_ = 0x3e2aaaaa;
            auVar97._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar97._12_4_ = 0x3e2aaaaa;
            auVar97._16_4_ = 0x3e2aaaaa;
            auVar97._20_4_ = 0x3e2aaaaa;
            auVar97._24_4_ = 0x3e2aaaaa;
            auVar97._28_4_ = 0x3e2aaaaa;
            auVar191 = vfmadd213ps_avx512vl(auVar191,auVar190,auVar97);
            auVar164 = vfmadd213ps_fma(auVar191,auVar190,auVar283);
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar116,auVar190);
            auVar243._0_4_ = auVar164._0_4_ + 1.0;
            auVar243._4_4_ = auVar164._4_4_ + 1.0;
            auVar243._8_4_ = auVar164._8_4_ + 1.0;
            auVar243._12_4_ = auVar164._12_4_ + 1.0;
            auVar243._16_4_ = 0x3f800000;
            auVar243._20_4_ = 0x3f800000;
            auVar243._24_4_ = 0x3f800000;
            auVar243._28_4_ = 0x3f800000;
            auVar235._0_4_ = (int)auVar215._0_4_;
            auVar235._4_4_ = (int)auVar215._4_4_;
            auVar235._8_4_ = (int)auVar215._8_4_;
            auVar235._12_4_ = (int)auVar215._12_4_;
            auVar235._16_4_ = (int)auVar215._16_4_;
            auVar235._20_4_ = (int)auVar215._20_4_;
            auVar235._24_4_ = (int)auVar215._24_4_;
            auVar235._28_4_ = (int)auVar215._28_4_;
            auVar190 = vpslld_avx2(auVar235,0x17);
            auVar98._8_4_ = 0x3f800000;
            auVar98._0_8_ = 0x3f8000003f800000;
            auVar98._12_4_ = 0x3f800000;
            auVar98._16_4_ = 0x3f800000;
            auVar98._20_4_ = 0x3f800000;
            auVar98._24_4_ = 0x3f800000;
            auVar98._28_4_ = 0x3f800000;
            auVar190 = vpaddd_avx512vl(auVar190,auVar98);
            auVar164 = vfmadd213ps_fma(auVar190,auVar243,auVar292);
            auVar190 = vrcpps_avx(ZEXT1632(auVar164));
            auVar164 = vfmsub213ps_fma(ZEXT1632(auVar164),auVar190,auVar292);
            auVar164 = vfnmadd132ps_fma(ZEXT1632(auVar164),auVar190,auVar190);
            auVar192 = ZEXT1632(auVar164);
            break;
          case 5:
            auVar296._8_4_ = 0x42b0c0a5;
            auVar296._0_8_ = 0x42b0c0a542b0c0a5;
            auVar296._12_4_ = 0x42b0c0a5;
            auVar296._16_4_ = 0x42b0c0a5;
            auVar296._20_4_ = 0x42b0c0a5;
            auVar296._24_4_ = 0x42b0c0a5;
            auVar296._28_4_ = 0x42b0c0a5;
            auVar190 = vminps_avx(auVar192,auVar296);
            auVar301._8_4_ = 0xc2b0c0a5;
            auVar301._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar301._12_4_ = 0xc2b0c0a5;
            auVar301._16_4_ = 0xc2b0c0a5;
            auVar301._20_4_ = 0xc2b0c0a5;
            auVar301._24_4_ = 0xc2b0c0a5;
            auVar301._28_4_ = 0xc2b0c0a5;
            auVar190 = vmaxps_avx(auVar190,auVar301);
            auVar310._8_4_ = 0x3fb8aa3b;
            auVar310._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar310._12_4_ = 0x3fb8aa3b;
            auVar310._16_4_ = 0x3fb8aa3b;
            auVar310._20_4_ = 0x3fb8aa3b;
            auVar310._24_4_ = 0x3fb8aa3b;
            auVar310._28_4_ = 0x3fb8aa3b;
            auVar306._8_4_ = 0x3f000000;
            auVar306._0_8_ = 0x3f0000003f000000;
            auVar306._12_4_ = 0x3f000000;
            auVar306._16_4_ = 0x3f000000;
            auVar306._20_4_ = 0x3f000000;
            auVar306._24_4_ = 0x3f000000;
            auVar306._28_4_ = 0x3f000000;
            auVar164 = vfmadd213ps_fma(auVar310,auVar190,auVar306);
            auVar191 = vroundps_avx(ZEXT1632(auVar164),1);
            uVar14 = vcmpps_avx512vl(ZEXT1632(auVar164),auVar191,1);
            auVar314._8_4_ = 0x3f800000;
            auVar314._0_8_ = 0x3f8000003f800000;
            auVar314._12_4_ = 0x3f800000;
            auVar314._16_4_ = 0x3f800000;
            auVar314._20_4_ = 0x3f800000;
            auVar314._24_4_ = 0x3f800000;
            auVar314._28_4_ = 0x3f800000;
            auVar193 = vsubps_avx512vl(auVar191,auVar314);
            bVar11 = (bool)((byte)uVar14 & 1);
            auVar210._0_4_ = (float)((uint)bVar11 * auVar193._0_4_ | (uint)!bVar11 * auVar191._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar210._4_4_ = (float)((uint)bVar11 * auVar193._4_4_ | (uint)!bVar11 * auVar191._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar210._8_4_ = (float)((uint)bVar11 * auVar193._8_4_ | (uint)!bVar11 * auVar191._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar210._12_4_ =
                 (float)((uint)bVar11 * auVar193._12_4_ | (uint)!bVar11 * auVar191._12_4_);
            bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
            auVar210._16_4_ =
                 (float)((uint)bVar11 * auVar193._16_4_ | (uint)!bVar11 * auVar191._16_4_);
            bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
            auVar210._20_4_ =
                 (float)((uint)bVar11 * auVar193._20_4_ | (uint)!bVar11 * auVar191._20_4_);
            bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
            auVar210._24_4_ =
                 (float)((uint)bVar11 * auVar193._24_4_ | (uint)!bVar11 * auVar191._24_4_);
            bVar11 = SUB81(uVar14 >> 7,0);
            auVar210._28_4_ =
                 (float)((uint)bVar11 * auVar193._28_4_ | (uint)!bVar11 * auVar191._28_4_);
            auVar318._8_4_ = 0x3f318000;
            auVar318._0_8_ = 0x3f3180003f318000;
            auVar318._12_4_ = 0x3f318000;
            auVar318._16_4_ = 0x3f318000;
            auVar318._20_4_ = 0x3f318000;
            auVar318._24_4_ = 0x3f318000;
            auVar318._28_4_ = 0x3f318000;
            auVar164 = vfmsub231ps_fma(auVar190,auVar210,auVar318);
            auVar193 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
            auVar190 = vfnmsub231ps_avx512vl(ZEXT1632(auVar164),auVar210,auVar193);
            auVar258._0_4_ = auVar190._0_4_ * auVar190._0_4_;
            auVar258._4_4_ = auVar190._4_4_ * auVar190._4_4_;
            auVar258._8_4_ = auVar190._8_4_ * auVar190._8_4_;
            auVar258._12_4_ = auVar190._12_4_ * auVar190._12_4_;
            auVar258._16_4_ = auVar190._16_4_ * auVar190._16_4_;
            auVar258._20_4_ = auVar190._20_4_ * auVar190._20_4_;
            auVar258._24_4_ = auVar190._24_4_ * auVar190._24_4_;
            auVar258._28_4_ = 0;
            auVar322._8_4_ = 0x39506967;
            auVar322._0_8_ = 0x3950696739506967;
            auVar322._12_4_ = 0x39506967;
            auVar322._16_4_ = 0x39506967;
            auVar322._20_4_ = 0x39506967;
            auVar322._24_4_ = 0x39506967;
            auVar322._28_4_ = 0x39506967;
            auVar327._8_4_ = 0x3ab743ce;
            auVar327._0_8_ = 0x3ab743ce3ab743ce;
            auVar327._12_4_ = 0x3ab743ce;
            auVar327._16_4_ = 0x3ab743ce;
            auVar327._20_4_ = 0x3ab743ce;
            auVar327._24_4_ = 0x3ab743ce;
            auVar327._28_4_ = 0x3ab743ce;
            auVar164 = vfmadd213ps_fma(auVar322,auVar190,auVar327);
            auVar330._8_4_ = 0x3c088908;
            auVar330._0_8_ = 0x3c0889083c088908;
            auVar330._12_4_ = 0x3c088908;
            auVar330._16_4_ = 0x3c088908;
            auVar330._20_4_ = 0x3c088908;
            auVar330._24_4_ = 0x3c088908;
            auVar330._28_4_ = 0x3c088908;
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar190,auVar330);
            auVar334._8_4_ = 0x3d2aa9c1;
            auVar334._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar334._12_4_ = 0x3d2aa9c1;
            auVar334._16_4_ = 0x3d2aa9c1;
            auVar334._20_4_ = 0x3d2aa9c1;
            auVar334._24_4_ = 0x3d2aa9c1;
            auVar334._28_4_ = 0x3d2aa9c1;
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar190,auVar334);
            auVar194 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
            auVar191 = vfmadd213ps_avx512vl(ZEXT1632(auVar164),auVar190,auVar194);
            auVar164 = vfmadd213ps_fma(auVar191,auVar190,auVar306);
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar258,auVar190);
            auVar241._0_4_ = auVar164._0_4_ + 1.0;
            auVar241._4_4_ = auVar164._4_4_ + 1.0;
            auVar241._8_4_ = auVar164._8_4_ + 1.0;
            auVar241._12_4_ = auVar164._12_4_ + 1.0;
            auVar241._16_4_ = 0x3f800000;
            auVar241._20_4_ = 0x3f800000;
            auVar241._24_4_ = 0x3f800000;
            auVar241._28_4_ = 0x3f800000;
            auVar259._0_4_ = (int)auVar210._0_4_;
            auVar259._4_4_ = (int)auVar210._4_4_;
            auVar259._8_4_ = (int)auVar210._8_4_;
            auVar259._12_4_ = (int)auVar210._12_4_;
            auVar259._16_4_ = (int)auVar210._16_4_;
            auVar259._20_4_ = (int)auVar210._20_4_;
            auVar259._24_4_ = (int)auVar210._24_4_;
            auVar259._28_4_ = (int)auVar210._28_4_;
            auVar190 = vpslld_avx2(auVar259,0x17);
            auVar195 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
            auVar190 = vpaddd_avx512vl(auVar190,auVar195);
            auVar164 = vfmadd213ps_fma(auVar190,auVar241,auVar314);
            uVar14 = vcmpps_avx512vl(ZEXT1632(auVar164),_DAT_0056ae20,2);
            auVar196._8_4_ = 0x800000;
            auVar196._0_8_ = 0x80000000800000;
            auVar196._12_4_ = 0x800000;
            auVar196._16_4_ = 0x800000;
            auVar196._20_4_ = 0x800000;
            auVar196._24_4_ = 0x800000;
            auVar196._28_4_ = 0x800000;
            auVar190 = vmaxps_avx512vl(ZEXT1632(auVar164),auVar196);
            auVar260 = vpsrld_avx2(auVar190,0x17);
            auVar275._8_4_ = 0x807fffff;
            auVar275._0_8_ = 0x807fffff807fffff;
            auVar275._12_4_ = 0x807fffff;
            auVar275._16_4_ = 0x807fffff;
            auVar275._20_4_ = 0x807fffff;
            auVar275._24_4_ = 0x807fffff;
            auVar275._28_4_ = 0x807fffff;
            auVar197._8_4_ = 0x3f000000;
            auVar197._0_8_ = 0x3f0000003f000000;
            auVar197._12_4_ = 0x3f000000;
            auVar197._16_4_ = 0x3f000000;
            auVar197._20_4_ = 0x3f000000;
            auVar197._24_4_ = 0x3f000000;
            auVar197._28_4_ = 0x3f000000;
            auVar190 = vpternlogd_avx512vl(auVar190,auVar275,auVar197,0xea);
            auVar198._8_4_ = 0x3f3504f3;
            auVar198._0_8_ = 0x3f3504f33f3504f3;
            auVar198._12_4_ = 0x3f3504f3;
            auVar198._16_4_ = 0x3f3504f3;
            auVar198._20_4_ = 0x3f3504f3;
            auVar198._24_4_ = 0x3f3504f3;
            auVar198._28_4_ = 0x3f3504f3;
            uVar13 = vcmpps_avx512vl(auVar190,auVar198,1);
            auVar196 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
            auVar191 = vaddps_avx512vl(auVar190,auVar196);
            auVar197 = vaddps_avx512vl(auVar191,auVar190);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar211._0_4_ = (float)((uint)bVar11 * auVar197._0_4_ | (uint)!bVar11 * auVar191._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar211._4_4_ = (float)((uint)bVar11 * auVar197._4_4_ | (uint)!bVar11 * auVar191._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar211._8_4_ = (float)((uint)bVar11 * auVar197._8_4_ | (uint)!bVar11 * auVar191._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar211._12_4_ =
                 (float)((uint)bVar11 * auVar197._12_4_ | (uint)!bVar11 * auVar191._12_4_);
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar211._16_4_ =
                 (float)((uint)bVar11 * auVar197._16_4_ | (uint)!bVar11 * auVar191._16_4_);
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar211._20_4_ =
                 (float)((uint)bVar11 * auVar197._20_4_ | (uint)!bVar11 * auVar191._20_4_);
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar211._24_4_ =
                 (float)((uint)bVar11 * auVar197._24_4_ | (uint)!bVar11 * auVar191._24_4_);
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar211._28_4_ = (uint)bVar11 * auVar197._28_4_ | (uint)!bVar11 * auVar191._28_4_;
            auVar114._4_4_ = auVar211._4_4_ * auVar211._4_4_;
            auVar114._0_4_ = auVar211._0_4_ * auVar211._0_4_;
            auVar114._8_4_ = auVar211._8_4_ * auVar211._8_4_;
            auVar114._12_4_ = auVar211._12_4_ * auVar211._12_4_;
            auVar114._16_4_ = auVar211._16_4_ * auVar211._16_4_;
            auVar114._20_4_ = auVar211._20_4_ * auVar211._20_4_;
            auVar114._24_4_ = auVar211._24_4_ * auVar211._24_4_;
            auVar114._28_4_ = auVar190._28_4_;
            auVar282._8_4_ = 0x3d9021bb;
            auVar282._0_8_ = 0x3d9021bb3d9021bb;
            auVar282._12_4_ = 0x3d9021bb;
            auVar282._16_4_ = 0x3d9021bb;
            auVar282._20_4_ = 0x3d9021bb;
            auVar282._24_4_ = 0x3d9021bb;
            auVar282._28_4_ = 0x3d9021bb;
            auVar79._8_4_ = 0xbdebd1b8;
            auVar79._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar79._12_4_ = 0xbdebd1b8;
            auVar79._16_4_ = 0xbdebd1b8;
            auVar79._20_4_ = 0xbdebd1b8;
            auVar79._24_4_ = 0xbdebd1b8;
            auVar79._28_4_ = 0xbdebd1b8;
            auVar190 = vfmadd213ps_avx512vl(auVar282,auVar211,auVar79);
            auVar80._8_4_ = 0x3def251a;
            auVar80._0_8_ = 0x3def251a3def251a;
            auVar80._12_4_ = 0x3def251a;
            auVar80._16_4_ = 0x3def251a;
            auVar80._20_4_ = 0x3def251a;
            auVar80._24_4_ = 0x3def251a;
            auVar80._28_4_ = 0x3def251a;
            auVar190 = vfmadd213ps_avx512vl(auVar190,auVar211,auVar80);
            auVar81._8_4_ = 0xbdfe5d4f;
            auVar81._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar81._12_4_ = 0xbdfe5d4f;
            auVar81._16_4_ = 0xbdfe5d4f;
            auVar81._20_4_ = 0xbdfe5d4f;
            auVar81._24_4_ = 0xbdfe5d4f;
            auVar81._28_4_ = 0xbdfe5d4f;
            auVar190 = vfmadd213ps_avx512vl(auVar190,auVar211,auVar81);
            auVar82._8_4_ = 0x3e11e9bf;
            auVar82._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar82._12_4_ = 0x3e11e9bf;
            auVar82._16_4_ = 0x3e11e9bf;
            auVar82._20_4_ = 0x3e11e9bf;
            auVar82._24_4_ = 0x3e11e9bf;
            auVar82._28_4_ = 0x3e11e9bf;
            auVar190 = vfmadd213ps_avx512vl(auVar190,auVar211,auVar82);
            auVar83._8_4_ = 0xbe2aae50;
            auVar83._0_8_ = 0xbe2aae50be2aae50;
            auVar83._12_4_ = 0xbe2aae50;
            auVar83._16_4_ = 0xbe2aae50;
            auVar83._20_4_ = 0xbe2aae50;
            auVar83._24_4_ = 0xbe2aae50;
            auVar83._28_4_ = 0xbe2aae50;
            auVar190 = vfmadd213ps_avx512vl(auVar190,auVar211,auVar83);
            auVar84._8_4_ = 0x3e4cceac;
            auVar84._0_8_ = 0x3e4cceac3e4cceac;
            auVar84._12_4_ = 0x3e4cceac;
            auVar84._16_4_ = 0x3e4cceac;
            auVar84._20_4_ = 0x3e4cceac;
            auVar84._24_4_ = 0x3e4cceac;
            auVar84._28_4_ = 0x3e4cceac;
            auVar190 = vfmadd213ps_avx512vl(auVar190,auVar211,auVar84);
            auVar85._8_4_ = 0xbe7ffffc;
            auVar85._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar85._12_4_ = 0xbe7ffffc;
            auVar85._16_4_ = 0xbe7ffffc;
            auVar85._20_4_ = 0xbe7ffffc;
            auVar85._24_4_ = 0xbe7ffffc;
            auVar85._28_4_ = 0xbe7ffffc;
            auVar190 = vfmadd213ps_avx512vl(auVar190,auVar211,auVar85);
            auVar86._8_4_ = 0x3eaaaaaa;
            auVar86._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar86._12_4_ = 0x3eaaaaaa;
            auVar86._16_4_ = 0x3eaaaaaa;
            auVar86._20_4_ = 0x3eaaaaaa;
            auVar86._24_4_ = 0x3eaaaaaa;
            auVar86._28_4_ = 0x3eaaaaaa;
            auVar190 = vfmadd213ps_avx512vl(auVar190,auVar211,auVar86);
            auVar115._4_4_ = auVar211._4_4_ * auVar211._4_4_ * auVar211._4_4_ * auVar190._4_4_;
            auVar115._0_4_ = auVar211._0_4_ * auVar211._0_4_ * auVar211._0_4_ * auVar190._0_4_;
            auVar115._8_4_ = auVar211._8_4_ * auVar211._8_4_ * auVar211._8_4_ * auVar190._8_4_;
            auVar115._12_4_ = auVar211._12_4_ * auVar211._12_4_ * auVar211._12_4_ * auVar190._12_4_;
            auVar115._16_4_ = auVar211._16_4_ * auVar211._16_4_ * auVar211._16_4_ * auVar190._16_4_;
            auVar115._20_4_ = auVar211._20_4_ * auVar211._20_4_ * auVar211._20_4_ * auVar190._20_4_;
            auVar115._24_4_ = auVar211._24_4_ * auVar211._24_4_ * auVar211._24_4_ * auVar190._24_4_;
            auVar115._28_4_ = auVar190._28_4_;
            auVar87._8_4_ = 0xffffff82;
            auVar87._0_8_ = 0xffffff82ffffff82;
            auVar87._12_4_ = 0xffffff82;
            auVar87._16_4_ = 0xffffff82;
            auVar87._20_4_ = 0xffffff82;
            auVar87._24_4_ = 0xffffff82;
            auVar87._28_4_ = 0xffffff82;
            auVar190 = vpaddd_avx512vl(auVar260,auVar87);
            auVar190 = vcvtdq2ps_avx(auVar190);
            auVar191 = vsubps_avx512vl(auVar190,auVar314);
            bVar11 = (bool)((byte)uVar13 & 1);
            auVar212._0_4_ = (uint)bVar11 * auVar191._0_4_ | (uint)!bVar11 * auVar190._0_4_;
            bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
            auVar212._4_4_ = (uint)bVar11 * auVar191._4_4_ | (uint)!bVar11 * auVar190._4_4_;
            bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
            auVar212._8_4_ = (uint)bVar11 * auVar191._8_4_ | (uint)!bVar11 * auVar190._8_4_;
            bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
            auVar212._12_4_ = (uint)bVar11 * auVar191._12_4_ | (uint)!bVar11 * auVar190._12_4_;
            bVar11 = (bool)((byte)(uVar13 >> 4) & 1);
            auVar212._16_4_ = (uint)bVar11 * auVar191._16_4_ | (uint)!bVar11 * auVar190._16_4_;
            bVar11 = (bool)((byte)(uVar13 >> 5) & 1);
            auVar212._20_4_ = (uint)bVar11 * auVar191._20_4_ | (uint)!bVar11 * auVar190._20_4_;
            bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
            auVar212._24_4_ = (uint)bVar11 * auVar191._24_4_ | (uint)!bVar11 * auVar190._24_4_;
            bVar11 = SUB81(uVar13 >> 7,0);
            auVar212._28_4_ = (uint)bVar11 * auVar191._28_4_ | (uint)!bVar11 * auVar190._28_4_;
            auVar190 = vfmadd231ps_avx512vl(auVar115,auVar212,auVar193);
            auVar164 = vfmsub231ps_fma(auVar190,auVar306,auVar114);
            auVar190 = vsubps_avx(ZEXT1632(auVar164),auVar211);
            auVar164 = vfmsub231ps_fma(auVar190,auVar318,auVar212);
            auVar291._8_4_ = 0xc0000000;
            auVar291._0_8_ = 0xc0000000c0000000;
            auVar291._12_4_ = 0xc0000000;
            auVar291._16_4_ = 0xc0000000;
            auVar291._20_4_ = 0xc0000000;
            auVar291._24_4_ = 0xc0000000;
            auVar291._28_4_ = 0xc0000000;
            auVar190 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar11 = (bool)((byte)uVar14 & 1);
            auVar213._0_4_ =
                 (uint)bVar11 * auVar190._0_4_ | (uint)!bVar11 * (int)(auVar164._0_4_ * -2.0);
            bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar213._4_4_ =
                 (uint)bVar11 * auVar190._4_4_ | (uint)!bVar11 * (int)(auVar164._4_4_ * -2.0);
            bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar213._8_4_ =
                 (uint)bVar11 * auVar190._8_4_ | (uint)!bVar11 * (int)(auVar164._8_4_ * -2.0);
            bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar213._12_4_ =
                 (uint)bVar11 * auVar190._12_4_ | (uint)!bVar11 * (int)(auVar164._12_4_ * -2.0);
            bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
            auVar213._16_4_ = (uint)bVar11 * auVar190._16_4_ | (uint)!bVar11 * -0x80000000;
            bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
            auVar213._20_4_ = (uint)bVar11 * auVar190._20_4_ | (uint)!bVar11 * -0x80000000;
            bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
            auVar213._24_4_ = (uint)bVar11 * auVar190._24_4_ | (uint)!bVar11 * -0x80000000;
            auVar213._28_4_ = (uint)(byte)(uVar14 >> 7) * auVar190._28_4_;
            auVar190 = vminps_avx(auVar213,auVar296);
            auVar190 = vmaxps_avx(auVar190,auVar301);
            auVar164 = vfmadd213ps_fma(auVar310,auVar190,auVar306);
            auVar191 = vroundps_avx(ZEXT1632(auVar164),1);
            uVar14 = vcmpps_avx512vl(ZEXT1632(auVar164),auVar191,1);
            auVar197 = vsubps_avx512vl(auVar191,auVar314);
            bVar11 = (bool)((byte)uVar14 & 1);
            auVar214._0_4_ = (float)((uint)bVar11 * auVar197._0_4_ | (uint)!bVar11 * auVar191._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
            auVar214._4_4_ = (float)((uint)bVar11 * auVar197._4_4_ | (uint)!bVar11 * auVar191._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
            auVar214._8_4_ = (float)((uint)bVar11 * auVar197._8_4_ | (uint)!bVar11 * auVar191._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
            auVar214._12_4_ =
                 (float)((uint)bVar11 * auVar197._12_4_ | (uint)!bVar11 * auVar191._12_4_);
            bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
            auVar214._16_4_ =
                 (float)((uint)bVar11 * auVar197._16_4_ | (uint)!bVar11 * auVar191._16_4_);
            bVar11 = (bool)((byte)(uVar14 >> 5) & 1);
            auVar214._20_4_ =
                 (float)((uint)bVar11 * auVar197._20_4_ | (uint)!bVar11 * auVar191._20_4_);
            bVar11 = (bool)((byte)(uVar14 >> 6) & 1);
            auVar214._24_4_ =
                 (float)((uint)bVar11 * auVar197._24_4_ | (uint)!bVar11 * auVar191._24_4_);
            bVar11 = SUB81(uVar14 >> 7,0);
            auVar214._28_4_ =
                 (float)((uint)bVar11 * auVar197._28_4_ | (uint)!bVar11 * auVar191._28_4_);
            auVar164 = vfmsub231ps_fma(auVar190,auVar214,auVar318);
            auVar190 = vfnmsub231ps_avx512vl(ZEXT1632(auVar164),auVar214,auVar193);
            auVar261._0_4_ = auVar190._0_4_ * auVar190._0_4_;
            auVar261._4_4_ = auVar190._4_4_ * auVar190._4_4_;
            auVar261._8_4_ = auVar190._8_4_ * auVar190._8_4_;
            auVar261._12_4_ = auVar190._12_4_ * auVar190._12_4_;
            auVar261._16_4_ = auVar190._16_4_ * auVar190._16_4_;
            auVar261._20_4_ = auVar190._20_4_ * auVar190._20_4_;
            auVar261._24_4_ = auVar190._24_4_ * auVar190._24_4_;
            auVar261._28_4_ = 0;
            auVar164 = vfmadd213ps_fma(auVar322,auVar190,auVar327);
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar190,auVar330);
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar190,auVar334);
            auVar191 = vfmadd213ps_avx512vl(ZEXT1632(auVar164),auVar190,auVar194);
            auVar164 = vfmadd213ps_fma(auVar191,auVar190,auVar306);
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar261,auVar190);
            auVar242._0_4_ = auVar164._0_4_ + 1.0;
            auVar242._4_4_ = auVar164._4_4_ + 1.0;
            auVar242._8_4_ = auVar164._8_4_ + 1.0;
            auVar242._12_4_ = auVar164._12_4_ + 1.0;
            auVar242._16_4_ = 0x3f800000;
            auVar242._20_4_ = 0x3f800000;
            auVar242._24_4_ = 0x3f800000;
            auVar242._28_4_ = 0x3f800000;
            auVar262._0_4_ = (int)auVar214._0_4_;
            auVar262._4_4_ = (int)auVar214._4_4_;
            auVar262._8_4_ = (int)auVar214._8_4_;
            auVar262._12_4_ = (int)auVar214._12_4_;
            auVar262._16_4_ = (int)auVar214._16_4_;
            auVar262._20_4_ = (int)auVar214._20_4_;
            auVar262._24_4_ = (int)auVar214._24_4_;
            auVar262._28_4_ = (int)auVar214._28_4_;
            auVar190 = vpslld_avx2(auVar262,0x17);
            auVar190 = vpaddd_avx512vl(auVar190,auVar195);
            auVar164 = vfmadd213ps_fma(auVar190,auVar242,auVar314);
            auVar190 = vrcpps_avx(ZEXT1632(auVar164));
            auVar164 = vfmsub213ps_fma(ZEXT1632(auVar164),auVar190,auVar314);
            auVar164 = vfnmadd132ps_fma(ZEXT1632(auVar164),auVar190,auVar190);
            auVar190 = vfnmadd213ps_avx512vl(ZEXT1632(auVar164),auVar291,auVar196);
            auVar192._4_4_ = auVar190._4_4_ * auVar192._4_4_;
            auVar192._0_4_ = auVar190._0_4_ * auVar192._0_4_;
            auVar192._8_4_ = auVar190._8_4_ * auVar192._8_4_;
            auVar192._12_4_ = auVar190._12_4_ * auVar192._12_4_;
            auVar192._16_4_ = auVar190._16_4_ * auVar192._16_4_;
            auVar192._20_4_ = auVar190._20_4_ * auVar192._20_4_;
            auVar192._24_4_ = auVar190._24_4_ * auVar192._24_4_;
            break;
          case 6:
            uVar5 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
            auVar195._4_4_ = uVar5;
            auVar195._0_4_ = uVar5;
            auVar195._8_4_ = uVar5;
            auVar195._12_4_ = uVar5;
            auVar195._16_4_ = uVar5;
            auVar195._20_4_ = uVar5;
            auVar195._24_4_ = uVar5;
            auVar195._28_4_ = uVar5;
            uVar5 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
            auVar193._4_4_ = uVar5;
            auVar193._0_4_ = uVar5;
            auVar193._8_4_ = uVar5;
            auVar193._12_4_ = uVar5;
            auVar193._16_4_ = uVar5;
            auVar193._20_4_ = uVar5;
            auVar193._24_4_ = uVar5;
            auVar193._28_4_ = uVar5;
            auVar190 = vfmadd213ps_avx512vl(auVar195,auVar192,auVar193);
            auVar190 = vmaxps_avx(auVar190,_DAT_0056ae20);
            auVar194._8_4_ = 0x3f800000;
            auVar194._0_8_ = 0x3f8000003f800000;
            auVar194._12_4_ = 0x3f800000;
            auVar194._16_4_ = 0x3f800000;
            auVar194._20_4_ = 0x3f800000;
            auVar194._24_4_ = 0x3f800000;
            auVar194._28_4_ = 0x3f800000;
            auVar190 = vminps_avx512vl(auVar190,auVar194);
            auVar192._4_4_ = auVar190._4_4_ * auVar192._4_4_;
            auVar192._0_4_ = auVar190._0_4_ * auVar192._0_4_;
            auVar192._8_4_ = auVar190._8_4_ * auVar192._8_4_;
            auVar192._12_4_ = auVar190._12_4_ * auVar192._12_4_;
            auVar192._16_4_ = auVar190._16_4_ * auVar192._16_4_;
            auVar192._20_4_ = auVar190._20_4_ * auVar192._20_4_;
            auVar192._24_4_ = auVar190._24_4_ * auVar192._24_4_;
          }
          *(undefined1 (*) [32])((long)top_blob->data + local_2f0 * 4) = auVar192;
          uVar140 = uVar140 + 1;
          lVar160 = local_2e8 + 8;
          lVar147 = local_2b0 + 8;
          lVar157 = local_2b8 + 8;
          lVar148 = local_2c0 + 8;
          lVar149 = local_2c8 + 8;
          lVar151 = local_2d0 + 8;
          lVar162 = local_2d8 + 8;
          lVar154 = local_2e0 + 8;
        } while (uVar140 != local_220);
      }
      uVar140 = local_370 & 0xfffffffffffffff8;
      fVar263 = (float)((uint)(local_370 >> 2) & 1);
      if ((local_370 >> 2 & 1) != 0) {
        uStack_274 = 0;
        if (lVar8 == 0) {
          auVar164 = ZEXT816(0) << 0x40;
        }
        else {
          auVar164 = *(undefined1 (*) [16])(lVar8 + uVar140 * 4);
        }
        pvVar9 = (this->weight_data_tm).data;
        lVar147 = (long)(this->weight_data_tm).w * (this->weight_data_tm).elemsize;
        pauVar145 = (undefined1 (*) [16])(lVar147 * uVar140 + (long)pvVar9);
        pauVar163 = (undefined1 (*) [16])((uVar140 | 1) * lVar147 + (long)pvVar9);
        pauVar153 = (undefined1 (*) [16])((uVar140 | 2) * lVar147 + (long)pvVar9);
        pauVar155 = (undefined1 (*) [16])((uVar140 | 3) * lVar147 + (long)pvVar9);
        pauVar139 = local_3d8;
        if ((int)uVar146 < 8) {
          uVar161 = 0;
          local_1b8 = SUB6432(ZEXT864(0),0);
          local_1f8 = SUB6432(ZEXT864(0),0);
          local_1d8 = SUB6432(ZEXT864(0),0);
          local_198 = SUB6432(ZEXT864(0),0);
        }
        else {
          uVar161 = uVar146 & 0xfffffff8;
          auVar216 = ZEXT864(0);
          iVar137 = 7;
          auVar218 = ZEXT864(0);
          auVar219 = ZEXT864(0);
          auVar217 = ZEXT864(0);
          do {
            auVar190 = *pauVar139;
            auVar166 = vlddqu_avx(*pauVar145);
            auVar191 = vcvtph2ps_f16c(auVar166);
            auVar166 = vlddqu_avx(*pauVar163);
            auVar192 = vcvtph2ps_f16c(auVar166);
            auVar166 = vlddqu_avx(*pauVar153);
            auVar193 = vcvtph2ps_f16c(auVar166);
            auVar166 = vlddqu_avx(*pauVar155);
            auVar194 = vcvtph2ps_f16c(auVar166);
            auVar166 = vfmadd231ps_fma(auVar217._0_32_,auVar190,auVar191);
            auVar217 = ZEXT1664(auVar166);
            local_1b8 = ZEXT1632(auVar166);
            auVar166 = vfmadd231ps_fma(auVar219._0_32_,auVar190,auVar192);
            auVar219 = ZEXT1664(auVar166);
            local_1f8 = ZEXT1632(auVar166);
            auVar166 = vfmadd231ps_fma(auVar218._0_32_,auVar190,auVar193);
            auVar218 = ZEXT1664(auVar166);
            local_1d8 = ZEXT1632(auVar166);
            auVar166 = vfmadd231ps_fma(auVar216._0_32_,auVar190,auVar194);
            auVar216 = ZEXT1664(auVar166);
            local_198 = ZEXT1632(auVar166);
            pauVar139 = pauVar139 + 1;
            pauVar145 = pauVar145 + 1;
            pauVar163 = pauVar163 + 1;
            pauVar153 = pauVar153 + 1;
            pauVar155 = pauVar155 + 1;
            iVar137 = iVar137 + 8;
          } while (iVar137 < (int)uVar146);
        }
        local_288 = ZEXT816(0) << 0x40;
        if ((int)(uVar161 | 3) < (int)uVar146) {
          auVar216 = ZEXT864(0);
          lVar147 = 0;
          auVar217 = ZEXT864(0);
          local_348 = ZEXT816(0);
          pauVar150 = pauVar139;
          uVar142 = uVar161;
          do {
            auVar166._8_8_ = 0;
            auVar166._0_8_ = *(ulong *)(*pauVar145 + lVar147);
            auVar169 = vcvtph2ps_f16c(auVar166);
            auVar165._8_8_ = 0;
            auVar165._0_8_ = *(ulong *)(*pauVar163 + lVar147);
            auVar165 = vcvtph2ps_f16c(auVar165);
            auVar167._8_8_ = 0;
            auVar167._0_8_ = *(ulong *)(*pauVar153 + lVar147);
            auVar167 = vcvtph2ps_f16c(auVar167);
            auVar166 = *(undefined1 (*) [16])(*pauVar139 + lVar147 * 2);
            auVar168._8_8_ = 0;
            auVar168._0_8_ = *(ulong *)(*pauVar155 + lVar147);
            auVar168 = vcvtph2ps_f16c(auVar168);
            local_288 = vfmadd231ps_fma(local_288,auVar166,auVar169);
            local_348 = vfmadd231ps_fma(local_348,auVar166,auVar165);
            local_338 = vfmadd231ps_fma(auVar217._0_16_,auVar166,auVar167);
            auVar217 = ZEXT1664(local_338);
            local_328 = vfmadd231ps_fma(auVar216._0_16_,auVar166,auVar168);
            auVar216 = ZEXT1664(local_328);
            pauVar150 = (undefined1 (*) [32])(*pauVar150 + 0x10);
            uVar161 = uVar142 + 4;
            lVar147 = lVar147 + 8;
            iVar137 = uVar142 + 7;
            uVar142 = uVar161;
          } while (iVar137 < (int)uVar146);
          pauVar145 = (undefined1 (*) [16])(*pauVar145 + lVar147);
          pauVar163 = (undefined1 (*) [16])(*pauVar163 + lVar147);
          pauVar153 = (undefined1 (*) [16])(*pauVar153 + lVar147);
          pauVar155 = (undefined1 (*) [16])(*pauVar155 + lVar147);
          pauVar139 = pauVar150;
        }
        else {
          local_348 = ZEXT816(0);
          local_338 = SUB6416(ZEXT864(0),0);
          local_328 = SUB6416(ZEXT864(0),0);
        }
        local_268 = (ulong)(uVar146 - uVar161);
        local_278 = fVar263;
        if (uVar146 - uVar161 != 0 && (int)uVar161 <= (int)uVar146) {
          lVar147 = 0;
          do {
            local_2a8._0_16_ = auVar164;
            local_388 = ZEXT416(*(uint *)(*pauVar139 + lVar147 * 4));
            fVar263 = float16_to_float32(*(unsigned_short *)(*pauVar145 + lVar147 * 2));
            auVar190 = _local_218;
            local_218._4_4_ = extraout_XMM0_Db_04;
            local_218._0_4_ = fVar263;
            fStack_210 = (float)extraout_XMM0_Dc_03;
            _fStack_208 = auVar190._16_16_;
            fStack_20c = (float)extraout_XMM0_Dd_03;
            local_308 = ZEXT416(*(uint *)(*pauVar139 + lVar147 * 4));
            local_318 = float16_to_float32(*(unsigned_short *)(*pauVar163 + lVar147 * 2));
            local_238 = ZEXT416(*(uint *)(*pauVar139 + lVar147 * 4));
            local_248 = float16_to_float32(*(unsigned_short *)(*pauVar153 + lVar147 * 2));
            local_258 = ZEXT416(*(uint *)(*pauVar139 + lVar147 * 4));
            auVar217._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar155 + lVar147 * 2));
            auVar217._4_60_ = extraout_var_00;
            auVar164 = vinsertps_avx(_local_218,ZEXT416((uint)local_318),0x10);
            auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_248),0x20);
            auVar164 = vinsertps_avx(auVar164,auVar217._0_16_,0x30);
            auVar166 = vinsertps_avx(local_388,ZEXT416((uint)local_308._0_4_),0x10);
            auVar166 = vinsertps_avx(auVar166,ZEXT416((uint)local_238._0_4_),0x20);
            auVar166 = vinsertps_avx(auVar166,ZEXT416((uint)local_258._0_4_),0x30);
            auVar164 = vfmadd231ps_fma(local_2a8._0_16_,auVar164,auVar166);
            lVar147 = lVar147 + 1;
          } while ((uint)local_268 != (int)lVar147);
        }
        auVar190 = vhaddps_avx(local_1b8,local_1f8);
        auVar191 = vhaddps_avx(local_1d8,local_198);
        auVar190 = vhaddps_avx(auVar190,auVar191);
        auVar165 = vunpcklps_avx(local_288,local_348);
        auVar167 = vunpcklps_avx(local_338,local_328);
        auVar168 = vunpckhps_avx(local_288,local_348);
        auVar169 = vunpckhps_avx(local_338,local_328);
        auVar166 = vmovlhps_avx(auVar165,auVar167);
        auVar167 = vunpckhpd_avx(auVar165,auVar167);
        auVar165 = vmovlhps_avx(auVar168,auVar169);
        auVar168 = vunpckhpd_avx(auVar168,auVar169);
        auVar169._0_4_ =
             auVar167._0_4_ + auVar166._0_4_ + auVar165._0_4_ + auVar168._0_4_ +
             auVar164._0_4_ + auVar190._0_4_ + auVar190._16_4_;
        auVar169._4_4_ =
             auVar167._4_4_ + auVar166._4_4_ + auVar165._4_4_ + auVar168._4_4_ +
             auVar164._4_4_ + auVar190._4_4_ + auVar190._20_4_;
        auVar169._8_4_ =
             auVar167._8_4_ + auVar166._8_4_ + auVar165._8_4_ + auVar168._8_4_ +
             auVar164._8_4_ + auVar190._8_4_ + auVar190._24_4_;
        auVar169._12_4_ =
             auVar167._12_4_ + auVar166._12_4_ + auVar165._12_4_ + auVar168._12_4_ +
             auVar164._12_4_ + auVar190._12_4_ + auVar190._28_4_;
        switch((int)local_368) {
        case 1:
          auVar169 = vmaxps_avx(auVar169,ZEXT816(0) << 0x20);
          break;
        case 2:
          auVar164 = vmaxps_avx(auVar169,ZEXT816(0) << 0x20);
          auVar166 = vminps_avx(auVar169,ZEXT816(0) << 0x20);
          uVar5 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar54._4_4_ = uVar5;
          auVar54._0_4_ = uVar5;
          auVar54._8_4_ = uVar5;
          auVar54._12_4_ = uVar5;
          auVar169 = vfmadd132ps_avx512vl(auVar166,auVar164,auVar54);
          break;
        case 3:
          uVar5 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar52._4_4_ = uVar5;
          auVar52._0_4_ = uVar5;
          auVar52._8_4_ = uVar5;
          auVar52._12_4_ = uVar5;
          auVar164 = vmaxps_avx512vl(auVar169,auVar52);
          uVar5 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
          auVar53._4_4_ = uVar5;
          auVar53._0_4_ = uVar5;
          auVar53._8_4_ = uVar5;
          auVar53._12_4_ = uVar5;
          auVar169 = vminps_avx512vl(auVar164,auVar53);
          break;
        case 4:
          auVar42._8_4_ = 0x80000000;
          auVar42._0_8_ = 0x8000000080000000;
          auVar42._12_4_ = 0x80000000;
          auVar164 = vxorps_avx512vl(auVar169,auVar42);
          auVar43._8_4_ = 0x42b0c0a5;
          auVar43._0_8_ = 0x42b0c0a542b0c0a5;
          auVar43._12_4_ = 0x42b0c0a5;
          auVar164 = vminps_avx512vl(auVar164,auVar43);
          auVar44._8_4_ = 0xc2b0c0a5;
          auVar44._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar44._12_4_ = 0xc2b0c0a5;
          auVar165 = vmaxps_avx512vl(auVar164,auVar44);
          auVar238._8_4_ = 0x3f000000;
          auVar238._0_8_ = 0x3f0000003f000000;
          auVar238._12_4_ = 0x3f000000;
          auVar253._8_4_ = 0x3fb8aa3b;
          auVar253._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar253._12_4_ = 0x3fb8aa3b;
          auVar166 = vfmadd213ps_fma(auVar253,auVar165,auVar238);
          auVar274._0_4_ = (int)auVar166._0_4_;
          auVar274._4_4_ = (int)auVar166._4_4_;
          auVar274._8_4_ = (int)auVar166._8_4_;
          auVar274._12_4_ = (int)auVar166._12_4_;
          auVar164 = vcvtdq2ps_avx(auVar274);
          auVar280._8_4_ = 0x3f800000;
          auVar280._0_8_ = 0x3f8000003f800000;
          auVar280._12_4_ = 0x3f800000;
          uVar14 = vcmpps_avx512vl(auVar166,auVar164,1);
          auVar166 = vsubps_avx512vl(auVar164,auVar280);
          bVar11 = (bool)((byte)uVar14 & 1);
          auVar189._0_4_ = (float)((uint)bVar11 * auVar166._0_4_ | (uint)!bVar11 * auVar164._0_4_);
          bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
          auVar189._4_4_ = (float)((uint)bVar11 * auVar166._4_4_ | (uint)!bVar11 * auVar164._4_4_);
          bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
          auVar189._8_4_ = (float)((uint)bVar11 * auVar166._8_4_ | (uint)!bVar11 * auVar164._8_4_);
          bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
          auVar189._12_4_ =
               (float)((uint)bVar11 * auVar166._12_4_ | (uint)!bVar11 * auVar164._12_4_);
          auVar45._8_4_ = 0x3f318000;
          auVar45._0_8_ = 0x3f3180003f318000;
          auVar45._12_4_ = 0x3f318000;
          auVar164 = vfmsub231ps_avx512vl(auVar165,auVar189,auVar45);
          auVar46._8_4_ = 0x395e8083;
          auVar46._0_8_ = 0x395e8083395e8083;
          auVar46._12_4_ = 0x395e8083;
          auVar166 = vfmsub231ps_avx512vl(auVar164,auVar189,auVar46);
          auVar254._8_4_ = 0x39506967;
          auVar254._0_8_ = 0x3950696739506967;
          auVar254._12_4_ = 0x39506967;
          auVar47._8_4_ = 0x3ab743ce;
          auVar47._0_8_ = 0x3ab743ce3ab743ce;
          auVar47._12_4_ = 0x3ab743ce;
          auVar164 = vfmadd213ps_avx512vl(auVar254,auVar166,auVar47);
          auVar48._8_4_ = 0x3c088908;
          auVar48._0_8_ = 0x3c0889083c088908;
          auVar48._12_4_ = 0x3c088908;
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar166,auVar48);
          auVar49._8_4_ = 0x3d2aa9c1;
          auVar49._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar49._12_4_ = 0x3d2aa9c1;
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar166,auVar49);
          auVar50._8_4_ = 0x3e2aaaaa;
          auVar50._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar50._12_4_ = 0x3e2aaaaa;
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar166,auVar50);
          auVar289._0_4_ = auVar166._0_4_ * auVar166._0_4_;
          auVar289._4_4_ = auVar166._4_4_ * auVar166._4_4_;
          auVar289._8_4_ = auVar166._8_4_ * auVar166._8_4_;
          auVar289._12_4_ = auVar166._12_4_ * auVar166._12_4_;
          auVar164 = vfmadd213ps_fma(auVar164,auVar166,auVar238);
          auVar164 = vfmadd213ps_fma(auVar164,auVar289,auVar166);
          auVar239._0_4_ = auVar164._0_4_ + 1.0;
          auVar239._4_4_ = auVar164._4_4_ + 1.0;
          auVar239._8_4_ = auVar164._8_4_ + 1.0;
          auVar239._12_4_ = auVar164._12_4_ + 1.0;
          auVar231._0_4_ = (int)auVar189._0_4_;
          auVar231._4_4_ = (int)auVar189._4_4_;
          auVar231._8_4_ = (int)auVar189._8_4_;
          auVar231._12_4_ = (int)auVar189._12_4_;
          auVar164 = vpslld_avx(auVar231,0x17);
          auVar51._8_4_ = 0x3f800000;
          auVar51._0_8_ = 0x3f8000003f800000;
          auVar51._12_4_ = 0x3f800000;
          auVar164 = vpaddd_avx512vl(auVar164,auVar51);
          auVar166 = vfmadd213ps_fma(auVar164,auVar239,auVar280);
          auVar164 = vrcpps_avx(auVar166);
          auVar166 = vfmsub213ps_fma(auVar166,auVar164,auVar280);
          auVar169 = vfnmadd132ps_fma(auVar166,auVar164,auVar164);
          break;
        case 5:
          auVar294._8_4_ = 0x42b0c0a5;
          auVar294._0_8_ = 0x42b0c0a542b0c0a5;
          auVar294._12_4_ = 0x42b0c0a5;
          auVar164 = vminps_avx(auVar169,auVar294);
          auVar298._8_4_ = 0xc2b0c0a5;
          auVar298._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar298._12_4_ = 0xc2b0c0a5;
          auVar278._8_4_ = 0x3fb8aa3b;
          auVar278._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar278._12_4_ = 0x3fb8aa3b;
          auVar166 = vmaxps_avx(auVar164,auVar298);
          auVar250._8_4_ = 0x3f000000;
          auVar250._0_8_ = 0x3f0000003f000000;
          auVar250._12_4_ = 0x3f000000;
          auVar165 = vfmadd213ps_fma(auVar278,auVar166,auVar250);
          auVar271._0_4_ = (int)auVar165._0_4_;
          auVar271._4_4_ = (int)auVar165._4_4_;
          auVar271._8_4_ = (int)auVar165._8_4_;
          auVar271._12_4_ = (int)auVar165._12_4_;
          auVar164 = vcvtdq2ps_avx(auVar271);
          uVar14 = vcmpps_avx512vl(auVar165,auVar164,1);
          auVar237._8_4_ = 0x3f800000;
          auVar237._0_8_ = 0x3f8000003f800000;
          auVar237._12_4_ = 0x3f800000;
          auVar272._8_4_ = 0x3f318000;
          auVar272._0_8_ = 0x3f3180003f318000;
          auVar272._12_4_ = 0x3f318000;
          auVar165 = vsubps_avx512vl(auVar164,auVar237);
          bVar11 = (bool)((byte)uVar14 & 1);
          auVar184._0_4_ = (float)((uint)bVar11 * auVar165._0_4_ | (uint)!bVar11 * auVar164._0_4_);
          bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
          auVar184._4_4_ = (float)((uint)bVar11 * auVar165._4_4_ | (uint)!bVar11 * auVar164._4_4_);
          bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
          auVar184._8_4_ = (float)((uint)bVar11 * auVar165._8_4_ | (uint)!bVar11 * auVar164._8_4_);
          bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
          auVar184._12_4_ =
               (float)((uint)bVar11 * auVar165._12_4_ | (uint)!bVar11 * auVar164._12_4_);
          auVar164 = vfmsub231ps_fma(auVar166,auVar184,auVar272);
          auVar303._8_4_ = 0xb95e8083;
          auVar303._0_8_ = 0xb95e8083b95e8083;
          auVar303._12_4_ = 0xb95e8083;
          auVar164 = vfnmsub231ps_fma(auVar164,auVar184,auVar303);
          auVar332._0_4_ = auVar164._0_4_ * auVar164._0_4_;
          auVar332._4_4_ = auVar164._4_4_ * auVar164._4_4_;
          auVar332._8_4_ = auVar164._8_4_ * auVar164._8_4_;
          auVar332._12_4_ = auVar164._12_4_ * auVar164._12_4_;
          auVar308._8_4_ = 0x3ab743ce;
          auVar308._0_8_ = 0x3ab743ce3ab743ce;
          auVar308._12_4_ = 0x3ab743ce;
          auVar288._8_4_ = 0x39506967;
          auVar288._0_8_ = 0x3950696739506967;
          auVar288._12_4_ = 0x39506967;
          auVar166 = vfmadd213ps_avx512vl(auVar288,auVar164,auVar308);
          auVar312._8_4_ = 0x3c088908;
          auVar312._0_8_ = 0x3c0889083c088908;
          auVar312._12_4_ = 0x3c088908;
          auVar316._8_4_ = 0x3d2aa9c1;
          auVar316._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar316._12_4_ = 0x3d2aa9c1;
          auVar166 = vfmadd213ps_avx512vl(auVar166,auVar164,auVar312);
          auVar166 = vfmadd213ps_avx512vl(auVar166,auVar164,auVar316);
          auVar320._8_4_ = 0x3e2aaaaa;
          auVar320._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar320._12_4_ = 0x3e2aaaaa;
          auVar166 = vfmadd213ps_avx512vl(auVar166,auVar164,auVar320);
          auVar166 = vfmadd213ps_avx512vl(auVar166,auVar164,auVar250);
          auVar166 = vfmadd213ps_avx512vl(auVar166,auVar332,auVar164);
          auVar165 = vaddps_avx512vl(auVar166,auVar237);
          auVar324._0_4_ = (int)auVar184._0_4_;
          auVar324._4_4_ = (int)auVar184._4_4_;
          auVar324._8_4_ = (int)auVar184._8_4_;
          auVar324._12_4_ = (int)auVar184._12_4_;
          auVar164 = vpslld_avx(auVar324,0x17);
          auVar325._8_4_ = 0x3f800000;
          auVar325._0_8_ = 0x3f8000003f800000;
          auVar325._12_4_ = 0x3f800000;
          auVar164 = vpaddd_avx(auVar164,auVar325);
          auVar164 = vfmadd213ps_fma(auVar164,auVar165,auVar237);
          auVar172._8_4_ = 0x800000;
          auVar172._0_8_ = 0x80000000800000;
          auVar172._12_4_ = 0x800000;
          auVar165 = vmaxps_avx512vl(auVar164,auVar172);
          auVar166 = vxorps_avx512vl(auVar166,auVar166);
          auVar167 = vpsrld_avx512vl(auVar165,0x17);
          auVar168 = vpbroadcastd_avx512vl(ZEXT416(0x3f000000));
          auVar173._8_4_ = 0x807fffff;
          auVar173._0_8_ = 0x807fffff807fffff;
          auVar173._12_4_ = 0x807fffff;
          auVar165 = vpternlogd_avx512vl(auVar168,auVar165,auVar173,0xf8);
          auVar174._8_4_ = 0xffffff82;
          auVar174._0_8_ = 0xffffff82ffffff82;
          auVar174._12_4_ = 0xffffff82;
          auVar167 = vpaddd_avx512vl(auVar167,auVar174);
          uVar14 = vcmpps_avx512vl(auVar164,auVar166,2);
          auVar164 = vcvtdq2ps_avx(auVar167);
          auVar175._8_4_ = 0x3f3504f3;
          auVar175._0_8_ = 0x3f3504f33f3504f3;
          auVar175._12_4_ = 0x3f3504f3;
          uVar13 = vcmpps_avx512vl(auVar165,auVar175,1);
          auVar32._8_4_ = 0xbf800000;
          auVar32._0_8_ = 0xbf800000bf800000;
          auVar32._12_4_ = 0xbf800000;
          auVar166 = vaddps_avx512vl(auVar165,auVar32);
          auVar167 = vsubps_avx512vl(auVar164,auVar237);
          bVar11 = (bool)((byte)uVar13 & 1);
          auVar185._0_4_ = (uint)bVar11 * auVar167._0_4_ | (uint)!bVar11 * auVar164._0_4_;
          bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
          auVar185._4_4_ = (uint)bVar11 * auVar167._4_4_ | (uint)!bVar11 * auVar164._4_4_;
          bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
          auVar185._8_4_ = (uint)bVar11 * auVar167._8_4_ | (uint)!bVar11 * auVar164._8_4_;
          bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
          auVar185._12_4_ = (uint)bVar11 * auVar167._12_4_ | (uint)!bVar11 * auVar164._12_4_;
          auVar164 = vaddps_avx512vl(auVar166,auVar165);
          bVar11 = (bool)((byte)uVar13 & 1);
          auVar186._0_4_ = (uint)bVar11 * auVar164._0_4_ | (uint)!bVar11 * auVar166._0_4_;
          bVar11 = (bool)((byte)(uVar13 >> 1) & 1);
          auVar186._4_4_ = (uint)bVar11 * auVar164._4_4_ | (uint)!bVar11 * auVar166._4_4_;
          bVar11 = (bool)((byte)(uVar13 >> 2) & 1);
          auVar186._8_4_ = (uint)bVar11 * auVar164._8_4_ | (uint)!bVar11 * auVar166._8_4_;
          bVar11 = (bool)((byte)(uVar13 >> 3) & 1);
          auVar186._12_4_ = (uint)bVar11 * auVar164._12_4_ | (uint)!bVar11 * auVar166._12_4_;
          auVar164 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar33._8_4_ = 0xbdebd1b8;
          auVar33._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar33._12_4_ = 0xbdebd1b8;
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar186,auVar33);
          auVar34._8_4_ = 0x3def251a;
          auVar34._0_8_ = 0x3def251a3def251a;
          auVar34._12_4_ = 0x3def251a;
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar186,auVar34);
          auVar35._8_4_ = 0xbdfe5d4f;
          auVar35._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar35._12_4_ = 0xbdfe5d4f;
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar186,auVar35);
          auVar36._8_4_ = 0x3e11e9bf;
          auVar36._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar36._12_4_ = 0x3e11e9bf;
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar186,auVar36);
          auVar37._8_4_ = 0xbe2aae50;
          auVar37._0_8_ = 0xbe2aae50be2aae50;
          auVar37._12_4_ = 0xbe2aae50;
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar186,auVar37);
          auVar38._8_4_ = 0x3e4cceac;
          auVar38._0_8_ = 0x3e4cceac3e4cceac;
          auVar38._12_4_ = 0x3e4cceac;
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar186,auVar38);
          auVar39._8_4_ = 0xbe7ffffc;
          auVar39._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar39._12_4_ = 0xbe7ffffc;
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar186,auVar39);
          auVar166 = vmulps_avx512vl(auVar186,auVar186);
          auVar40._8_4_ = 0x3eaaaaaa;
          auVar40._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar40._12_4_ = 0x3eaaaaaa;
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar186,auVar40);
          auVar165 = vmulps_avx512vl(auVar166,auVar186);
          auVar164 = vmulps_avx512vl(auVar165,auVar164);
          auVar164 = vfmadd231ps_avx512vl(auVar164,auVar185,auVar303);
          auVar164 = vfmsub231ps_avx512vl(auVar164,auVar250,auVar166);
          auVar164 = vsubps_avx512vl(auVar164,auVar186);
          auVar164 = vfnmadd231ps_fma(auVar164,auVar272,auVar185);
          auVar166 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar11 = (bool)((byte)uVar14 & 1);
          auVar187._0_4_ =
               (uint)bVar11 * auVar166._0_4_ |
               (uint)!bVar11 * (int)(auVar164._0_4_ + auVar164._0_4_);
          bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
          auVar187._4_4_ =
               (uint)bVar11 * auVar166._4_4_ |
               (uint)!bVar11 * (int)(auVar164._4_4_ + auVar164._4_4_);
          bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
          auVar187._8_4_ =
               (uint)bVar11 * auVar166._8_4_ |
               (uint)!bVar11 * (int)(auVar164._8_4_ + auVar164._8_4_);
          bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
          auVar187._12_4_ =
               (uint)bVar11 * auVar166._12_4_ |
               (uint)!bVar11 * (int)(auVar164._12_4_ + auVar164._12_4_);
          auVar164 = vminps_avx(auVar187,auVar294);
          auVar166 = vmaxps_avx(auVar164,auVar298);
          auVar165 = vfmadd213ps_fma(auVar278,auVar166,auVar250);
          auVar299._0_4_ = (int)auVar165._0_4_;
          auVar299._4_4_ = (int)auVar165._4_4_;
          auVar299._8_4_ = (int)auVar165._8_4_;
          auVar299._12_4_ = (int)auVar165._12_4_;
          auVar164 = vcvtdq2ps_avx(auVar299);
          uVar14 = vcmpps_avx512vl(auVar165,auVar164,1);
          auVar165 = vsubps_avx512vl(auVar164,auVar237);
          bVar11 = (bool)((byte)uVar14 & 1);
          auVar188._0_4_ = (float)((uint)bVar11 * auVar165._0_4_ | (uint)!bVar11 * auVar164._0_4_);
          bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
          auVar188._4_4_ = (float)((uint)bVar11 * auVar165._4_4_ | (uint)!bVar11 * auVar164._4_4_);
          bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
          auVar188._8_4_ = (float)((uint)bVar11 * auVar165._8_4_ | (uint)!bVar11 * auVar164._8_4_);
          bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
          auVar188._12_4_ =
               (float)((uint)bVar11 * auVar165._12_4_ | (uint)!bVar11 * auVar164._12_4_);
          auVar164 = vfmsub213ps_fma(auVar272,auVar188,auVar166);
          auVar166 = vfnmsub231ps_fma(auVar164,auVar188,auVar303);
          auVar279._0_4_ = auVar166._0_4_ * auVar166._0_4_;
          auVar279._4_4_ = auVar166._4_4_ * auVar166._4_4_;
          auVar279._8_4_ = auVar166._8_4_ * auVar166._8_4_;
          auVar279._12_4_ = auVar166._12_4_ * auVar166._12_4_;
          auVar164 = vfmadd213ps_fma(auVar288,auVar166,auVar308);
          auVar164 = vfmadd213ps_fma(auVar164,auVar166,auVar312);
          auVar164 = vfmadd213ps_fma(auVar164,auVar166,auVar316);
          auVar164 = vfmadd213ps_fma(auVar164,auVar166,auVar320);
          auVar164 = vfmadd213ps_fma(auVar164,auVar166,auVar250);
          auVar164 = vfmadd213ps_fma(auVar164,auVar279,auVar166);
          auVar251._0_4_ = auVar164._0_4_ + 1.0;
          auVar251._4_4_ = auVar164._4_4_ + 1.0;
          auVar251._8_4_ = auVar164._8_4_ + 1.0;
          auVar251._12_4_ = auVar164._12_4_ + 1.0;
          auVar273._0_4_ = (int)auVar188._0_4_;
          auVar273._4_4_ = (int)auVar188._4_4_;
          auVar273._8_4_ = (int)auVar188._8_4_;
          auVar273._12_4_ = (int)auVar188._12_4_;
          auVar164 = vpslld_avx(auVar273,0x17);
          auVar164 = vpaddd_avx(auVar325,auVar164);
          auVar166 = vfmadd213ps_fma(auVar164,auVar251,auVar237);
          auVar164 = vrcpps_avx(auVar166);
          auVar252._0_4_ = auVar164._0_4_ + auVar164._0_4_;
          auVar252._4_4_ = auVar164._4_4_ + auVar164._4_4_;
          auVar252._8_4_ = auVar164._8_4_ + auVar164._8_4_;
          auVar252._12_4_ = auVar164._12_4_ + auVar164._12_4_;
          auVar41._8_4_ = 0x40000000;
          auVar41._0_8_ = 0x4000000040000000;
          auVar41._12_4_ = 0x40000000;
          auVar166 = vfmsub213ps_avx512vl(auVar166,auVar252,auVar41);
          auVar164 = vfnmadd213ps_fma(auVar166,auVar164,auVar252);
          auVar169 = vfmsub231ps_fma(auVar169,auVar169,auVar164);
          break;
        case 6:
          uVar5 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar176._4_4_ = uVar5;
          auVar176._0_4_ = uVar5;
          auVar176._8_4_ = uVar5;
          auVar176._12_4_ = uVar5;
          uVar5 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
          auVar170._4_4_ = uVar5;
          auVar170._0_4_ = uVar5;
          auVar170._8_4_ = uVar5;
          auVar170._12_4_ = uVar5;
          auVar164 = vfmadd213ps_avx512vl(auVar176,auVar169,auVar170);
          auVar230._12_4_ = 0;
          auVar230._0_12_ = ZEXT412(0);
          auVar164 = vmaxps_avx(auVar164,auVar230 << 0x20);
          auVar171._8_4_ = 0x3f800000;
          auVar171._0_8_ = 0x3f8000003f800000;
          auVar171._12_4_ = 0x3f800000;
          auVar164 = vminps_avx512vl(auVar164,auVar171);
          auVar169._0_4_ = auVar164._0_4_ * auVar169._0_4_;
          auVar169._4_4_ = auVar164._4_4_ * auVar169._4_4_;
          auVar169._8_4_ = auVar164._8_4_ * auVar169._8_4_;
          auVar169._12_4_ = auVar164._12_4_ * auVar169._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar140 * 4) = auVar169;
        fVar263 = local_278;
      }
      iVar137 = 0;
      iVar141 = (int)uVar140 + (int)fVar263 * 4;
      if ((int)local_370 <= iVar141) goto LAB_00312889;
      local_318 = (float)(uVar146 & 0xfffffff8);
      uVar140 = (ulong)iVar141;
      do {
        auVar216 = ZEXT1664(ZEXT816(0) << 0x40);
        if (lVar8 != 0) {
          auVar216 = ZEXT464(*(uint *)(lVar8 + uVar140 * 4));
        }
        fVar263 = auVar216._0_4_;
        pauVar145 = (undefined1 (*) [16])
                    ((long)(this->weight_data_tm).w * uVar140 * (this->weight_data_tm).elemsize +
                    (long)(this->weight_data_tm).data);
        pauVar139 = local_3d8;
        if ((int)uVar146 < 8) {
          _local_218 = SUB6432(ZEXT864(0),0);
          fVar229 = 0.0;
        }
        else {
          auVar217 = ZEXT864(0);
          iVar137 = 7;
          do {
            auVar164 = vlddqu_avx(*pauVar145);
            auVar190 = vcvtph2ps_f16c(auVar164);
            auVar164 = vfmadd231ps_fma(auVar217._0_32_,auVar190,*pauVar139);
            auVar217 = ZEXT1664(auVar164);
            _local_218 = ZEXT1632(auVar164);
            pauVar139 = pauVar139 + 1;
            pauVar145 = pauVar145 + 1;
            iVar137 = iVar137 + 8;
            fVar229 = local_318;
          } while (iVar137 < (int)uVar146);
        }
        local_308 = ZEXT816(0) << 0x40;
        uVar161 = (uint)fVar229 | 3;
        while ((int)uVar161 < (int)uVar146) {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)*pauVar145;
          auVar164 = vcvtph2ps_f16c(auVar4);
          local_308 = vfmadd231ps_fma(local_308,auVar164,*(undefined1 (*) [16])*pauVar139);
          pauVar139 = (undefined1 (*) [32])(*pauVar139 + 0x10);
          pauVar145 = (undefined1 (*) [16])(*pauVar145 + 8);
          uVar161 = (int)fVar229 + 7;
          fVar229 = (float)((int)fVar229 + 4);
        }
        if ((int)fVar229 < (int)uVar146) {
          lVar147 = 0;
          do {
            local_2a8._0_4_ = auVar216._0_4_;
            local_388._0_4_ = *(undefined4 *)(*pauVar139 + lVar147 * 4);
            auVar218._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar145 + lVar147 * 2));
            auVar218._4_60_ = extraout_var_01;
            auVar164 = vfmadd231ss_fma(ZEXT416((uint)local_2a8._0_4_),auVar218._0_16_,
                                       ZEXT416((uint)local_388._0_4_));
            fVar263 = auVar164._0_4_;
            auVar216 = ZEXT1664(auVar164);
            lVar147 = lVar147 + 1;
          } while (uVar146 - (int)fVar229 != (int)lVar147);
        }
        auVar232._0_4_ = fStack_208 + (float)local_218._0_4_;
        auVar232._4_4_ = fStack_204 + (float)local_218._4_4_;
        auVar232._8_4_ = fStack_200 + fStack_210;
        auVar232._12_4_ = fStack_1fc + fStack_20c;
        auVar164 = vshufps_avx(local_308,auVar232,0x41);
        auVar166 = vshufps_avx(local_308,auVar232,0xeb);
        auVar233._0_4_ = auVar166._0_4_ + auVar164._0_4_;
        auVar233._4_4_ = auVar166._4_4_ + auVar164._4_4_;
        auVar233._8_4_ = auVar166._8_4_ + auVar164._8_4_;
        auVar233._12_4_ = auVar166._12_4_ + auVar164._12_4_;
        auVar164 = vshufpd_avx(auVar233,auVar233,1);
        auVar234._0_4_ = auVar233._0_4_ + auVar164._0_4_;
        auVar234._4_4_ = auVar233._4_4_ + auVar164._4_4_;
        auVar234._8_4_ = auVar233._8_4_ + auVar164._8_4_;
        auVar234._12_4_ = auVar233._12_4_ + auVar164._12_4_;
        auVar164 = vhaddps_avx(auVar234,auVar234);
        fVar263 = fVar263 + auVar164._0_4_;
        auVar164 = ZEXT416((uint)fVar263);
        fVar229 = fVar263;
        switch((int)local_368) {
        case 1:
          auVar164 = vmaxss_avx(auVar164,ZEXT416(0));
          fVar229 = auVar164._0_4_;
          break;
        case 2:
          uVar15 = vcmpss_avx512f(auVar164,ZEXT416(0),0xe);
          bVar11 = (bool)((byte)uVar15 & 1);
          fVar229 = (float)((uint)bVar11 * 0x3f800000 +
                           (uint)!bVar11 * **(int **)(&this->field_0xe8 + (long)p_Var6)) * fVar263;
          break;
        case 3:
          fVar263 = (float)(*(uint **)(&this->field_0xe8 + (long)p_Var6))[1];
          auVar164 = vmaxss_avx(auVar164,ZEXT416(**(uint **)(&this->field_0xe8 + (long)p_Var6)));
          fVar229 = auVar164._0_4_;
          if (fVar263 < auVar164._0_4_) {
            fVar229 = fVar263;
          }
          break;
        case 4:
          auVar164 = vminss_avx(auVar164,SUB6416(ZEXT464(0x42b0c0a5),0));
          auVar56._8_4_ = 0x80000000;
          auVar56._0_8_ = 0x8000000080000000;
          auVar56._12_4_ = 0x80000000;
          auVar166 = vxorps_avx512vl(auVar164,auVar56);
          uVar15 = vcmpss_avx512f(auVar164,ZEXT416(0xc2b0c0a5),1);
          bVar11 = (bool)((byte)uVar15 & 1);
          fVar263 = expf((float)((uint)bVar11 * 0x42b0c0a5 + (uint)!bVar11 * auVar166._0_4_));
          fVar229 = 1.0 / (fVar263 + 1.0);
          break;
        case 5:
          local_2a8._0_4_ = fVar263;
          fVar263 = expf(fVar263);
          fVar263 = logf(fVar263 + 1.0);
          fVar229 = tanhf(fVar263);
          fVar229 = fVar229 * (float)local_2a8._0_4_;
          break;
        case 6:
          fVar2 = **(float **)(&this->field_0xe8 + (long)p_Var6);
          auVar55._8_4_ = 0x80000000;
          auVar55._0_8_ = 0x8000000080000000;
          auVar55._12_4_ = 0x80000000;
          auVar165 = ZEXT416((uint)(*(float **)(&this->field_0xe8 + (long)p_Var6))[1]);
          auVar166 = vxorps_avx512vl(auVar165,auVar55);
          fVar264 = auVar166._0_4_ / fVar2;
          fVar229 = 0.0;
          if ((fVar264 <= fVar263) && (fVar229 = fVar263, fVar263 <= fVar264 + 1.0 / fVar2)) {
            auVar164 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar164,auVar165);
            fVar229 = auVar164._0_4_ * fVar263;
          }
        }
        *(float *)((long)top_blob->data + uVar140 * 4) = fVar229;
        uVar140 = uVar140 + 1;
      } while (uVar140 != local_370);
    }
    else if ((uVar161 == 4) && (iVar137 = top_blob->w, 0 < (long)iVar137)) {
      p_Var6 = this->_vptr_InnerProduct_x86_avx512[-3];
      uVar5 = *(undefined4 *)(&this->field_0xe0 + (long)p_Var6);
      uVar161 = local_3c0 * iStack_3ac;
      lVar8 = *(long *)(&this->field_0x178 + (long)p_Var6);
      lVar147 = 0;
      auVar230 = ZEXT816(0) << 0x40;
      auVar164 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar166 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar277._8_4_ = 0x3f000000;
      auVar277._0_8_ = 0x3f0000003f000000;
      auVar277._12_4_ = 0x3f000000;
      auVar165 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar293._8_4_ = 0x3f800000;
      auVar293._0_8_ = 0x3f8000003f800000;
      auVar293._12_4_ = 0x3f800000;
      auVar297._8_4_ = 0x3f318000;
      auVar297._0_8_ = 0x3f3180003f318000;
      auVar297._12_4_ = 0x3f318000;
      auVar307._8_4_ = 0x39506967;
      auVar307._0_8_ = 0x3950696739506967;
      auVar307._12_4_ = 0x39506967;
      auVar311._8_4_ = 0x3ab743ce;
      auVar311._0_8_ = 0x3ab743ce3ab743ce;
      auVar311._12_4_ = 0x3ab743ce;
      auVar315._8_4_ = 0x3c088908;
      auVar315._0_8_ = 0x3c0889083c088908;
      auVar315._12_4_ = 0x3c088908;
      auVar319._8_4_ = 0x3d2aa9c1;
      auVar319._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar319._12_4_ = 0x3d2aa9c1;
      auVar323._8_4_ = 0x3e2aaaaa;
      auVar323._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar323._12_4_ = 0x3e2aaaaa;
      auVar328._8_4_ = 0x3f800000;
      auVar328._0_8_ = 0x3f8000003f800000;
      auVar328._12_4_ = 0x3f800000;
      auVar331._8_4_ = 0xb95e8083;
      auVar331._0_8_ = 0xb95e8083b95e8083;
      auVar331._12_4_ = 0xb95e8083;
      auVar167 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar168 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar169 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar170 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar171 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      do {
        auVar176 = ZEXT816(0) << 0x40;
        if (lVar8 != 0) {
          auVar176 = *(undefined1 (*) [16])(lVar8 + lVar147 * 0x10);
        }
        pauVar150 = (undefined1 (*) [32])
                    ((this->weight_data_tm).w * lVar147 * (this->weight_data_tm).elemsize +
                    (long)(this->weight_data_tm).data);
        auVar172 = in_ZMM16._0_16_;
        auVar173 = in_ZMM17._0_16_;
        auVar174 = in_ZMM18._0_16_;
        pauVar139 = local_3d8;
        if ((int)uVar161 < 8) {
          auVar190 = SUB6432(ZEXT864(0),0);
          auVar174 = vxorps_avx512vl(auVar174,auVar174);
          in_ZMM18 = ZEXT1664(auVar174);
          auVar173 = vxorps_avx512vl(auVar173,auVar173);
          in_ZMM17 = ZEXT1664(auVar173);
          auVar172 = vxorps_avx512vl(auVar172,auVar172);
          in_ZMM16 = ZEXT1664(auVar172);
          uVar146 = 0;
        }
        else {
          auVar172 = vxorps_avx512vl(auVar172,auVar172);
          in_ZMM16 = ZEXT1664(auVar172);
          iVar141 = 7;
          auVar172 = vxorps_avx512vl(auVar173,auVar173);
          in_ZMM17 = ZEXT1664(auVar172);
          auVar172 = vxorps_avx512vl(auVar174,auVar174);
          in_ZMM18 = ZEXT1664(auVar172);
          auVar216 = ZEXT864(0);
          do {
            auVar172 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar139));
            auVar173 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar139 + 4)));
            auVar174 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar139 + 8)));
            auVar175 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar139 + 0xc)));
            auVar192 = vinsertf32x4_avx512vl(ZEXT1632(auVar172),auVar173,1);
            auVar193 = vinsertf32x4_avx512vl(ZEXT1632(auVar174),auVar175,1);
            auVar172 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar139 + 0x10)));
            auVar173 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar139 + 0x14)));
            auVar174 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar139 + 0x18)));
            auVar194 = vinsertf32x4_avx512vl(ZEXT1632(auVar172),auVar173,1);
            auVar172 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar139 + 0x1c)));
            auVar195 = vinsertf32x4_avx512vl(ZEXT1632(auVar174),auVar172,1);
            auVar190 = vlddqu_avx(*pauVar150);
            auVar191 = vlddqu_avx(pauVar150[1]);
            auVar196 = vcvtph2ps_avx512vl(auVar190._0_16_);
            auVar192 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar192,auVar196);
            in_ZMM16 = ZEXT3264(auVar192);
            auVar190 = vcvtph2ps_f16c(auVar190._16_16_);
            auVar190 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar193,auVar190);
            in_ZMM17 = ZEXT3264(auVar190);
            auVar190 = vcvtph2ps_f16c(auVar191._0_16_);
            auVar190 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar194,auVar190);
            in_ZMM18 = ZEXT3264(auVar190);
            auVar190 = vcvtph2ps_f16c(auVar191._16_16_);
            auVar190 = vfmadd231ps_avx512vl(auVar216._0_32_,auVar195,auVar190);
            auVar216 = ZEXT3264(auVar190);
            pauVar139 = pauVar139 + 1;
            pauVar150 = pauVar150 + 2;
            iVar141 = iVar141 + 8;
            uVar146 = uVar161 & 0xfffffff8;
          } while (iVar141 < (int)uVar161);
        }
        uVar142 = uVar146 | 3;
        while( true ) {
          if ((int)uVar161 <= (int)uVar142) break;
          uVar1 = *(undefined4 *)*pauVar139;
          auVar257._4_4_ = uVar1;
          auVar257._0_4_ = uVar1;
          auVar257._8_4_ = uVar1;
          auVar257._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(*pauVar139 + 4);
          auVar257._20_4_ = uVar1;
          auVar257._16_4_ = uVar1;
          auVar257._24_4_ = uVar1;
          auVar257._28_4_ = uVar1;
          auVar172 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar139 + 8)));
          uVar1 = *(undefined4 *)(*pauVar139 + 0xc);
          auVar265._4_4_ = uVar1;
          auVar265._0_4_ = uVar1;
          auVar265._8_4_ = uVar1;
          auVar265._12_4_ = uVar1;
          auVar192 = vinsertf32x4_avx512vl(ZEXT1632(auVar172),auVar265,1);
          auVar191 = vlddqu_avx(*pauVar150);
          auVar193 = vcvtph2ps_avx512vl(auVar191._0_16_);
          auVar193 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar257,auVar193);
          in_ZMM16 = ZEXT3264(auVar193);
          auVar191 = vcvtph2ps_f16c(auVar191._16_16_);
          auVar191 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar192,auVar191);
          in_ZMM17 = ZEXT3264(auVar191);
          pauVar139 = (undefined1 (*) [32])(*pauVar139 + 0x10);
          pauVar150 = pauVar150 + 1;
          uVar142 = uVar146 + 7;
          uVar146 = uVar146 + 4;
        }
        if (uVar161 - uVar146 != 0 && (int)uVar146 <= (int)uVar161) {
          lVar157 = 0;
          do {
            auVar3._8_8_ = 0;
            auVar3._0_8_ = *(ulong *)(*pauVar150 + lVar157 * 8);
            auVar172 = vcvtph2ps_f16c(auVar3);
            uVar1 = *(undefined4 *)(*pauVar139 + lVar157 * 4);
            auVar16._4_4_ = uVar1;
            auVar16._0_4_ = uVar1;
            auVar16._8_4_ = uVar1;
            auVar16._12_4_ = uVar1;
            auVar176 = vfmadd231ps_avx512vl(auVar176,auVar172,auVar16);
            lVar157 = lVar157 + 1;
          } while (uVar161 - uVar146 != (int)lVar157);
        }
        auVar190 = vaddps_avx512vl(in_ZMM18._0_32_,auVar190);
        auVar191 = vaddps_avx512vl(in_ZMM17._0_32_,in_ZMM16._0_32_);
        fVar263 = auVar190._4_4_ + auVar191._4_4_;
        auVar182._0_4_ =
             auVar190._16_4_ + auVar191._16_4_ + auVar190._0_4_ + auVar191._0_4_ + auVar176._0_4_;
        auVar182._4_4_ = fVar263 + fVar263 + auVar176._4_4_;
        auVar182._8_4_ =
             auVar190._24_4_ + auVar191._24_4_ + auVar190._8_4_ + auVar191._8_4_ + auVar176._8_4_;
        auVar182._12_4_ =
             auVar190._28_4_ + auVar191._28_4_ + auVar190._12_4_ + auVar191._12_4_ + auVar176._12_4_
        ;
        switch(uVar5) {
        case 1:
          auVar182 = vmaxps_avx(auVar182,auVar230);
          break;
        case 2:
          auVar176 = vmaxps_avx(auVar182,auVar230);
          auVar172 = vminps_avx(auVar182,auVar230);
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar31._4_4_ = uVar1;
          auVar31._0_4_ = uVar1;
          auVar31._8_4_ = uVar1;
          auVar31._12_4_ = uVar1;
          auVar182 = vfmadd132ps_avx512vl(auVar172,auVar176,auVar31);
          break;
        case 3:
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar29._4_4_ = uVar1;
          auVar29._0_4_ = uVar1;
          auVar29._8_4_ = uVar1;
          auVar29._12_4_ = uVar1;
          auVar176 = vmaxps_avx512vl(auVar182,auVar29);
          uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
          auVar30._4_4_ = uVar1;
          auVar30._0_4_ = uVar1;
          auVar30._8_4_ = uVar1;
          auVar30._12_4_ = uVar1;
          auVar182 = vminps_avx512vl(auVar176,auVar30);
          break;
        case 4:
          auVar27._8_4_ = 0x80000000;
          auVar27._0_8_ = 0x8000000080000000;
          auVar27._12_4_ = 0x80000000;
          auVar176 = vxorps_avx512vl(auVar182,auVar27);
          auVar176 = vminps_avx512vl(auVar176,auVar164);
          auVar172 = vmaxps_avx512vl(auVar176,auVar166);
          auVar173 = vfmadd231ps_avx512vl(auVar277,auVar172,auVar165);
          auVar270._0_4_ = (int)auVar173._0_4_;
          auVar270._4_4_ = (int)auVar173._4_4_;
          auVar270._8_4_ = (int)auVar173._8_4_;
          auVar270._12_4_ = (int)auVar173._12_4_;
          auVar176 = vcvtdq2ps_avx(auVar270);
          uVar140 = vcmpps_avx512vl(auVar173,auVar176,1);
          auVar173 = vsubps_avx512vl(auVar176,auVar293);
          bVar11 = (bool)((byte)uVar140 & 1);
          auVar183._0_4_ = (float)((uint)bVar11 * auVar173._0_4_ | (uint)!bVar11 * auVar176._0_4_);
          bVar11 = (bool)((byte)(uVar140 >> 1) & 1);
          auVar183._4_4_ = (float)((uint)bVar11 * auVar173._4_4_ | (uint)!bVar11 * auVar176._4_4_);
          bVar11 = (bool)((byte)(uVar140 >> 2) & 1);
          auVar183._8_4_ = (float)((uint)bVar11 * auVar173._8_4_ | (uint)!bVar11 * auVar176._8_4_);
          bVar11 = (bool)((byte)(uVar140 >> 3) & 1);
          auVar183._12_4_ =
               (float)((uint)bVar11 * auVar173._12_4_ | (uint)!bVar11 * auVar176._12_4_);
          auVar176 = vfmsub231ps_fma(auVar172,auVar183,auVar297);
          auVar28._8_4_ = 0x395e8083;
          auVar28._0_8_ = 0x395e8083395e8083;
          auVar28._12_4_ = 0x395e8083;
          auVar172 = vfmsub231ps_avx512vl(auVar176,auVar183,auVar28);
          auVar247._0_4_ = auVar172._0_4_ * auVar172._0_4_;
          auVar247._4_4_ = auVar172._4_4_ * auVar172._4_4_;
          auVar247._8_4_ = auVar172._8_4_ * auVar172._8_4_;
          auVar247._12_4_ = auVar172._12_4_ * auVar172._12_4_;
          auVar176 = vfmadd213ps_fma(auVar307,auVar172,auVar311);
          auVar176 = vfmadd213ps_fma(auVar176,auVar172,auVar315);
          auVar176 = vfmadd213ps_fma(auVar176,auVar172,auVar319);
          auVar176 = vfmadd213ps_fma(auVar176,auVar172,auVar323);
          auVar176 = vfmadd213ps_fma(auVar176,auVar172,auVar277);
          auVar176 = vfmadd213ps_fma(auVar176,auVar247,auVar172);
          auVar248._0_4_ = auVar176._0_4_ + 1.0;
          auVar248._4_4_ = auVar176._4_4_ + 1.0;
          auVar248._8_4_ = auVar176._8_4_ + 1.0;
          auVar248._12_4_ = auVar176._12_4_ + 1.0;
          auVar236._0_4_ = (int)auVar183._0_4_;
          auVar236._4_4_ = (int)auVar183._4_4_;
          auVar236._8_4_ = (int)auVar183._8_4_;
          auVar236._12_4_ = (int)auVar183._12_4_;
          auVar176 = vpslld_avx(auVar236,0x17);
          auVar176 = vpaddd_avx(auVar328,auVar176);
          auVar172 = vfmadd213ps_fma(auVar176,auVar248,auVar293);
          auVar176 = vrcpps_avx(auVar172);
          auVar172 = vfmsub213ps_fma(auVar172,auVar176,auVar293);
          auVar182 = vfnmadd132ps_fma(auVar172,auVar176,auVar176);
          break;
        case 5:
          auVar176 = vminps_avx512vl(auVar182,auVar164);
          auVar173 = vmaxps_avx512vl(auVar176,auVar166);
          auVar172 = vfmadd213ps_fma(auVar165,auVar173,auVar277);
          auVar284._0_4_ = (int)auVar172._0_4_;
          auVar284._4_4_ = (int)auVar172._4_4_;
          auVar284._8_4_ = (int)auVar172._8_4_;
          auVar284._12_4_ = (int)auVar172._12_4_;
          auVar176 = vcvtdq2ps_avx(auVar284);
          uVar140 = vcmpps_avx512vl(auVar172,auVar176,1);
          auVar172 = vsubps_avx512vl(auVar176,auVar293);
          bVar11 = (bool)((byte)uVar140 & 1);
          auVar177._0_4_ = (float)((uint)bVar11 * auVar172._0_4_ | (uint)!bVar11 * auVar176._0_4_);
          bVar11 = (bool)((byte)(uVar140 >> 1) & 1);
          auVar177._4_4_ = (float)((uint)bVar11 * auVar172._4_4_ | (uint)!bVar11 * auVar176._4_4_);
          bVar11 = (bool)((byte)(uVar140 >> 2) & 1);
          auVar177._8_4_ = (float)((uint)bVar11 * auVar172._8_4_ | (uint)!bVar11 * auVar176._8_4_);
          bVar11 = (bool)((byte)(uVar140 >> 3) & 1);
          auVar177._12_4_ =
               (float)((uint)bVar11 * auVar172._12_4_ | (uint)!bVar11 * auVar176._12_4_);
          auVar176 = vfmsub231ps_fma(auVar173,auVar177,auVar297);
          auVar172 = vfnmsub231ps_fma(auVar176,auVar177,auVar331);
          auVar266._0_4_ = auVar172._0_4_ * auVar172._0_4_;
          auVar266._4_4_ = auVar172._4_4_ * auVar172._4_4_;
          auVar266._8_4_ = auVar172._8_4_ * auVar172._8_4_;
          auVar266._12_4_ = auVar172._12_4_ * auVar172._12_4_;
          auVar176 = vfmadd213ps_fma(auVar307,auVar172,auVar311);
          auVar176 = vfmadd213ps_fma(auVar176,auVar172,auVar315);
          auVar176 = vfmadd213ps_fma(auVar176,auVar172,auVar319);
          auVar176 = vfmadd213ps_fma(auVar176,auVar172,auVar323);
          auVar176 = vfmadd213ps_fma(auVar176,auVar172,auVar277);
          auVar176 = vfmadd213ps_fma(auVar176,auVar266,auVar172);
          auVar244._0_4_ = auVar176._0_4_ + 1.0;
          auVar244._4_4_ = auVar176._4_4_ + 1.0;
          auVar244._8_4_ = auVar176._8_4_ + 1.0;
          auVar244._12_4_ = auVar176._12_4_ + 1.0;
          auVar267._0_4_ = (int)auVar177._0_4_;
          auVar267._4_4_ = (int)auVar177._4_4_;
          auVar267._8_4_ = (int)auVar177._8_4_;
          auVar267._12_4_ = (int)auVar177._12_4_;
          auVar176 = vpslld_avx(auVar267,0x17);
          auVar176 = vpaddd_avx(auVar328,auVar176);
          auVar176 = vfmadd213ps_fma(auVar176,auVar244,auVar293);
          uVar140 = vcmpps_avx512vl(auVar176,auVar230,2);
          auVar18._8_4_ = 0x800000;
          auVar18._0_8_ = 0x80000000800000;
          auVar18._12_4_ = 0x800000;
          auVar176 = vmaxps_avx512vl(auVar176,auVar18);
          auVar173 = vpsrld_avx(auVar176,0x17);
          auVar285._8_4_ = 0x807fffff;
          auVar285._0_8_ = 0x807fffff807fffff;
          auVar285._12_4_ = 0x807fffff;
          auVar19._8_4_ = 0x3f000000;
          auVar19._0_8_ = 0x3f0000003f000000;
          auVar19._12_4_ = 0x3f000000;
          auVar176 = vpternlogd_avx512vl(auVar176,auVar285,auVar19,0xea);
          auVar20._8_4_ = 0x3f3504f3;
          auVar20._0_8_ = 0x3f3504f33f3504f3;
          auVar20._12_4_ = 0x3f3504f3;
          uVar14 = vcmpps_avx512vl(auVar176,auVar20,1);
          auVar21._8_4_ = 0xbf800000;
          auVar21._0_8_ = 0xbf800000bf800000;
          auVar21._12_4_ = 0xbf800000;
          auVar172 = vaddps_avx512vl(auVar176,auVar21);
          auVar176 = vaddps_avx512vl(auVar172,auVar176);
          bVar11 = (bool)((byte)uVar14 & 1);
          auVar178._0_4_ = (float)((uint)bVar11 * auVar176._0_4_ | (uint)!bVar11 * auVar172._0_4_);
          bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
          auVar178._4_4_ = (float)((uint)bVar11 * auVar176._4_4_ | (uint)!bVar11 * auVar172._4_4_);
          bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
          auVar178._8_4_ = (float)((uint)bVar11 * auVar176._8_4_ | (uint)!bVar11 * auVar172._8_4_);
          bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
          auVar178._12_4_ =
               (float)((uint)bVar11 * auVar176._12_4_ | (uint)!bVar11 * auVar172._12_4_);
          auVar245._0_4_ = auVar178._0_4_ * auVar178._0_4_;
          auVar245._4_4_ = auVar178._4_4_ * auVar178._4_4_;
          auVar245._8_4_ = auVar178._8_4_ * auVar178._8_4_;
          auVar245._12_4_ = auVar178._12_4_ * auVar178._12_4_;
          auVar302._8_4_ = 0x3d9021bb;
          auVar302._0_8_ = 0x3d9021bb3d9021bb;
          auVar302._12_4_ = 0x3d9021bb;
          auVar22._8_4_ = 0xbdebd1b8;
          auVar22._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar22._12_4_ = 0xbdebd1b8;
          auVar176 = vfmadd213ps_avx512vl(auVar302,auVar178,auVar22);
          auVar23._8_4_ = 0x3def251a;
          auVar23._0_8_ = 0x3def251a3def251a;
          auVar23._12_4_ = 0x3def251a;
          auVar176 = vfmadd213ps_avx512vl(auVar176,auVar178,auVar23);
          auVar24._8_4_ = 0xbdfe5d4f;
          auVar24._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar24._12_4_ = 0xbdfe5d4f;
          auVar176 = vfmadd213ps_avx512vl(auVar176,auVar178,auVar24);
          auVar25._8_4_ = 0x3e11e9bf;
          auVar25._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar25._12_4_ = 0x3e11e9bf;
          auVar176 = vfmadd213ps_avx512vl(auVar176,auVar178,auVar25);
          auVar176 = vfmadd213ps_avx512vl(auVar176,auVar178,auVar167);
          auVar176 = vfmadd213ps_avx512vl(auVar176,auVar178,auVar168);
          auVar176 = vfmadd213ps_avx512vl(auVar176,auVar178,auVar169);
          auVar176 = vfmadd213ps_avx512vl(auVar176,auVar178,auVar170);
          auVar172 = vmulps_avx512vl(auVar245,auVar178);
          in_ZMM16 = ZEXT1664(auVar172);
          auVar172 = vmulps_avx512vl(auVar172,auVar176);
          auVar26._8_4_ = 0xffffff82;
          auVar26._0_8_ = 0xffffff82ffffff82;
          auVar26._12_4_ = 0xffffff82;
          auVar176 = vpaddd_avx512vl(auVar173,auVar26);
          auVar176 = vcvtdq2ps_avx(auVar176);
          auVar173 = vsubps_avx512vl(auVar176,auVar293);
          bVar11 = (bool)((byte)uVar14 & 1);
          auVar179._0_4_ = (uint)bVar11 * auVar173._0_4_ | (uint)!bVar11 * auVar176._0_4_;
          bVar11 = (bool)((byte)(uVar14 >> 1) & 1);
          auVar179._4_4_ = (uint)bVar11 * auVar173._4_4_ | (uint)!bVar11 * auVar176._4_4_;
          bVar11 = (bool)((byte)(uVar14 >> 2) & 1);
          auVar179._8_4_ = (uint)bVar11 * auVar173._8_4_ | (uint)!bVar11 * auVar176._8_4_;
          bVar11 = (bool)((byte)(uVar14 >> 3) & 1);
          auVar179._12_4_ = (uint)bVar11 * auVar173._12_4_ | (uint)!bVar11 * auVar176._12_4_;
          auVar176 = vfmadd231ps_fma(auVar172,auVar179,auVar331);
          auVar176 = vfmsub231ps_fma(auVar176,auVar277,auVar245);
          auVar176 = vsubps_avx(auVar176,auVar178);
          auVar176 = vfnmadd231ps_fma(auVar176,auVar297,auVar179);
          auVar172 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar11 = (bool)((byte)uVar140 & 1);
          auVar180._0_4_ =
               (uint)bVar11 * auVar172._0_4_ |
               (uint)!bVar11 * (int)(auVar176._0_4_ + auVar176._0_4_);
          bVar11 = (bool)((byte)(uVar140 >> 1) & 1);
          auVar180._4_4_ =
               (uint)bVar11 * auVar172._4_4_ |
               (uint)!bVar11 * (int)(auVar176._4_4_ + auVar176._4_4_);
          bVar11 = (bool)((byte)(uVar140 >> 2) & 1);
          auVar180._8_4_ =
               (uint)bVar11 * auVar172._8_4_ |
               (uint)!bVar11 * (int)(auVar176._8_4_ + auVar176._8_4_);
          bVar11 = (bool)((byte)(uVar140 >> 3) & 1);
          auVar180._12_4_ =
               (uint)bVar11 * auVar172._12_4_ |
               (uint)!bVar11 * (int)(auVar176._12_4_ + auVar176._12_4_);
          auVar176 = vminps_avx512vl(auVar180,auVar164);
          auVar173 = vmaxps_avx512vl(auVar176,auVar166);
          auVar172 = vfmadd213ps_fma(auVar165,auVar173,auVar277);
          auVar286._0_4_ = (int)auVar172._0_4_;
          auVar286._4_4_ = (int)auVar172._4_4_;
          auVar286._8_4_ = (int)auVar172._8_4_;
          auVar286._12_4_ = (int)auVar172._12_4_;
          auVar176 = vcvtdq2ps_avx(auVar286);
          uVar140 = vcmpps_avx512vl(auVar172,auVar176,1);
          auVar172 = vsubps_avx512vl(auVar176,auVar293);
          bVar11 = (bool)((byte)uVar140 & 1);
          auVar181._0_4_ = (float)((uint)bVar11 * auVar172._0_4_ | (uint)!bVar11 * auVar176._0_4_);
          bVar11 = (bool)((byte)(uVar140 >> 1) & 1);
          auVar181._4_4_ = (float)((uint)bVar11 * auVar172._4_4_ | (uint)!bVar11 * auVar176._4_4_);
          bVar11 = (bool)((byte)(uVar140 >> 2) & 1);
          auVar181._8_4_ = (float)((uint)bVar11 * auVar172._8_4_ | (uint)!bVar11 * auVar176._8_4_);
          bVar11 = (bool)((byte)(uVar140 >> 3) & 1);
          auVar181._12_4_ =
               (float)((uint)bVar11 * auVar172._12_4_ | (uint)!bVar11 * auVar176._12_4_);
          auVar176 = vfmsub231ps_fma(auVar173,auVar181,auVar297);
          auVar172 = vfnmsub231ps_fma(auVar176,auVar181,auVar331);
          auVar268._0_4_ = auVar172._0_4_ * auVar172._0_4_;
          auVar268._4_4_ = auVar172._4_4_ * auVar172._4_4_;
          auVar268._8_4_ = auVar172._8_4_ * auVar172._8_4_;
          auVar268._12_4_ = auVar172._12_4_ * auVar172._12_4_;
          auVar176 = vfmadd213ps_fma(auVar307,auVar172,auVar311);
          auVar176 = vfmadd213ps_fma(auVar176,auVar172,auVar315);
          auVar176 = vfmadd213ps_fma(auVar176,auVar172,auVar319);
          auVar176 = vfmadd213ps_fma(auVar176,auVar172,auVar323);
          auVar176 = vfmadd213ps_fma(auVar176,auVar172,auVar277);
          auVar176 = vfmadd213ps_fma(auVar176,auVar268,auVar172);
          auVar246._0_4_ = auVar176._0_4_ + 1.0;
          auVar246._4_4_ = auVar176._4_4_ + 1.0;
          auVar246._8_4_ = auVar176._8_4_ + 1.0;
          auVar246._12_4_ = auVar176._12_4_ + 1.0;
          auVar269._0_4_ = (int)auVar181._0_4_;
          auVar269._4_4_ = (int)auVar181._4_4_;
          auVar269._8_4_ = (int)auVar181._8_4_;
          auVar269._12_4_ = (int)auVar181._12_4_;
          auVar176 = vpslld_avx(auVar269,0x17);
          auVar176 = vpaddd_avx(auVar328,auVar176);
          auVar172 = vfmadd213ps_fma(auVar176,auVar246,auVar293);
          auVar176 = vrcpps_avx(auVar172);
          auVar287._0_4_ = auVar176._0_4_ + auVar176._0_4_;
          auVar287._4_4_ = auVar176._4_4_ + auVar176._4_4_;
          auVar287._8_4_ = auVar176._8_4_ + auVar176._8_4_;
          auVar287._12_4_ = auVar176._12_4_ + auVar176._12_4_;
          auVar172 = vfmsub213ps_avx512vl(auVar172,auVar287,auVar171);
          auVar176 = vfnmadd213ps_fma(auVar172,auVar176,auVar287);
          auVar182 = vfmsub231ps_fma(auVar182,auVar182,auVar176);
          break;
        case 6:
          uVar1 = **(undefined4 **)(&this->field_0xe8 + (long)p_Var6);
          auVar249._4_4_ = uVar1;
          auVar249._0_4_ = uVar1;
          auVar249._8_4_ = uVar1;
          auVar249._12_4_ = uVar1;
          uVar1 = (*(undefined4 **)(&this->field_0xe8 + (long)p_Var6))[1];
          auVar17._4_4_ = uVar1;
          auVar17._0_4_ = uVar1;
          auVar17._8_4_ = uVar1;
          auVar17._12_4_ = uVar1;
          auVar176 = vfmadd213ps_avx512vl(auVar249,auVar182,auVar17);
          auVar176 = vmaxps_avx(auVar176,auVar230);
          auVar176 = vminps_avx(auVar176,auVar293);
          auVar182._0_4_ = auVar176._0_4_ * auVar182._0_4_;
          auVar182._4_4_ = auVar176._4_4_ * auVar182._4_4_;
          auVar182._8_4_ = auVar176._8_4_ * auVar182._8_4_;
          auVar182._12_4_ = auVar176._12_4_ * auVar182._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + lVar147 * 0x10) = auVar182;
        lVar147 = lVar147 + 1;
      } while (lVar147 != iVar137);
    }
    iVar137 = 0;
  }
LAB_00312889:
  piVar7 = (int *)CONCAT44(uStack_3cc,uStack_3d0);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_3b8 == (Allocator *)0x0) {
        if (local_3d8 != (undefined1 (*) [32])0x0) {
          free(local_3d8);
        }
      }
      else {
        (*local_3b8->_vptr_Allocator[3])();
      }
    }
  }
  return iVar137;
}

Assistant:

int InnerProduct_x86_avx512::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input && bottom_blob.h * bottom_blob.elempack > 1)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __AVX512F__
    if (out_elempack == 16)
    {
        innerproduct_fp16s_pack16_avx512(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }
#endif // __AVX512F__

    if (out_elempack == 8)
    {
        innerproduct_fp16s_pack8_avx(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 4)
    {
        innerproduct_fp16s_pack4_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 1)
    {
        innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    return 0;
}